

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O2

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined1 post_process;
  uint uVar4;
  size_t sVar5;
  int *piVar6;
  int aiVar7 [4];
  bool reduce_c;
  int k_2;
  uint uVar8;
  uint uVar9;
  undefined8 in_RAX;
  undefined7 uVar18;
  Mat *pMVar10;
  Mat *pMVar11;
  Mat *pMVar12;
  Mat *pMVar13;
  Mat *pMVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  byte bVar19;
  int iVar20;
  undefined4 uVar21;
  uint uVar22;
  void *pvVar23;
  bool reduce_d;
  undefined4 uVar24;
  int iVar25;
  ulong uVar26;
  size_t sVar27;
  long lVar28;
  int j_5;
  ulong uVar29;
  int i_111;
  uint uVar30;
  void *pvVar31;
  uint *puVar32;
  Mat *pMVar33;
  Mat *pMVar34;
  byte bVar35;
  ulong uVar36;
  byte bVar37;
  int i_2;
  int iVar38;
  ulong uVar39;
  size_t sVar40;
  byte bVar41;
  int i_5;
  void **ppvVar42;
  byte bVar43;
  int i_16;
  int i_3;
  int i_104;
  ulong uVar44;
  long lVar45;
  byte bVar46;
  int j_9;
  void *pvVar47;
  void *pvVar48;
  ulong uVar49;
  int j_6;
  uint uVar50;
  int j;
  uint uVar51;
  Mat *pMVar52;
  bool bVar53;
  float coeff;
  float fVar54;
  int iVar67;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 extraout_XMM0 [16];
  undefined1 extraout_XMM0_00 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 extraout_XMM0_07 [16];
  undefined1 extraout_XMM0_08 [16];
  undefined1 extraout_XMM0_09 [16];
  undefined1 extraout_XMM0_10 [16];
  undefined1 extraout_XMM0_11 [16];
  undefined1 extraout_XMM0_12 [16];
  undefined1 extraout_XMM0_13 [16];
  undefined1 extraout_XMM0_14 [16];
  undefined1 extraout_XMM0_15 [16];
  undefined1 extraout_XMM0_16 [16];
  undefined1 extraout_XMM0_17 [16];
  undefined1 extraout_XMM0_18 [16];
  undefined1 extraout_var [12];
  undefined1 extraout_XMM0_19 [16];
  undefined1 extraout_XMM0_20 [16];
  undefined1 extraout_var_00 [12];
  undefined1 extraout_XMM0_21 [16];
  undefined1 extraout_XMM0_22 [16];
  undefined1 extraout_var_01 [12];
  undefined1 extraout_XMM0_23 [16];
  undefined1 extraout_XMM0_24 [16];
  undefined1 extraout_XMM0_25 [16];
  undefined1 extraout_XMM0_26 [16];
  undefined1 extraout_XMM0_27 [16];
  undefined1 extraout_var_02 [12];
  undefined1 extraout_XMM0_28 [16];
  undefined1 extraout_XMM0_29 [16];
  undefined1 extraout_var_03 [12];
  undefined1 extraout_XMM0_30 [16];
  undefined1 extraout_XMM0_31 [16];
  undefined1 extraout_var_04 [12];
  undefined1 extraout_XMM0_32 [16];
  undefined1 extraout_var_05 [12];
  undefined1 extraout_XMM0_33 [16];
  undefined1 extraout_XMM0_34 [16];
  undefined1 extraout_XMM0_35 [16];
  undefined1 extraout_XMM0_36 [16];
  undefined1 extraout_var_06 [12];
  undefined1 extraout_XMM0_37 [16];
  undefined1 extraout_XMM0_38 [16];
  undefined1 extraout_var_07 [12];
  undefined1 extraout_XMM0_39 [16];
  undefined1 extraout_XMM0_40 [16];
  undefined1 extraout_var_08 [12];
  undefined1 extraout_XMM0_41 [16];
  undefined1 extraout_XMM0_42 [16];
  undefined1 extraout_XMM0_43 [16];
  undefined1 extraout_XMM0_44 [16];
  undefined1 extraout_var_09 [12];
  undefined1 extraout_XMM0_45 [16];
  undefined1 extraout_XMM0_46 [16];
  undefined1 extraout_XMM0_47 [16];
  undefined1 extraout_XMM0_48 [16];
  undefined1 extraout_var_10 [12];
  undefined1 extraout_XMM0_49 [16];
  undefined1 extraout_var_11 [12];
  undefined1 extraout_XMM0_50 [16];
  undefined1 extraout_var_12 [12];
  float sum;
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  Option *in_stack_fffffffffffffee8;
  void *local_108;
  int local_100;
  Mat *local_f8;
  Mat *local_e8;
  int local_e0;
  Mat local_c8;
  Mat *local_80;
  Mat *local_78;
  void *local_70;
  int local_64;
  Mat *local_60;
  int axes_flag [4];
  
  uVar8 = bottom_blob->dims;
  auVar55 = (undefined1  [16])0x0;
  axes_flag[0] = 0;
  axes_flag[1] = 0;
  axes_flag[2] = 0;
  axes_flag[3] = 0;
  if (this->reduce_all == 0) {
    pvVar23 = (this->axes).data;
    uVar9 = (this->axes).w;
    uVar26 = 0;
    uVar49 = (ulong)uVar9;
    if ((int)uVar9 < 1) {
      uVar49 = uVar26;
    }
    for (; aiVar7 = axes_flag, uVar49 != uVar26; uVar26 = uVar26 + 1) {
      iVar20 = *(int *)((long)pvVar23 + uVar26 * 4);
      axes_flag[(int)((iVar20 >> 0x1f & uVar8) + iVar20)] = 1;
    }
    uVar18 = (undefined7)
             ((ulong)((long)&switchD_002e9c6e::switchdataD_004f4c40 +
                     (long)(int)(&switchD_002e9c6e::switchdataD_004f4c40)[uVar8 - 1]) >> 8);
    iVar20 = axes_flag[0];
    iVar38 = axes_flag[1];
    iVar67 = axes_flag[2];
    switch(uVar8) {
    case 1:
      auVar69 = _DAT_004f4c10;
      break;
    case 2:
      auVar55._8_8_ = 0;
      auVar55._0_4_ = (float)axes_flag[0];
      auVar55._4_4_ = axes_flag[1];
      auVar69._0_4_ = -(uint)(iVar20 == 1);
      auVar69._4_4_ = -(uint)(iVar38 == 1);
      auVar69._8_4_ = -(uint)(iVar38 == 1);
      auVar69._12_4_ = 0xffffffff;
      break;
    case 3:
      uVar21 = (undefined4)CONCAT71(uVar18,axes_flag[0] == 1);
      auVar55._8_8_ = 0;
      auVar55._0_4_ = (float)axes_flag[1];
      auVar55._4_4_ = axes_flag[2];
      auVar69._0_4_ = -(uint)(iVar38 == 1);
      auVar69._4_4_ = -(uint)(iVar67 == 1);
      auVar69._8_4_ = -(uint)(iVar67 == 1);
      auVar69._12_4_ = 0xffffffff;
      goto LAB_002e9ce9;
    case 4:
      uVar21 = (undefined4)CONCAT71(uVar18,axes_flag[0] == 1);
      uVar24 = (undefined4)CONCAT71((int7)(uVar26 >> 8),axes_flag[1] == 1);
      auVar55._8_8_ = 0;
      auVar55._0_4_ = (float)axes_flag[2];
      auVar55._4_4_ = axes_flag[3];
      auVar69._0_4_ = -(uint)(iVar67 == 1);
      auVar69._4_4_ = -(uint)(aiVar7[3] == 1);
      auVar69._8_4_ = -(uint)(aiVar7[3] == 1);
      auVar69._12_4_ = 0xffffffff;
      axes_flag = aiVar7;
      goto LAB_002e9ceb;
    default:
      auVar69 = (undefined1  [16])0x0;
    }
    uVar21 = 0;
LAB_002e9ce9:
    uVar24 = 0;
    axes_flag = aiVar7;
  }
  else {
    uVar21 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
    uVar24 = (undefined4)CONCAT71((int7)((ulong)top_blob >> 8),1);
    auVar69 = _DAT_004f4c00;
  }
LAB_002e9ceb:
  uVar9 = this->operation;
  if (10 < (ulong)uVar9) {
    return 0;
  }
  puVar32 = &switchD_002e9d16::switchdataD_004f4c50;
  iVar20 = auVar69._0_4_;
  lVar28 = auVar69._0_8_;
  lVar16 = auVar69._8_8_;
  reduce_d = SUB41(uVar24,0);
  reduce_c = SUB41(uVar21,0);
  bVar19 = auVar69[0];
  bVar46 = auVar69[8];
  switch(uVar9) {
  case 0:
    fVar54 = this->coeff;
    iVar38 = this->keepdims;
    auVar70._0_8_ = lVar28 << 0x3f;
    auVar70._8_8_ = lVar16 << 0x3f;
    uVar21 = movmskpd(iVar20,auVar70);
    bVar19 = (byte)uVar21;
    bVar53 = false;
    goto LAB_002eab60;
  case 1:
    fVar54 = this->coeff;
    post_process = (undefined1)this->keepdims;
    auVar74._0_8_ = lVar28 << 0x3f;
    auVar74._8_8_ = lVar16 << 0x3f;
    uVar21 = movmskpd(iVar20,auVar74);
    bVar19 = (byte)uVar21;
    goto LAB_002e9f25;
  case 2:
    fVar54 = this->coeff;
    auVar72._0_8_ = lVar28 << 0x3f;
    auVar72._8_8_ = lVar16 << 0x3f;
    uVar21 = movmskpd(iVar20,auVar72);
    pMVar33 = top_blob;
    iVar20 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                       (bottom_blob,top_blob,fVar54,(bool)((byte)uVar21 >> 1),
                        (bool)((byte)uVar21 & 1),reduce_d,reduce_c,this->keepdims,opt);
    if (iVar20 != 0) {
      return -100;
    }
    if (1.1920929e-07 < ABS(fVar54 + -1.0)) {
      reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar54,(Option *)pMVar33);
      return 0;
    }
    return 0;
  case 3:
    if (3 < uVar8 - 1) {
      iVar20 = 1;
      goto LAB_002eab2c;
    }
    switch(uVar8) {
    case 1:
      iVar20 = bottom_blob->w;
      break;
    case 2:
      auVar60._0_8_ = lVar28 << 0x3f;
      auVar60._8_8_ = lVar16 << 0x3f;
      uVar8 = movmskpd((&switchD_002e9eb2::switchdataD_004f4cbc)[uVar8 - 1] + 0x4f4cbc,auVar60);
      if ((uVar8 & 2) == 0) {
        iVar20 = 1;
      }
      else {
        iVar20 = bottom_blob->w;
      }
      if ((uVar8 & 1) != 0) {
        iVar20 = iVar20 * bottom_blob->h;
      }
      break;
    case 3:
      uVar2 = bottom_blob->w;
      uVar3 = bottom_blob->h;
      uVar8 = (iVar20 << 0x1f) >> 0x1f;
      uVar22 = (auVar69._8_4_ << 0x1f) >> 0x1f;
      uVar9 = ~uVar8 & 1 | uVar3 & uVar8;
      uVar30 = ~uVar22 & 1 | uVar2 & uVar22;
      goto LAB_002ea34f;
    case 4:
      auVar59._0_8_ = lVar28 << 0x3f;
      auVar59._8_8_ = lVar16 << 0x3f;
      uVar22 = movmskpd((&switchD_002e9d16::switchdataD_004f4c50)[uVar9] + 0x4f4c50,auVar59);
      uVar9 = 1;
      uVar8 = uVar9;
      if ((uVar22 & 2) != 0) {
        uVar8 = bottom_blob->w;
      }
      uVar30 = uVar9;
      if ((uVar22 & 1) != 0) {
        uVar30 = bottom_blob->h;
      }
      uVar30 = uVar30 * uVar8;
      if (reduce_d != false) {
        uVar9 = bottom_blob->d;
      }
LAB_002ea34f:
      iVar20 = uVar30 * uVar9;
      if (reduce_c != false) {
        iVar20 = iVar20 * bottom_blob->c;
      }
    }
LAB_002eab2c:
    fVar54 = this->coeff / (float)iVar20;
    iVar38 = this->keepdims;
    auVar88._0_8_ = lVar28 << 0x3f;
    auVar88._8_8_ = lVar16 << 0x3f;
    uVar21 = movmskpd(iVar20,auVar88);
    bVar19 = (byte)uVar21;
    bVar53 = true;
LAB_002eab60:
    iVar20 = reduction<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar54,(bool)(bVar19 >> 1),(bool)(bVar19 & 1),reduce_d,
                        reduce_c,bVar53,0.0,iVar38,opt);
    return iVar20;
  case 4:
    fVar54 = this->coeff;
    if (3 < uVar8 - 1) goto LAB_002f4234;
    iVar20 = this->keepdims;
    sVar27 = bottom_blob->elemsize;
    switch(uVar8) {
    case 1:
      uVar8 = bottom_blob->w;
      puVar32 = (uint *)0x1;
      Mat::create(top_blob,1,sVar27,opt->blob_allocator);
      uVar26 = 0;
      uVar49 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar49 = uVar26;
      }
      fVar68 = -3.4028235e+38;
      for (; uVar49 != uVar26; uVar26 = uVar26 + 1) {
        fVar1 = *(float *)((long)bottom_blob->data + uVar26 * 4);
        if (fVar68 <= fVar1) {
          fVar68 = fVar1;
        }
      }
LAB_002ea14e:
      *(float *)top_blob->data = fVar68;
      goto LAB_002f4234;
    case 2:
      uVar8 = bottom_blob->w;
      pMVar33 = (Mat *)(ulong)uVar8;
      uVar9 = bottom_blob->h;
      auVar58._8_4_ = 0xffffffff;
      auVar58._0_8_ = 0xffffffffffffffff;
      auVar58._12_4_ = 0xffffffff;
      auVar78._0_8_ = SUB168(auVar69 ^ auVar58,0) << 0x3f;
      auVar78._8_8_ = SUB168(auVar69 ^ auVar58,8) << 0x3f;
      iVar38 = movmskpd(uVar21,auVar78);
      if (iVar38 != 0) {
        if (((bVar19 | (byte)iVar38 >> 1) & 1) == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar9,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          iVar20 = bottom_blob->w;
          sVar27 = bottom_blob->elemsize;
          pvVar47 = top_blob->data;
          puVar32 = (uint *)0x0;
          if ((int)uVar8 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          pMVar10 = (Mat *)(ulong)uVar9;
          if ((int)uVar9 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = -3.4028235e+38;
            for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar1 = *(float *)((long)pvVar23 + (long)pMVar12 * 4);
              if (fVar68 <= fVar1) {
                fVar68 = fVar1;
              }
            }
            *(float *)((long)pvVar47 + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
          }
        }
        else if (((bVar46 | (byte)iVar38) & 1) == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar8,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar8,1,sVar27,opt->blob_allocator);
          }
          uVar22 = top_blob->c * (int)top_blob->cstep;
          pvVar23 = top_blob->data;
          uVar26 = 0;
          uVar49 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar49 = uVar26;
          }
          for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
            *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0xff7fffff;
          }
          iVar20 = bottom_blob->w;
          sVar27 = bottom_blob->elemsize;
          pMVar10 = (Mat *)0x0;
          if ((int)uVar8 < 1) {
            pMVar33 = pMVar10;
          }
          puVar32 = (uint *)bottom_blob->data;
          pMVar12 = (Mat *)(ulong)uVar9;
          if ((int)uVar9 < 1) {
            pMVar12 = pMVar10;
          }
          for (; pMVar10 != pMVar12; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
            for (pMVar34 = (Mat *)0x0; pMVar33 != pMVar34;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              fVar1 = *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar34 * 4);
              fVar68 = *(float *)((long)pvVar23 + (long)pMVar34 * 4);
              if (fVar1 <= fVar68) {
                fVar1 = fVar68;
              }
              *(float *)((long)pvVar23 + (long)pMVar34 * 4) = fVar1;
            }
            puVar32 = (uint *)((long)&((Mat *)puVar32)->data + (long)iVar20 * sVar27);
          }
        }
        goto LAB_002f4234;
      }
      if (iVar20 == 0) {
        Mat::create(top_blob,1,sVar27,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,sVar27,opt->blob_allocator);
      }
      local_c8.cstep = 0;
      local_c8.data = (Mat *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize = 0;
      local_c8.elempack = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      puVar32 = (uint *)(ulong)uVar9;
      Mat::create(&local_c8,uVar9,sVar27,opt->workspace_allocator);
      iVar38 = -100;
      if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
        pvVar23 = bottom_blob->data;
        iVar20 = bottom_blob->w;
        sVar27 = bottom_blob->elemsize;
        puVar32 = (uint *)0x0;
        if ((int)uVar8 < 1) {
          pMVar33 = (Mat *)puVar32;
        }
        pMVar10 = (Mat *)(ulong)uVar9;
        if ((int)uVar9 < 1) {
          pMVar10 = (Mat *)puVar32;
        }
        for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
          fVar68 = -3.4028235e+38;
          for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12; pMVar12 = (Mat *)((long)&pMVar12->data + 1)
              ) {
            fVar1 = *(float *)((long)pvVar23 + (long)pMVar12 * 4);
            if (fVar68 <= fVar1) {
              fVar68 = fVar1;
            }
          }
          *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
          pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
        }
        fVar68 = -3.4028235e+38;
        for (pMVar33 = (Mat *)0x0; pMVar10 != pMVar33; pMVar33 = (Mat *)((long)&pMVar33->data + 1))
        {
          fVar1 = *(float *)((long)(void **)local_c8.data + (long)pMVar33 * 4);
          if (fVar68 <= fVar1) {
            fVar68 = fVar1;
          }
        }
        *(float *)top_blob->data = fVar68;
        iVar38 = 0;
      }
      piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
          puVar32 = (uint *)local_c8.data;
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
      break;
    case 3:
      uVar8 = bottom_blob->w;
      lVar28 = (long)(int)uVar8;
      uVar9 = bottom_blob->h;
      uVar22 = bottom_blob->c;
      uVar30 = uVar9 * uVar8;
      auVar56._8_4_ = 0xffffffff;
      auVar56._0_8_ = 0xffffffffffffffff;
      auVar56._12_4_ = 0xffffffff;
      auVar76._0_8_ = SUB168(auVar69 ^ auVar56,0) << 0x3f;
      auVar76._8_8_ = SUB168(auVar69 ^ auVar56,8) << 0x3f;
      iVar38 = movmskpd(uVar24,auVar76);
      bVar35 = reduce_c ^ 1;
      if ((iVar38 != 0) || (bVar35 != 0)) {
        if (iVar38 == 0 && reduce_c == false) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar22,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar22,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          sVar27 = top_blob->elemsize;
          sVar15 = top_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar49 = uVar26;
          }
          uVar36 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar36 = uVar26;
          }
          pvVar47 = top_blob->data;
          puVar32 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
          for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
            fVar68 = -3.4028235e+38;
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar1 = *(float *)((long)pvVar23 + uVar39 * 4);
              if (fVar68 <= fVar1) {
                fVar68 = fVar1;
              }
            }
            lVar28 = sVar27 * sVar15 * uVar26;
            if (iVar20 == 0) {
              lVar28 = uVar26 * 4;
            }
            *(float *)((long)pvVar47 + lVar28) = fVar68;
            pvVar23 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar23);
          }
          goto LAB_002f4234;
        }
        bVar41 = (byte)iVar38 >> 1 | bVar19;
        if ((bVar41 & 1) == 0 && bVar35 == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar9,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar9,uVar22,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar30 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar30;
            if ((int)uVar30 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0xff7fffff;
            }
            pvVar23 = bottom_blob->data;
            uVar49 = 0;
            puVar32 = (uint *)0x0;
            if (0 < (int)uVar8) {
              puVar32 = (uint *)(ulong)uVar8;
            }
            sVar27 = bottom_blob->elemsize;
            uVar26 = (ulong)uVar9;
            if ((int)uVar9 < 1) {
              uVar26 = uVar49;
            }
            uVar36 = (ulong)uVar22;
            if ((int)uVar22 < 1) {
              uVar36 = uVar49;
            }
            sVar15 = bottom_blob->cstep;
            for (; uVar49 != uVar36; uVar49 = uVar49 + 1) {
              pvVar47 = pvVar23;
              for (uVar39 = 0; uVar39 != uVar26; uVar39 = uVar39 + 1) {
                auVar89 = ZEXT816(0xff7fffff);
                for (pMVar33 = (Mat *)0x0; (Mat *)puVar32 != pMVar33;
                    pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
                  fVar68 = *(float *)((long)pvVar47 + (long)pMVar33 * 4);
                  if (auVar89._0_4_ <= fVar68) {
                    auVar89._0_4_ = fVar68;
                  }
                }
                *(float *)((long)(void **)local_c8.data +
                          uVar39 * 4 + local_c8.elemsize * local_c8.cstep * uVar49) = auVar89._0_4_;
                pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar39 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar39;
            }
            for (; (int)uVar49 != (int)uVar39; uVar39 = uVar39 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar39 * 4) = 0xff7fffff;
            }
            iVar38 = 0;
            pMVar33 = (Mat *)local_c8.data;
            for (uVar49 = 0; uVar49 != uVar36; uVar49 = uVar49 + 1) {
              puVar32 = (uint *)top_blob->data;
              for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                fVar1 = *(float *)((long)&pMVar33->data + uVar39 * 4);
                fVar68 = *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4);
                if (fVar1 <= fVar68) {
                  fVar1 = fVar68;
                }
                *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4) = fVar1;
              }
              pMVar33 = (Mat *)((long)&pMVar33->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
LAB_002f274f:
                puVar32 = (uint *)local_c8.data;
                free(local_c8.data);
              }
              else {
                puVar32 = (uint *)local_c8.data;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
        }
        else {
          bVar43 = (byte)iVar38 | bVar46;
          if ((bVar43 & 1) != 0 || bVar35 != 0) {
            if ((bVar41 & 1) == 0 && reduce_c == false) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar9,uVar22,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar9,uVar22,sVar27,opt->blob_allocator);
              }
              uVar49 = 0;
              uVar26 = 0;
              if (0 < (int)uVar8) {
                uVar26 = (ulong)uVar8;
              }
              uVar36 = (ulong)uVar9;
              if ((int)uVar9 < 1) {
                uVar36 = uVar49;
              }
              uVar39 = (ulong)uVar22;
              if ((int)uVar22 < 1) {
                uVar39 = uVar49;
              }
              sVar27 = bottom_blob->elemsize;
              if (iVar20 == 0) {
                sVar15 = (size_t)top_blob->w;
              }
              else {
                sVar15 = top_blob->cstep;
              }
              pvVar23 = bottom_blob->data;
              pvVar47 = top_blob->data;
              puVar32 = (uint *)(sVar15 * top_blob->elemsize);
              sVar15 = bottom_blob->cstep;
              for (; uVar49 != uVar39; uVar49 = uVar49 + 1) {
                pvVar31 = pvVar23;
                for (uVar29 = 0; uVar29 != uVar36; uVar29 = uVar29 + 1) {
                  auVar95 = ZEXT816(0xff7fffff);
                  for (uVar44 = 0; uVar26 != uVar44; uVar44 = uVar44 + 1) {
                    fVar68 = *(float *)((long)pvVar31 + uVar44 * 4);
                    if (auVar95._0_4_ <= fVar68) {
                      auVar95._0_4_ = fVar68;
                    }
                  }
                  *(float *)((long)pvVar47 + uVar29 * 4 + (long)puVar32 * uVar49) = auVar95._0_4_;
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              }
            }
            else if (((bVar19 | bVar46) & 1) == 0 && bVar35 == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar8,uVar9,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar8,uVar9,1,sVar27,opt->blob_allocator);
              }
              iVar20 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              lVar28 = 0;
              if (iVar20 < 1) {
                iVar20 = 0;
              }
              for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
                *(undefined4 *)((long)pvVar23 + lVar28 * 4) = 0xff7fffff;
              }
              sVar27 = bottom_blob->elemsize;
              sVar15 = bottom_blob->cstep;
              uVar26 = 0;
              uVar49 = (ulong)uVar30;
              if ((int)uVar30 < 1) {
                uVar49 = uVar26;
              }
              pvVar23 = bottom_blob->data;
              uVar36 = (ulong)uVar22;
              puVar32 = (uint *)bottom_blob;
              if ((int)uVar22 < 1) {
                uVar36 = uVar26;
              }
              for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
                puVar32 = (uint *)top_blob->data;
                for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
                  fVar1 = *(float *)((long)pvVar23 + uVar39 * 4);
                  fVar68 = *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4);
                  if (fVar1 <= fVar68) {
                    fVar1 = fVar68;
                  }
                  *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4) = fVar1;
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              }
            }
            else if (reduce_c == false && (bVar43 & 1) == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar8,uVar22,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar8,1,uVar22,sVar27,opt->blob_allocator);
              }
              uVar30 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              uVar26 = 0;
              uVar49 = (ulong)uVar30;
              if ((int)uVar30 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0xff7fffff;
              }
              uVar49 = 0;
              uVar26 = 0;
              if (0 < (int)uVar8) {
                uVar26 = (ulong)uVar8;
              }
              if ((int)uVar9 < 1) {
                uVar9 = 0;
              }
              uVar36 = (ulong)uVar22;
              if ((int)uVar22 < 1) {
                uVar36 = uVar49;
              }
              sVar27 = bottom_blob->elemsize;
              if (iVar20 == 0) {
                sVar15 = (size_t)top_blob->w;
              }
              else {
                sVar15 = top_blob->cstep;
              }
              pvVar23 = bottom_blob->data;
              puVar32 = (uint *)(sVar15 * top_blob->elemsize);
              pvVar47 = top_blob->data;
              sVar15 = bottom_blob->cstep;
              for (; uVar49 != uVar36; uVar49 = uVar49 + 1) {
                pvVar31 = pvVar23;
                for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
                  for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                    fVar1 = *(float *)((long)pvVar31 + uVar39 * 4);
                    fVar68 = *(float *)((long)pvVar47 + uVar39 * 4);
                    if (fVar1 <= fVar68) {
                      fVar1 = fVar68;
                    }
                    *(float *)((long)pvVar47 + uVar39 * 4) = fVar1;
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
                pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
              }
            }
            goto LAB_002f4234;
          }
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar8,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar8,1,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)(ulong)uVar8;
          Mat::create(&local_c8,uVar8,1,uVar22,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar30 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar30;
            if ((int)uVar30 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0xff7fffff;
            }
            pvVar23 = bottom_blob->data;
            sVar27 = bottom_blob->elemsize;
            pMVar33 = (Mat *)0x0;
            uVar49 = 0;
            if (0 < (int)uVar8) {
              uVar49 = (ulong)uVar8;
            }
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            pMVar10 = (Mat *)(ulong)uVar22;
            if ((int)uVar22 < 1) {
              pMVar10 = pMVar33;
            }
            sVar15 = bottom_blob->cstep;
            pMVar12 = (Mat *)local_c8.data;
            for (; pMVar33 != pMVar10; pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
              pvVar47 = pvVar23;
              for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
                for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                  fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                  fVar68 = *(float *)((long)&pMVar12->data + uVar26 * 4);
                  if (fVar1 <= fVar68) {
                    fVar1 = fVar68;
                  }
                  *(float *)((long)&pMVar12->data + uVar26 * 4) = fVar1;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              pMVar12 = (Mat *)((long)&pMVar12->data + local_c8.elemsize * local_c8.cstep);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar36 = 0;
            uVar26 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar26 = uVar36;
            }
            for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0xff7fffff;
            }
            iVar38 = 0;
            pMVar33 = (Mat *)local_c8.data;
            for (puVar32 = (uint *)0x0; (Mat *)puVar32 != pMVar10;
                puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
              pvVar23 = top_blob->data;
              for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                fVar1 = *(float *)((long)&pMVar33->data + uVar26 * 4);
                fVar68 = *(float *)((long)pvVar23 + uVar26 * 4);
                if (fVar1 <= fVar68) {
                  fVar1 = fVar68;
                }
                *(float *)((long)pvVar23 + uVar26 * 4) = fVar1;
              }
              pMVar33 = (Mat *)((long)&pMVar33->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (iVar20 == 0) {
          Mat::create(top_blob,1,sVar27,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar27,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar32 = (uint *)(ulong)uVar22;
        Mat::create(&local_c8,uVar22,sVar27,opt->workspace_allocator);
        iVar38 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          pvVar23 = bottom_blob->data;
          sVar27 = bottom_blob->elemsize;
          sVar15 = bottom_blob->cstep;
          puVar32 = (uint *)0x0;
          pMVar33 = (Mat *)(ulong)uVar30;
          if ((int)uVar30 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          pMVar10 = (Mat *)(ulong)uVar22;
          if ((int)uVar22 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = -3.4028235e+38;
            for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar1 = *(float *)((long)pvVar23 + (long)pMVar12 * 4);
              if (fVar68 <= fVar1) {
                fVar68 = fVar1;
              }
            }
            *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
          }
          fVar68 = -3.4028235e+38;
          for (pMVar33 = (Mat *)0x0; pMVar10 != pMVar33; pMVar33 = (Mat *)((long)&pMVar33->data + 1)
              ) {
            fVar1 = *(float *)((long)(void **)local_c8.data + (long)pMVar33 * 4);
            if (fVar68 <= fVar1) {
              fVar68 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar68;
          iVar38 = 0;
        }
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
            puVar32 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      break;
    case 4:
      uVar9 = bottom_blob->w;
      lVar28 = (long)(int)uVar9;
      uVar22 = bottom_blob->h;
      uVar30 = bottom_blob->d;
      uVar4 = bottom_blob->c;
      pMVar33 = (Mat *)(ulong)uVar4;
      uVar50 = uVar22 * uVar9;
      uVar51 = uVar50 * uVar30;
      auVar57._8_4_ = 0xffffffff;
      auVar57._0_8_ = 0xffffffffffffffff;
      auVar57._12_4_ = 0xffffffff;
      auVar77._0_8_ = SUB168(auVar69 ^ auVar57,0) << 0x3f;
      auVar77._8_8_ = SUB168(auVar69 ^ auVar57,8) << 0x3f;
      iVar38 = movmskpd((&switchD_002e9d85::switchdataD_004f4cac)[uVar8 - 1] + 0x4f4cac,auVar77);
      bVar53 = iVar38 != 0;
      bVar35 = reduce_d ^ 1;
      bVar41 = reduce_c ^ 1;
      if ((bVar53 || bVar35 != 0) || (bVar41 != 0)) {
        if ((!bVar53 && bVar35 == 0) && reduce_c == false) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar4,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,1,uVar4,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          sVar27 = top_blob->elemsize;
          sVar15 = top_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar49 = uVar26;
          }
          uVar36 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar36 = uVar26;
          }
          pvVar47 = top_blob->data;
          puVar32 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
          for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
            fVar68 = -3.4028235e+38;
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar1 = *(float *)((long)pvVar23 + uVar39 * 4);
              if (fVar68 <= fVar1) {
                fVar68 = fVar1;
              }
            }
            lVar28 = sVar27 * sVar15 * uVar26;
            if (iVar20 == 0) {
              lVar28 = uVar26 * 4;
            }
            *(float *)((long)pvVar47 + lVar28) = fVar68;
            pvVar23 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar23);
          }
          goto LAB_002f4234;
        }
        if ((bVar53 || reduce_d != false) || bVar41 != 0) {
          bVar43 = (byte)iVar38 >> 1 | bVar19;
          if (((bVar43 & 1) == 0 && bVar35 == 0) && bVar41 == 0) {
            if (iVar20 == 0) {
              Mat::create(top_blob,uVar22,sVar27,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar22,1,1,sVar27,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar32 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar22,uVar4,sVar27,opt->workspace_allocator);
            iVar38 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0)
               ) {
              uVar8 = (int)local_c8.cstep * local_c8.c;
              uVar26 = 0;
              uVar49 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0xff7fffff;
              }
              sVar27 = bottom_blob->elemsize;
              sVar15 = bottom_blob->cstep;
              pMVar10 = (Mat *)0x0;
              puVar32 = (uint *)0x0;
              if (0 < (int)uVar9) {
                puVar32 = (uint *)(ulong)uVar9;
              }
              pvVar23 = bottom_blob->data;
              pMVar12 = (Mat *)(ulong)uVar22;
              if ((int)uVar22 < 1) {
                pMVar12 = pMVar10;
              }
              if ((int)uVar30 < 1) {
                uVar30 = 0;
              }
              if ((int)uVar4 < 1) {
                pMVar33 = pMVar10;
              }
              for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                lVar16 = local_c8.elemsize * local_c8.cstep * (long)pMVar10;
                for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                  for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                      pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                    for (pMVar52 = (Mat *)0x0; (Mat *)puVar32 != pMVar52;
                        pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                      fVar1 = *(float *)((long)pvVar47 + (long)pMVar52 * 4);
                      fVar68 = *(float *)((long)(void **)local_c8.data + (long)pMVar34 * 4 + lVar16)
                      ;
                      if (fVar1 <= fVar68) {
                        fVar1 = fVar68;
                      }
                      *(float *)((long)(void **)local_c8.data + (long)pMVar34 * 4 + lVar16) = fVar1;
                    }
                    pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                  }
                }
              }
              uVar8 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              uVar26 = 0;
              uVar49 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0xff7fffff;
              }
              pMVar10 = (Mat *)local_c8.data;
              for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                puVar32 = (uint *)top_blob->data;
                for (pMVar52 = (Mat *)0x0; pMVar12 != pMVar52;
                    pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  fVar1 = *(float *)((long)&pMVar10->data + (long)pMVar52 * 4);
                  fVar68 = *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4);
                  if (fVar1 <= fVar68) {
                    fVar1 = fVar68;
                  }
                  *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4) = fVar1;
                }
                pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
              }
              iVar38 = 0;
            }
            piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                puVar32 = (uint *)local_c8.data;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            bVar37 = (byte)iVar38 | bVar46;
            if (((bVar37 & 1) == 0 && bVar35 == 0) && bVar41 == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar9,1,1,1,sVar27,opt->blob_allocator);
              }
              local_c8.cstep = 0;
              local_c8.data = (Mat *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.elemsize = 0;
              local_c8.elempack = 0;
              local_c8.allocator = (Allocator *)0x0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.d = 0;
              local_c8.c = 0;
              puVar32 = (uint *)(ulong)uVar9;
              Mat::create(&local_c8,uVar9,1,uVar4,sVar27,opt->workspace_allocator);
              iVar38 = -100;
              if (((Mat *)local_c8.data != (Mat *)0x0) &&
                 (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                 (Mat *)puVar32 != (Mat *)0x0)) {
                uVar8 = (int)local_c8.cstep * local_c8.c;
                uVar26 = 0;
                uVar49 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar49 = uVar26;
                }
                for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                  *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0xff7fffff;
                }
                sVar27 = bottom_blob->elemsize;
                sVar15 = bottom_blob->cstep;
                pMVar10 = (Mat *)0x0;
                uVar49 = 0;
                if (0 < (int)uVar9) {
                  uVar49 = (ulong)uVar9;
                }
                if ((int)uVar22 < 1) {
                  uVar22 = 0;
                }
                pvVar23 = bottom_blob->data;
                if ((int)uVar30 < 1) {
                  uVar30 = 0;
                }
                if ((int)uVar4 < 1) {
                  pMVar33 = pMVar10;
                }
                pMVar12 = (Mat *)local_c8.data;
                for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                  pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                  for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                    for (uVar9 = 0; uVar9 != uVar22; uVar9 = uVar9 + 1) {
                      for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                        fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                        fVar68 = *(float *)((long)&pMVar12->data + uVar26 * 4);
                        if (fVar1 <= fVar68) {
                          fVar1 = fVar68;
                        }
                        *(float *)((long)&pMVar12->data + uVar26 * 4) = fVar1;
                      }
                      pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                    }
                  }
                  pMVar12 = (Mat *)((long)&pMVar12->data + local_c8.elemsize * local_c8.cstep);
                }
                uVar8 = top_blob->c * (int)top_blob->cstep;
                pvVar23 = top_blob->data;
                uVar36 = 0;
                uVar26 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar26 = uVar36;
                }
                for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                  *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0xff7fffff;
                }
                iVar38 = 0;
                pMVar10 = (Mat *)local_c8.data;
                for (puVar32 = (uint *)0x0; (Mat *)puVar32 != pMVar33;
                    puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
                  pvVar23 = top_blob->data;
                  for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                    fVar1 = *(float *)((long)&pMVar10->data + uVar26 * 4);
                    fVar68 = *(float *)((long)pvVar23 + uVar26 * 4);
                    if (fVar1 <= fVar68) {
                      fVar1 = fVar68;
                    }
                    *(float *)((long)pvVar23 + uVar26 * 4) = fVar1;
                  }
                  pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
                }
              }
              piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                  puVar32 = (uint *)local_c8.data;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            else {
              if ((!bVar53 && reduce_d == false) && reduce_c == false) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar30,uVar4,sVar27,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,1,uVar30,uVar4,sVar27,opt->blob_allocator);
                }
                uVar49 = 0;
                uVar26 = 0;
                if (0 < (int)uVar50) {
                  uVar26 = (ulong)uVar50;
                }
                uVar36 = (ulong)uVar30;
                if ((int)uVar30 < 1) {
                  uVar36 = uVar49;
                }
                uVar39 = (ulong)uVar4;
                if ((int)uVar4 < 1) {
                  uVar39 = uVar49;
                }
                sVar27 = bottom_blob->elemsize;
                if (iVar20 == 0) {
                  sVar15 = (size_t)top_blob->w;
                }
                else {
                  sVar15 = top_blob->cstep;
                }
                pvVar23 = bottom_blob->data;
                pvVar47 = top_blob->data;
                sVar40 = top_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                puVar32 = (uint *)((long)(int)uVar50 * 4);
                for (; uVar49 != uVar39; uVar49 = uVar49 + 1) {
                  pvVar31 = pvVar23;
                  for (uVar29 = 0; uVar29 != uVar36; uVar29 = uVar29 + 1) {
                    auVar98 = ZEXT816(0xff7fffff);
                    for (uVar44 = 0; uVar26 != uVar44; uVar44 = uVar44 + 1) {
                      fVar68 = *(float *)((long)pvVar31 + uVar44 * 4);
                      if (auVar98._0_4_ <= fVar68) {
                        auVar98._0_4_ = fVar68;
                      }
                    }
                    *(float *)((long)pvVar47 + uVar29 * 4 + sVar15 * sVar40 * uVar49) =
                         auVar98._0_4_;
                    pvVar31 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar31);
                  }
                  pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar5);
                }
                goto LAB_002f4234;
              }
              if (((bVar43 & 1) == 0 && reduce_d == false) && bVar41 == 0) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar22,uVar30,sVar27,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,uVar22,uVar30,1,sVar27,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar32 = (uint *)(ulong)uVar22;
                Mat::create(&local_c8,uVar22,uVar30,uVar4,sVar27,opt->workspace_allocator);
                iVar38 = -100;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                   (Mat *)puVar32 != (Mat *)0x0)) {
                  uVar8 = (int)local_c8.cstep * local_c8.c;
                  uVar26 = 0;
                  uVar49 = (ulong)uVar8;
                  if ((int)uVar8 < 1) {
                    uVar49 = uVar26;
                  }
                  for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0xff7fffff;
                  }
                  sVar27 = bottom_blob->elemsize;
                  sVar15 = bottom_blob->cstep;
                  pMVar10 = (Mat *)0x0;
                  uVar49 = 0;
                  if (0 < (int)uVar9) {
                    uVar49 = (ulong)uVar9;
                  }
                  pvVar23 = bottom_blob->data;
                  pMVar12 = (Mat *)(ulong)uVar22;
                  if ((int)uVar22 < 1) {
                    pMVar12 = pMVar10;
                  }
                  pMVar34 = (Mat *)(ulong)uVar30;
                  if ((int)uVar30 < 1) {
                    pMVar34 = pMVar10;
                  }
                  if ((int)uVar4 < 1) {
                    pMVar33 = pMVar10;
                  }
                  for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                    pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                    for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar34;
                        pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                      lVar16 = (long)local_c8.w * local_c8.elemsize * (long)pMVar52 +
                               local_c8.cstep * local_c8.elemsize * (long)pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                          fVar68 = *(float *)((long)(void **)local_c8.data +
                                             (long)pMVar13 * 4 + lVar16);
                          if (fVar1 <= fVar68) {
                            fVar1 = fVar68;
                          }
                          *(float *)((long)(void **)local_c8.data + (long)pMVar13 * 4 + lVar16) =
                               fVar1;
                        }
                        pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                      }
                    }
                  }
                  uVar8 = top_blob->c * (int)top_blob->cstep;
                  pvVar23 = top_blob->data;
                  uVar26 = 0;
                  uVar49 = (ulong)uVar8;
                  if ((int)uVar8 < 1) {
                    uVar49 = uVar26;
                  }
                  for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                    *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0xff7fffff;
                  }
                  puVar32 = (uint *)0x1;
                  pMVar10 = (Mat *)local_c8.data;
                  for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar33;
                      pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                    iVar38 = 1;
                    if (iVar20 != 0) {
                      iVar38 = top_blob->h;
                    }
                    iVar67 = top_blob->w;
                    sVar27 = top_blob->elemsize;
                    pvVar23 = top_blob->data;
                    pMVar13 = pMVar10;
                    for (pMVar11 = (Mat *)0x0; pMVar11 != pMVar34;
                        pMVar11 = (Mat *)((long)&pMVar11->data + 1)) {
                      for (pMVar14 = (Mat *)0x0; pMVar12 != pMVar14;
                          pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
                        fVar1 = *(float *)((long)&pMVar13->data + (long)pMVar14 * 4);
                        fVar68 = *(float *)((long)pvVar23 + (long)pMVar14 * 4);
                        if (fVar1 <= fVar68) {
                          fVar1 = fVar68;
                        }
                        *(float *)((long)pvVar23 + (long)pMVar14 * 4) = fVar1;
                      }
                      pMVar13 = (Mat *)((long)&pMVar13->data + (long)local_c8.w * local_c8.elemsize)
                      ;
                      pvVar23 = (void *)((long)pvVar23 + (long)iVar38 * sVar27 * (long)iVar67);
                    }
                    pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.cstep * local_c8.elemsize);
                  }
                  iVar38 = 0;
                }
                piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                    puVar32 = (uint *)local_c8.data;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                bVar19 = bVar19 | bVar46;
                if ((bVar35 == 0 && (bVar19 & 1) == 0) && bVar41 == 0) {
                  if (iVar20 == 0) {
                    Mat::create(top_blob,uVar9,uVar22,sVar27,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar9,uVar22,1,1,sVar27,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar32 = (uint *)(ulong)uVar9;
                  Mat::create(&local_c8,uVar9,uVar22,uVar4,sVar27,opt->workspace_allocator);
                  iVar38 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                     (Mat *)puVar32 != (Mat *)0x0)) {
                    uVar8 = (int)local_c8.cstep * local_c8.c;
                    uVar26 = 0;
                    uVar49 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar49 = uVar26;
                    }
                    for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0xff7fffff;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar27 = bottom_blob->elemsize;
                    sVar15 = bottom_blob->cstep;
                    pMVar10 = (Mat *)0x0;
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    pMVar12 = (Mat *)(ulong)uVar22;
                    if ((int)uVar22 < 1) {
                      pMVar12 = pMVar10;
                    }
                    if ((int)uVar30 < 1) {
                      uVar30 = 0;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar10;
                    }
                    pMVar34 = (Mat *)local_c8.data;
                    for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                      pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                      for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                        pMVar52 = pMVar34;
                        for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                            pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                            fVar68 = *(float *)((long)&pMVar52->data + uVar26 * 4);
                            if (fVar1 <= fVar68) {
                              fVar1 = fVar68;
                            }
                            *(float *)((long)&pMVar52->data + uVar26 * 4) = fVar1;
                          }
                          pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                          pMVar52 = (Mat *)((long)&pMVar52->data +
                                           (long)local_c8.w * local_c8.elemsize);
                        }
                      }
                      pMVar34 = (Mat *)((long)&pMVar34->data + local_c8.cstep * local_c8.elemsize);
                    }
                    uVar8 = top_blob->c * (int)top_blob->cstep;
                    pvVar23 = top_blob->data;
                    uVar36 = 0;
                    uVar26 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar26 = uVar36;
                    }
                    for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                      *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0xff7fffff;
                    }
                    puVar32 = (uint *)(local_c8.cstep * local_c8.elemsize);
                    iVar38 = 0;
                    pMVar10 = (Mat *)local_c8.data;
                    for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                        pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                      pvVar23 = top_blob->data;
                      iVar20 = top_blob->w;
                      sVar27 = top_blob->elemsize;
                      pMVar52 = pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar1 = *(float *)((long)&pMVar52->data + uVar26 * 4);
                          fVar68 = *(float *)((long)pvVar23 + uVar26 * 4);
                          if (fVar1 <= fVar68) {
                            fVar1 = fVar68;
                          }
                          *(float *)((long)pvVar23 + uVar26 * 4) = fVar1;
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                        pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
                      }
                      pMVar10 = (Mat *)((long)&((Mat *)puVar32)->data + (long)&pMVar10->data);
                    }
                  }
                  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                      puVar32 = (uint *)local_c8.data;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  if (((bVar43 & 1) == 0 && bVar35 == 0) && reduce_c == false) {
                    if (iVar20 == 0) {
                      Mat::create(top_blob,uVar22,uVar4,sVar27,opt->blob_allocator);
                    }
                    else {
                      Mat::create(top_blob,1,uVar22,1,uVar4,sVar27,opt->blob_allocator);
                    }
                    pMVar12 = (Mat *)0x0;
                    pMVar10 = (Mat *)(ulong)uVar22;
                    if ((int)uVar22 < 1) {
                      pMVar10 = pMVar12;
                    }
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    sVar27 = bottom_blob->elemsize;
                    if ((int)uVar30 < 1) {
                      uVar30 = 0;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar12;
                    }
                    if (iVar20 == 0) {
                      sVar15 = (size_t)top_blob->w;
                    }
                    else {
                      sVar15 = top_blob->cstep;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar40 = bottom_blob->cstep;
                    pvVar47 = top_blob->data;
                    puVar32 = (uint *)(sVar15 * top_blob->elemsize);
                    pvVar31 = pvVar47;
                    for (; pMVar12 != pMVar33; pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
                      for (pMVar34 = (Mat *)0x0; pMVar10 != pMVar34;
                          pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar34 * 4) = 0xff7fffff;
                      }
                      pvVar48 = (void *)(sVar27 * sVar40 * (long)pMVar12 + (long)pvVar23);
                      for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar10;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar1 = *(float *)((long)pvVar48 + uVar26 * 4);
                            fVar68 = *(float *)((long)pvVar47 +
                                               (long)pMVar34 * 4 + (long)puVar32 * (long)pMVar12);
                            if (fVar1 <= fVar68) {
                              fVar1 = fVar68;
                            }
                            *(float *)((long)pvVar47 +
                                      (long)pMVar34 * 4 + (long)puVar32 * (long)pMVar12) = fVar1;
                          }
                          pvVar48 = (void *)((long)pvVar48 + lVar28 * 4);
                        }
                      }
                      pvVar31 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar31);
                    }
                    goto LAB_002f4234;
                  }
                  puVar32 = (uint *)(ulong)CONCAT31((int3)((uint)iVar38 >> 8),
                                                    bVar37 | reduce_d | bVar41);
                  if (((bVar37 & 1) != 0 || reduce_d != false) || bVar41 != 0) {
                    if (((bVar37 & 1) == 0 && bVar35 == 0) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,1,1,uVar4,sVar27,opt->blob_allocator);
                      }
                      pMVar10 = (Mat *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      sVar27 = bottom_blob->elemsize;
                      if ((int)uVar30 < 1) {
                        uVar30 = 0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      if (iVar20 == 0) {
                        sVar15 = (size_t)top_blob->w;
                      }
                      else {
                        sVar15 = top_blob->cstep;
                      }
                      pvVar23 = bottom_blob->data;
                      sVar40 = bottom_blob->cstep;
                      pvVar47 = top_blob->data;
                      puVar32 = (uint *)(sVar15 * top_blob->elemsize);
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          *(undefined4 *)((long)pvVar47 + uVar26 * 4) = 0xff7fffff;
                        }
                        pvVar31 = (void *)(sVar27 * sVar40 * (long)pMVar10 + (long)pvVar23);
                        for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                          for (uVar9 = 0; uVar9 != uVar22; uVar9 = uVar9 + 1) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              fVar1 = *(float *)((long)pvVar31 + uVar26 * 4);
                              fVar68 = *(float *)((long)pvVar47 + uVar26 * 4);
                              if (fVar1 <= fVar68) {
                                fVar1 = fVar68;
                              }
                              *(float *)((long)pvVar47 + uVar26 * 4) = fVar1;
                            }
                            pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                          }
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    else if (((bVar43 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar22,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,1,uVar22,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = top_blob->elemsize;
                      sVar15 = top_blob->cstep;
                      pMVar10 = (Mat *)0x0;
                      puVar32 = (uint *)0x0;
                      if (0 < (int)uVar9) {
                        puVar32 = (uint *)(ulong)uVar9;
                      }
                      sVar40 = bottom_blob->elemsize;
                      pMVar12 = (Mat *)(ulong)(uVar30 * uVar22);
                      if ((int)(uVar30 * uVar22) < 1) {
                        pMVar12 = pMVar10;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      sVar5 = bottom_blob->cstep;
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        pvVar31 = pvVar23;
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          auVar101 = ZEXT816(0xff7fffff);
                          for (pMVar52 = (Mat *)0x0; (Mat *)puVar32 != pMVar52;
                              pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                            fVar68 = *(float *)((long)pvVar31 + (long)pMVar52 * 4);
                            if (auVar101._0_4_ <= fVar68) {
                              auVar101._0_4_ = fVar68;
                            }
                          }
                          *(float *)((long)pvVar47 +
                                    (long)pMVar34 * 4 + sVar27 * sVar15 * (long)pMVar10) =
                               auVar101._0_4_;
                          pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                        }
                        pvVar23 = (void *)((long)pvVar23 + sVar40 * sVar5);
                      }
                    }
                    else if ((reduce_d == false && (bVar19 & 1) == 0) && bVar41 == 0) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar22,uVar30,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,uVar22,uVar30,1,sVar27,opt->blob_allocator);
                      }
                      uVar8 = top_blob->c * (int)top_blob->cstep;
                      pvVar23 = top_blob->data;
                      uVar26 = 0;
                      uVar49 = (ulong)uVar8;
                      if ((int)uVar8 < 1) {
                        uVar49 = uVar26;
                      }
                      for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                        *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0xff7fffff;
                      }
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      pMVar10 = (Mat *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      pMVar12 = (Mat *)(ulong)uVar22;
                      if ((int)uVar22 < 1) {
                        pMVar12 = pMVar10;
                      }
                      puVar32 = (uint *)bottom_blob->data;
                      pMVar34 = (Mat *)(ulong)uVar30;
                      if ((int)uVar30 < 1) {
                        pMVar34 = pMVar10;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        iVar38 = top_blob->w;
                        if (iVar20 == 0) {
                          sVar40 = top_blob->cstep;
                        }
                        else {
                          sVar40 = (long)top_blob->h * (long)iVar38;
                        }
                        ppvVar42 = (void **)((long)&((Mat *)puVar32)->data +
                                            sVar27 * sVar15 * (long)pMVar10);
                        pvVar23 = top_blob->data;
                        sVar5 = top_blob->elemsize;
                        for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar34;
                            pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                          pvVar47 = pvVar23;
                          for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                              pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              fVar1 = *(float *)((long)ppvVar42 + uVar26 * 4);
                              fVar68 = *(float *)((long)pvVar47 + uVar26 * 4);
                              if (fVar1 <= fVar68) {
                                fVar1 = fVar68;
                              }
                              *(float *)((long)pvVar47 + uVar26 * 4) = fVar1;
                            }
                            ppvVar42 = (void **)((long)ppvVar42 + lVar28 * 4);
                            pvVar47 = (void *)((long)pvVar47 + (long)iVar38 * sVar5);
                          }
                          pvVar23 = (void *)((long)pvVar23 + sVar40 * sVar5);
                        }
                      }
                    }
                    else if (((bVar37 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,1,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      iVar20 = top_blob->w;
                      iVar38 = top_blob->d;
                      uVar49 = top_blob->elemsize;
                      lVar16 = (long)top_blob->h * (long)iVar20;
                      uVar26 = 0;
                      if (0 < (int)uVar9) {
                        uVar26 = (ulong)uVar9;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      iVar67 = top_blob->dims;
                      pMVar10 = (Mat *)(ulong)uVar30;
                      if ((int)uVar30 < 1) {
                        pMVar10 = (Mat *)0x0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = (Mat *)0x0;
                      }
                      puVar32 = (uint *)(top_blob->cstep * uVar49);
                      for (pMVar12 = (Mat *)0x0; pMVar12 != pMVar33;
                          pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
                        iVar25 = (int)lVar16;
                        if (iVar67 != 4) {
                          iVar25 = (int)((uVar49 * lVar16 + 0xf & 0xfffffffffffffff0) / uVar49);
                        }
                        iVar25 = iVar25 * iVar38;
                        if (iVar25 < 1) {
                          iVar25 = 0;
                        }
                        for (lVar45 = 0; iVar25 != (int)lVar45; lVar45 = lVar45 + 1) {
                          *(undefined4 *)((long)pvVar47 + lVar45 * 4) = 0xff7fffff;
                        }
                        pvVar48 = (void *)(sVar27 * sVar15 * (long)pMVar12 + (long)pvVar23);
                        pvVar31 = pvVar47;
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar10;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          for (uVar8 = 0; uVar8 != uVar22; uVar8 = uVar8 + 1) {
                            for (uVar36 = 0; uVar26 != uVar36; uVar36 = uVar36 + 1) {
                              fVar1 = *(float *)((long)pvVar48 + uVar36 * 4);
                              fVar68 = *(float *)((long)pvVar31 + uVar36 * 4);
                              if (fVar1 <= fVar68) {
                                fVar1 = fVar68;
                              }
                              *(float *)((long)pvVar31 + uVar36 * 4) = fVar1;
                            }
                            pvVar48 = (void *)((long)pvVar48 + lVar28 * 4);
                          }
                          pvVar31 = (void *)((long)pvVar31 + (long)iVar20 * uVar49);
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    else if (reduce_c == false && (bVar35 == 0 && (bVar19 & 1) == 0)) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar22,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,uVar22,1,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      iVar20 = top_blob->w;
                      iVar38 = top_blob->d;
                      uVar49 = top_blob->elemsize;
                      lVar16 = (long)top_blob->h * (long)iVar20;
                      uVar26 = 0;
                      if (0 < (int)uVar9) {
                        uVar26 = (ulong)uVar9;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      iVar67 = top_blob->dims;
                      if ((int)uVar30 < 1) {
                        uVar30 = 0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = (Mat *)0x0;
                      }
                      puVar32 = (uint *)(top_blob->cstep * uVar49);
                      for (pMVar10 = (Mat *)0x0; pMVar10 != pMVar33;
                          pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        iVar25 = (int)lVar16;
                        if (iVar67 != 4) {
                          iVar25 = (int)((uVar49 * lVar16 + 0xf & 0xfffffffffffffff0) / uVar49);
                        }
                        iVar25 = iVar25 * iVar38;
                        if (iVar25 < 1) {
                          iVar25 = 0;
                        }
                        for (lVar45 = 0; iVar25 != (int)lVar45; lVar45 = lVar45 + 1) {
                          *(undefined4 *)((long)pvVar47 + lVar45 * 4) = 0xff7fffff;
                        }
                        pvVar31 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                        for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                          pvVar48 = pvVar47;
                          for (uVar36 = 0; uVar36 != uVar22; uVar36 = uVar36 + 1) {
                            for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                              fVar1 = *(float *)((long)pvVar31 + uVar39 * 4);
                              fVar68 = *(float *)((long)pvVar48 + uVar39 * 4);
                              if (fVar1 <= fVar68) {
                                fVar1 = fVar68;
                              }
                              *(float *)((long)pvVar48 + uVar39 * 4) = fVar1;
                            }
                            pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                            pvVar48 = (void *)((long)pvVar48 + (long)iVar20 * uVar49);
                          }
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    goto LAB_002f4234;
                  }
                  if (iVar20 == 0) {
                    Mat::create(top_blob,uVar9,uVar30,sVar27,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar9,1,uVar30,1,sVar27,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar32 = (uint *)(ulong)uVar9;
                  Mat::create(&local_c8,uVar9,uVar30,uVar4,sVar27,opt->workspace_allocator);
                  iVar38 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                     (Mat *)puVar32 != (Mat *)0x0)) {
                    uVar8 = (int)local_c8.cstep * local_c8.c;
                    uVar26 = 0;
                    uVar49 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar49 = uVar26;
                    }
                    for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0xff7fffff;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar27 = bottom_blob->elemsize;
                    sVar15 = bottom_blob->cstep;
                    pMVar10 = (Mat *)0x0;
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    if ((int)uVar22 < 1) {
                      uVar22 = 0;
                    }
                    pMVar12 = (Mat *)(ulong)uVar30;
                    if ((int)uVar30 < 1) {
                      pMVar12 = pMVar10;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar10;
                    }
                    pMVar34 = (Mat *)local_c8.data;
                    for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                      pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                      pMVar52 = pMVar34;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar8 = 0; uVar8 != uVar22; uVar8 = uVar8 + 1) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                            fVar68 = *(float *)((long)&pMVar52->data + uVar26 * 4);
                            if (fVar1 <= fVar68) {
                              fVar1 = fVar68;
                            }
                            *(float *)((long)&pMVar52->data + uVar26 * 4) = fVar1;
                          }
                          pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                      }
                      pMVar34 = (Mat *)((long)&pMVar34->data + local_c8.cstep * local_c8.elemsize);
                    }
                    uVar8 = top_blob->c * (int)top_blob->cstep;
                    pvVar23 = top_blob->data;
                    uVar36 = 0;
                    uVar26 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar26 = uVar36;
                    }
                    for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                      *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0xff7fffff;
                    }
                    puVar32 = (uint *)(local_c8.cstep * local_c8.elemsize);
                    iVar38 = 0;
                    pMVar10 = (Mat *)local_c8.data;
                    for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                        pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                      pvVar23 = top_blob->data;
                      iVar20 = top_blob->w;
                      sVar27 = top_blob->elemsize;
                      pMVar52 = pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar1 = *(float *)((long)&pMVar52->data + uVar26 * 4);
                          fVar68 = *(float *)((long)pvVar23 + uVar26 * 4);
                          if (fVar1 <= fVar68) {
                            fVar1 = fVar68;
                          }
                          *(float *)((long)pvVar23 + uVar26 * 4) = fVar1;
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                        pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
                      }
                      pMVar10 = (Mat *)((long)&((Mat *)puVar32)->data + (long)&pMVar10->data);
                    }
                  }
                  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                      puVar32 = (uint *)local_c8.data;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
            }
          }
        }
        else {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar30,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar30,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar30,uVar4,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar8 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0xff7fffff;
            }
            pvVar23 = bottom_blob->data;
            puVar32 = (uint *)0x0;
            pMVar10 = (Mat *)(ulong)uVar50;
            if ((int)uVar50 < 1) {
              pMVar10 = (Mat *)puVar32;
            }
            sVar27 = bottom_blob->elemsize;
            pMVar12 = (Mat *)(ulong)uVar30;
            if ((int)uVar30 < 1) {
              pMVar12 = (Mat *)puVar32;
            }
            if ((int)uVar4 < 1) {
              pMVar33 = (Mat *)puVar32;
            }
            sVar15 = bottom_blob->cstep;
            for (; (Mat *)puVar32 != pMVar33; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1))
            {
              pvVar47 = pvVar23;
              for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                auVar90 = ZEXT816(0xff7fffff);
                for (pMVar52 = (Mat *)0x0; pMVar10 != pMVar52;
                    pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  fVar68 = *(float *)((long)pvVar47 + (long)pMVar52 * 4);
                  if (auVar90._0_4_ <= fVar68) {
                    auVar90._0_4_ = fVar68;
                  }
                }
                *(float *)((long)(void **)local_c8.data +
                          (long)pMVar34 * 4 + local_c8.elemsize * local_c8.cstep * (long)puVar32) =
                     auVar90._0_4_;
                pvVar47 = (void *)((long)pvVar47 + (long)(int)uVar50 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar26 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0xff7fffff;
            }
            iVar38 = 0;
            pMVar10 = (Mat *)local_c8.data;
            for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              puVar32 = (uint *)top_blob->data;
              for (pMVar52 = (Mat *)0x0; pMVar12 != pMVar52;
                  pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                fVar1 = *(float *)((long)&pMVar10->data + (long)pMVar52 * 4);
                fVar68 = *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4);
                if (fVar1 <= fVar68) {
                  fVar1 = fVar68;
                }
                *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4) = fVar1;
              }
              pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (iVar20 == 0) {
          Mat::create(top_blob,1,sVar27,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,1,sVar27,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar32 = (uint *)pMVar33;
        Mat::create(&local_c8,uVar4,sVar27,opt->workspace_allocator);
        iVar38 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          pvVar23 = bottom_blob->data;
          sVar27 = bottom_blob->elemsize;
          sVar15 = bottom_blob->cstep;
          puVar32 = (uint *)0x0;
          pMVar10 = (Mat *)(ulong)uVar51;
          if ((int)uVar51 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          if ((int)uVar4 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar33; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = -3.4028235e+38;
            for (pMVar12 = (Mat *)0x0; pMVar10 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar1 = *(float *)((long)pvVar23 + (long)pMVar12 * 4);
              if (fVar68 <= fVar1) {
                fVar68 = fVar1;
              }
            }
            *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
          }
          fVar68 = -3.4028235e+38;
          for (pMVar10 = (Mat *)0x0; pMVar33 != pMVar10; pMVar10 = (Mat *)((long)&pMVar10->data + 1)
              ) {
            fVar1 = *(float *)((long)(void **)local_c8.data + (long)pMVar10 * 4);
            if (fVar68 <= fVar1) {
              fVar68 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar68;
          iVar38 = 0;
        }
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
            puVar32 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    break;
  case 5:
    fVar54 = this->coeff;
    if (3 < uVar8 - 1) goto LAB_002f4234;
    iVar20 = this->keepdims;
    sVar27 = bottom_blob->elemsize;
    switch(uVar8) {
    case 1:
      uVar8 = bottom_blob->w;
      puVar32 = (uint *)0x1;
      Mat::create(top_blob,1,sVar27,opt->blob_allocator);
      uVar26 = 0;
      uVar49 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar49 = uVar26;
      }
      fVar68 = 3.4028235e+38;
      for (; uVar49 != uVar26; uVar26 = uVar26 + 1) {
        fVar1 = *(float *)((long)bottom_blob->data + uVar26 * 4);
        if (fVar1 <= fVar68) {
          fVar68 = fVar1;
        }
      }
      goto LAB_002ea14e;
    case 2:
      uVar8 = bottom_blob->w;
      pMVar33 = (Mat *)(ulong)uVar8;
      uVar9 = bottom_blob->h;
      auVar65._8_4_ = 0xffffffff;
      auVar65._0_8_ = 0xffffffffffffffff;
      auVar65._12_4_ = 0xffffffff;
      auVar84._0_8_ = SUB168(auVar69 ^ auVar65,0) << 0x3f;
      auVar84._8_8_ = SUB168(auVar69 ^ auVar65,8) << 0x3f;
      iVar38 = movmskpd(uVar21,auVar84);
      if (iVar38 != 0) {
        if (((bVar19 | (byte)iVar38 >> 1) & 1) == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar9,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          iVar20 = bottom_blob->w;
          sVar27 = bottom_blob->elemsize;
          pvVar47 = top_blob->data;
          puVar32 = (uint *)0x0;
          if ((int)uVar8 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          pMVar10 = (Mat *)(ulong)uVar9;
          if ((int)uVar9 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = 3.4028235e+38;
            for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar1 = *(float *)((long)pvVar23 + (long)pMVar12 * 4);
              if (fVar1 <= fVar68) {
                fVar68 = fVar1;
              }
            }
            *(float *)((long)pvVar47 + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
          }
        }
        else if (((bVar46 | (byte)iVar38) & 1) == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar8,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar8,1,sVar27,opt->blob_allocator);
          }
          uVar22 = top_blob->c * (int)top_blob->cstep;
          pvVar23 = top_blob->data;
          uVar26 = 0;
          uVar49 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar49 = uVar26;
          }
          for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
            *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x7f7fffff;
          }
          iVar20 = bottom_blob->w;
          sVar27 = bottom_blob->elemsize;
          pMVar10 = (Mat *)0x0;
          if ((int)uVar8 < 1) {
            pMVar33 = pMVar10;
          }
          puVar32 = (uint *)bottom_blob->data;
          pMVar12 = (Mat *)(ulong)uVar9;
          if ((int)uVar9 < 1) {
            pMVar12 = pMVar10;
          }
          for (; pMVar10 != pMVar12; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
            for (pMVar34 = (Mat *)0x0; pMVar33 != pMVar34;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              fVar1 = *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar34 * 4);
              fVar68 = *(float *)((long)pvVar23 + (long)pMVar34 * 4);
              if (fVar68 <= fVar1) {
                fVar1 = fVar68;
              }
              *(float *)((long)pvVar23 + (long)pMVar34 * 4) = fVar1;
            }
            puVar32 = (uint *)((long)&((Mat *)puVar32)->data + (long)iVar20 * sVar27);
          }
        }
        goto LAB_002f4234;
      }
      if (iVar20 == 0) {
        Mat::create(top_blob,1,sVar27,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,sVar27,opt->blob_allocator);
      }
      local_c8.cstep = 0;
      local_c8.data = (Mat *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize = 0;
      local_c8.elempack = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      puVar32 = (uint *)(ulong)uVar9;
      Mat::create(&local_c8,uVar9,sVar27,opt->workspace_allocator);
      iVar38 = -100;
      if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
        pvVar23 = bottom_blob->data;
        iVar20 = bottom_blob->w;
        sVar27 = bottom_blob->elemsize;
        puVar32 = (uint *)0x0;
        if ((int)uVar8 < 1) {
          pMVar33 = (Mat *)puVar32;
        }
        pMVar10 = (Mat *)(ulong)uVar9;
        if ((int)uVar9 < 1) {
          pMVar10 = (Mat *)puVar32;
        }
        for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
          fVar68 = 3.4028235e+38;
          for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12; pMVar12 = (Mat *)((long)&pMVar12->data + 1)
              ) {
            fVar1 = *(float *)((long)pvVar23 + (long)pMVar12 * 4);
            if (fVar1 <= fVar68) {
              fVar68 = fVar1;
            }
          }
          *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
          pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
        }
        fVar68 = 3.4028235e+38;
        for (pMVar33 = (Mat *)0x0; pMVar10 != pMVar33; pMVar33 = (Mat *)((long)&pMVar33->data + 1))
        {
          fVar1 = *(float *)((long)(void **)local_c8.data + (long)pMVar33 * 4);
          if (fVar1 <= fVar68) {
            fVar68 = fVar1;
          }
        }
        *(float *)top_blob->data = fVar68;
        iVar38 = 0;
      }
      piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
          puVar32 = (uint *)local_c8.data;
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
      break;
    case 3:
      uVar8 = bottom_blob->w;
      lVar28 = (long)(int)uVar8;
      uVar9 = bottom_blob->h;
      uVar22 = bottom_blob->c;
      uVar30 = uVar9 * uVar8;
      auVar61._8_4_ = 0xffffffff;
      auVar61._0_8_ = 0xffffffffffffffff;
      auVar61._12_4_ = 0xffffffff;
      auVar79._0_8_ = SUB168(auVar69 ^ auVar61,0) << 0x3f;
      auVar79._8_8_ = SUB168(auVar69 ^ auVar61,8) << 0x3f;
      iVar38 = movmskpd(uVar24,auVar79);
      bVar35 = reduce_c ^ 1;
      if ((iVar38 != 0) || (bVar35 != 0)) {
        if (iVar38 == 0 && reduce_c == false) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar22,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar22,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          sVar27 = top_blob->elemsize;
          sVar15 = top_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar49 = uVar26;
          }
          uVar36 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar36 = uVar26;
          }
          pvVar47 = top_blob->data;
          puVar32 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
          for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
            fVar68 = 3.4028235e+38;
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar1 = *(float *)((long)pvVar23 + uVar39 * 4);
              if (fVar1 <= fVar68) {
                fVar68 = fVar1;
              }
            }
            lVar28 = sVar27 * sVar15 * uVar26;
            if (iVar20 == 0) {
              lVar28 = uVar26 * 4;
            }
            *(float *)((long)pvVar47 + lVar28) = fVar68;
            pvVar23 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar23);
          }
          goto LAB_002f4234;
        }
        bVar41 = (byte)iVar38 >> 1 | bVar19;
        if ((bVar41 & 1) == 0 && bVar35 == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar9,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar9,uVar22,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar30 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar30;
            if ((int)uVar30 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x7f7fffff;
            }
            pvVar23 = bottom_blob->data;
            uVar49 = 0;
            puVar32 = (uint *)0x0;
            if (0 < (int)uVar8) {
              puVar32 = (uint *)(ulong)uVar8;
            }
            sVar27 = bottom_blob->elemsize;
            uVar26 = (ulong)uVar9;
            if ((int)uVar9 < 1) {
              uVar26 = uVar49;
            }
            uVar36 = (ulong)uVar22;
            if ((int)uVar22 < 1) {
              uVar36 = uVar49;
            }
            sVar15 = bottom_blob->cstep;
            for (; uVar49 != uVar36; uVar49 = uVar49 + 1) {
              pvVar47 = pvVar23;
              for (uVar39 = 0; uVar39 != uVar26; uVar39 = uVar39 + 1) {
                auVar91 = ZEXT816(0x7f7fffff);
                for (pMVar33 = (Mat *)0x0; (Mat *)puVar32 != pMVar33;
                    pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
                  fVar68 = *(float *)((long)pvVar47 + (long)pMVar33 * 4);
                  if (fVar68 <= auVar91._0_4_) {
                    auVar91._0_4_ = fVar68;
                  }
                }
                *(float *)((long)(void **)local_c8.data +
                          uVar39 * 4 + local_c8.elemsize * local_c8.cstep * uVar49) = auVar91._0_4_;
                pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar39 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar39;
            }
            for (; (int)uVar49 != (int)uVar39; uVar39 = uVar39 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar39 * 4) = 0x7f7fffff;
            }
            iVar38 = 0;
            pMVar33 = (Mat *)local_c8.data;
            for (uVar49 = 0; uVar49 != uVar36; uVar49 = uVar49 + 1) {
              puVar32 = (uint *)top_blob->data;
              for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                fVar1 = *(float *)((long)&pMVar33->data + uVar39 * 4);
                fVar68 = *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4);
                if (fVar68 <= fVar1) {
                  fVar1 = fVar68;
                }
                *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4) = fVar1;
              }
              pMVar33 = (Mat *)((long)&pMVar33->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        else {
          bVar43 = (byte)iVar38 | bVar46;
          if ((bVar43 & 1) != 0 || bVar35 != 0) {
            if ((bVar41 & 1) == 0 && reduce_c == false) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar9,uVar22,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar9,uVar22,sVar27,opt->blob_allocator);
              }
              uVar49 = 0;
              uVar26 = 0;
              if (0 < (int)uVar8) {
                uVar26 = (ulong)uVar8;
              }
              uVar36 = (ulong)uVar9;
              if ((int)uVar9 < 1) {
                uVar36 = uVar49;
              }
              uVar39 = (ulong)uVar22;
              if ((int)uVar22 < 1) {
                uVar39 = uVar49;
              }
              sVar27 = bottom_blob->elemsize;
              if (iVar20 == 0) {
                sVar15 = (size_t)top_blob->w;
              }
              else {
                sVar15 = top_blob->cstep;
              }
              pvVar23 = bottom_blob->data;
              pvVar47 = top_blob->data;
              puVar32 = (uint *)(sVar15 * top_blob->elemsize);
              sVar15 = bottom_blob->cstep;
              for (; uVar49 != uVar39; uVar49 = uVar49 + 1) {
                pvVar31 = pvVar23;
                for (uVar29 = 0; uVar29 != uVar36; uVar29 = uVar29 + 1) {
                  auVar96 = ZEXT816(0x7f7fffff);
                  for (uVar44 = 0; uVar26 != uVar44; uVar44 = uVar44 + 1) {
                    fVar68 = *(float *)((long)pvVar31 + uVar44 * 4);
                    if (fVar68 <= auVar96._0_4_) {
                      auVar96._0_4_ = fVar68;
                    }
                  }
                  *(float *)((long)pvVar47 + uVar29 * 4 + (long)puVar32 * uVar49) = auVar96._0_4_;
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              }
            }
            else if (((bVar19 | bVar46) & 1) == 0 && bVar35 == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar8,uVar9,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar8,uVar9,1,sVar27,opt->blob_allocator);
              }
              iVar20 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              lVar28 = 0;
              if (iVar20 < 1) {
                iVar20 = 0;
              }
              for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
                *(undefined4 *)((long)pvVar23 + lVar28 * 4) = 0x7f7fffff;
              }
              sVar27 = bottom_blob->elemsize;
              sVar15 = bottom_blob->cstep;
              uVar26 = 0;
              uVar49 = (ulong)uVar30;
              if ((int)uVar30 < 1) {
                uVar49 = uVar26;
              }
              pvVar23 = bottom_blob->data;
              uVar36 = (ulong)uVar22;
              puVar32 = (uint *)bottom_blob;
              if ((int)uVar22 < 1) {
                uVar36 = uVar26;
              }
              for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
                puVar32 = (uint *)top_blob->data;
                for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
                  fVar1 = *(float *)((long)pvVar23 + uVar39 * 4);
                  fVar68 = *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4);
                  if (fVar68 <= fVar1) {
                    fVar1 = fVar68;
                  }
                  *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4) = fVar1;
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              }
            }
            else if (reduce_c == false && (bVar43 & 1) == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar8,uVar22,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar8,1,uVar22,sVar27,opt->blob_allocator);
              }
              uVar30 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              uVar26 = 0;
              uVar49 = (ulong)uVar30;
              if ((int)uVar30 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x7f7fffff;
              }
              uVar49 = 0;
              uVar26 = 0;
              if (0 < (int)uVar8) {
                uVar26 = (ulong)uVar8;
              }
              if ((int)uVar9 < 1) {
                uVar9 = 0;
              }
              uVar36 = (ulong)uVar22;
              if ((int)uVar22 < 1) {
                uVar36 = uVar49;
              }
              sVar27 = bottom_blob->elemsize;
              if (iVar20 == 0) {
                sVar15 = (size_t)top_blob->w;
              }
              else {
                sVar15 = top_blob->cstep;
              }
              pvVar23 = bottom_blob->data;
              puVar32 = (uint *)(sVar15 * top_blob->elemsize);
              pvVar47 = top_blob->data;
              sVar15 = bottom_blob->cstep;
              for (; uVar49 != uVar36; uVar49 = uVar49 + 1) {
                pvVar31 = pvVar23;
                for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
                  for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                    fVar1 = *(float *)((long)pvVar31 + uVar39 * 4);
                    fVar68 = *(float *)((long)pvVar47 + uVar39 * 4);
                    if (fVar68 <= fVar1) {
                      fVar1 = fVar68;
                    }
                    *(float *)((long)pvVar47 + uVar39 * 4) = fVar1;
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
                pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
              }
            }
            goto LAB_002f4234;
          }
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar8,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar8,1,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)(ulong)uVar8;
          Mat::create(&local_c8,uVar8,1,uVar22,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar30 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar30;
            if ((int)uVar30 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x7f7fffff;
            }
            pvVar23 = bottom_blob->data;
            sVar27 = bottom_blob->elemsize;
            pMVar33 = (Mat *)0x0;
            uVar49 = 0;
            if (0 < (int)uVar8) {
              uVar49 = (ulong)uVar8;
            }
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            pMVar10 = (Mat *)(ulong)uVar22;
            if ((int)uVar22 < 1) {
              pMVar10 = pMVar33;
            }
            sVar15 = bottom_blob->cstep;
            pMVar12 = (Mat *)local_c8.data;
            for (; pMVar33 != pMVar10; pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
              pvVar47 = pvVar23;
              for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
                for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                  fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                  fVar68 = *(float *)((long)&pMVar12->data + uVar26 * 4);
                  if (fVar68 <= fVar1) {
                    fVar1 = fVar68;
                  }
                  *(float *)((long)&pMVar12->data + uVar26 * 4) = fVar1;
                }
                pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              pMVar12 = (Mat *)((long)&pMVar12->data + local_c8.elemsize * local_c8.cstep);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar36 = 0;
            uVar26 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar26 = uVar36;
            }
            for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0x7f7fffff;
            }
            iVar38 = 0;
            pMVar33 = (Mat *)local_c8.data;
            for (puVar32 = (uint *)0x0; (Mat *)puVar32 != pMVar10;
                puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
              pvVar23 = top_blob->data;
              for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                fVar1 = *(float *)((long)&pMVar33->data + uVar26 * 4);
                fVar68 = *(float *)((long)pvVar23 + uVar26 * 4);
                if (fVar68 <= fVar1) {
                  fVar1 = fVar68;
                }
                *(float *)((long)pvVar23 + uVar26 * 4) = fVar1;
              }
              pMVar33 = (Mat *)((long)&pMVar33->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (iVar20 == 0) {
          Mat::create(top_blob,1,sVar27,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar27,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar32 = (uint *)(ulong)uVar22;
        Mat::create(&local_c8,uVar22,sVar27,opt->workspace_allocator);
        iVar38 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          pvVar23 = bottom_blob->data;
          sVar27 = bottom_blob->elemsize;
          sVar15 = bottom_blob->cstep;
          puVar32 = (uint *)0x0;
          pMVar33 = (Mat *)(ulong)uVar30;
          if ((int)uVar30 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          pMVar10 = (Mat *)(ulong)uVar22;
          if ((int)uVar22 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = 3.4028235e+38;
            for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar1 = *(float *)((long)pvVar23 + (long)pMVar12 * 4);
              if (fVar1 <= fVar68) {
                fVar68 = fVar1;
              }
            }
            *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
          }
          fVar68 = 3.4028235e+38;
          for (pMVar33 = (Mat *)0x0; pMVar10 != pMVar33; pMVar33 = (Mat *)((long)&pMVar33->data + 1)
              ) {
            fVar1 = *(float *)((long)(void **)local_c8.data + (long)pMVar33 * 4);
            if (fVar1 <= fVar68) {
              fVar68 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar68;
          iVar38 = 0;
        }
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
            puVar32 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      break;
    case 4:
      uVar9 = bottom_blob->w;
      lVar28 = (long)(int)uVar9;
      uVar22 = bottom_blob->h;
      uVar30 = bottom_blob->d;
      uVar4 = bottom_blob->c;
      pMVar33 = (Mat *)(ulong)uVar4;
      uVar50 = uVar22 * uVar9;
      uVar51 = uVar50 * uVar30;
      auVar63._8_4_ = 0xffffffff;
      auVar63._0_8_ = 0xffffffffffffffff;
      auVar63._12_4_ = 0xffffffff;
      auVar82._0_8_ = SUB168(auVar69 ^ auVar63,0) << 0x3f;
      auVar82._8_8_ = SUB168(auVar69 ^ auVar63,8) << 0x3f;
      iVar38 = movmskpd((&switchD_002e9f73::switchdataD_004f4c9c)[uVar8 - 1] + 0x4f4c9c,auVar82);
      bVar53 = iVar38 != 0;
      bVar35 = reduce_d ^ 1;
      bVar41 = reduce_c ^ 1;
      if ((bVar53 || bVar35 != 0) || (bVar41 != 0)) {
        if ((!bVar53 && bVar35 == 0) && reduce_c == false) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar4,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,1,uVar4,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          sVar27 = top_blob->elemsize;
          sVar15 = top_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar49 = uVar26;
          }
          uVar36 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar36 = uVar26;
          }
          pvVar47 = top_blob->data;
          puVar32 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
          for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
            fVar68 = 3.4028235e+38;
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar1 = *(float *)((long)pvVar23 + uVar39 * 4);
              if (fVar1 <= fVar68) {
                fVar68 = fVar1;
              }
            }
            lVar28 = sVar27 * sVar15 * uVar26;
            if (iVar20 == 0) {
              lVar28 = uVar26 * 4;
            }
            *(float *)((long)pvVar47 + lVar28) = fVar68;
            pvVar23 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar23);
          }
          goto LAB_002f4234;
        }
        if ((bVar53 || reduce_d != false) || bVar41 != 0) {
          bVar43 = (byte)iVar38 >> 1 | bVar19;
          if (((bVar43 & 1) == 0 && bVar35 == 0) && bVar41 == 0) {
            if (iVar20 == 0) {
              Mat::create(top_blob,uVar22,sVar27,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar22,1,1,sVar27,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar32 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar22,uVar4,sVar27,opt->workspace_allocator);
            iVar38 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0)
               ) {
              uVar8 = (int)local_c8.cstep * local_c8.c;
              uVar26 = 0;
              uVar49 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x7f7fffff;
              }
              sVar27 = bottom_blob->elemsize;
              sVar15 = bottom_blob->cstep;
              pMVar10 = (Mat *)0x0;
              puVar32 = (uint *)0x0;
              if (0 < (int)uVar9) {
                puVar32 = (uint *)(ulong)uVar9;
              }
              pvVar23 = bottom_blob->data;
              pMVar12 = (Mat *)(ulong)uVar22;
              if ((int)uVar22 < 1) {
                pMVar12 = pMVar10;
              }
              if ((int)uVar30 < 1) {
                uVar30 = 0;
              }
              if ((int)uVar4 < 1) {
                pMVar33 = pMVar10;
              }
              for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                lVar16 = local_c8.elemsize * local_c8.cstep * (long)pMVar10;
                for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                  for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                      pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                    for (pMVar52 = (Mat *)0x0; (Mat *)puVar32 != pMVar52;
                        pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                      fVar1 = *(float *)((long)pvVar47 + (long)pMVar52 * 4);
                      fVar68 = *(float *)((long)(void **)local_c8.data + (long)pMVar34 * 4 + lVar16)
                      ;
                      if (fVar68 <= fVar1) {
                        fVar1 = fVar68;
                      }
                      *(float *)((long)(void **)local_c8.data + (long)pMVar34 * 4 + lVar16) = fVar1;
                    }
                    pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                  }
                }
              }
              uVar8 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              uVar26 = 0;
              uVar49 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x7f7fffff;
              }
              pMVar10 = (Mat *)local_c8.data;
              for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                puVar32 = (uint *)top_blob->data;
                for (pMVar52 = (Mat *)0x0; pMVar12 != pMVar52;
                    pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  fVar1 = *(float *)((long)&pMVar10->data + (long)pMVar52 * 4);
                  fVar68 = *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4);
                  if (fVar68 <= fVar1) {
                    fVar1 = fVar68;
                  }
                  *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4) = fVar1;
                }
                pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
              }
              iVar38 = 0;
            }
            piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                puVar32 = (uint *)local_c8.data;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            bVar37 = (byte)iVar38 | bVar46;
            if (((bVar37 & 1) == 0 && bVar35 == 0) && bVar41 == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar9,1,1,1,sVar27,opt->blob_allocator);
              }
              local_c8.cstep = 0;
              local_c8.data = (Mat *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.elemsize = 0;
              local_c8.elempack = 0;
              local_c8.allocator = (Allocator *)0x0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.d = 0;
              local_c8.c = 0;
              puVar32 = (uint *)(ulong)uVar9;
              Mat::create(&local_c8,uVar9,1,uVar4,sVar27,opt->workspace_allocator);
              iVar38 = -100;
              if (((Mat *)local_c8.data != (Mat *)0x0) &&
                 (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                 (Mat *)puVar32 != (Mat *)0x0)) {
                uVar8 = (int)local_c8.cstep * local_c8.c;
                uVar26 = 0;
                uVar49 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar49 = uVar26;
                }
                for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                  *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x7f7fffff;
                }
                sVar27 = bottom_blob->elemsize;
                sVar15 = bottom_blob->cstep;
                pMVar10 = (Mat *)0x0;
                uVar49 = 0;
                if (0 < (int)uVar9) {
                  uVar49 = (ulong)uVar9;
                }
                if ((int)uVar22 < 1) {
                  uVar22 = 0;
                }
                pvVar23 = bottom_blob->data;
                if ((int)uVar30 < 1) {
                  uVar30 = 0;
                }
                if ((int)uVar4 < 1) {
                  pMVar33 = pMVar10;
                }
                pMVar12 = (Mat *)local_c8.data;
                for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                  pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                  for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                    for (uVar9 = 0; uVar9 != uVar22; uVar9 = uVar9 + 1) {
                      for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                        fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                        fVar68 = *(float *)((long)&pMVar12->data + uVar26 * 4);
                        if (fVar68 <= fVar1) {
                          fVar1 = fVar68;
                        }
                        *(float *)((long)&pMVar12->data + uVar26 * 4) = fVar1;
                      }
                      pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                    }
                  }
                  pMVar12 = (Mat *)((long)&pMVar12->data + local_c8.elemsize * local_c8.cstep);
                }
                uVar8 = top_blob->c * (int)top_blob->cstep;
                pvVar23 = top_blob->data;
                uVar36 = 0;
                uVar26 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar26 = uVar36;
                }
                for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                  *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0x7f7fffff;
                }
                iVar38 = 0;
                pMVar10 = (Mat *)local_c8.data;
                for (puVar32 = (uint *)0x0; (Mat *)puVar32 != pMVar33;
                    puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
                  pvVar23 = top_blob->data;
                  for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                    fVar1 = *(float *)((long)&pMVar10->data + uVar26 * 4);
                    fVar68 = *(float *)((long)pvVar23 + uVar26 * 4);
                    if (fVar68 <= fVar1) {
                      fVar1 = fVar68;
                    }
                    *(float *)((long)pvVar23 + uVar26 * 4) = fVar1;
                  }
                  pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
                }
              }
              piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                  puVar32 = (uint *)local_c8.data;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            else {
              if ((!bVar53 && reduce_d == false) && reduce_c == false) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar30,uVar4,sVar27,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,1,uVar30,uVar4,sVar27,opt->blob_allocator);
                }
                uVar49 = 0;
                uVar26 = 0;
                if (0 < (int)uVar50) {
                  uVar26 = (ulong)uVar50;
                }
                uVar36 = (ulong)uVar30;
                if ((int)uVar30 < 1) {
                  uVar36 = uVar49;
                }
                uVar39 = (ulong)uVar4;
                if ((int)uVar4 < 1) {
                  uVar39 = uVar49;
                }
                sVar27 = bottom_blob->elemsize;
                if (iVar20 == 0) {
                  sVar15 = (size_t)top_blob->w;
                }
                else {
                  sVar15 = top_blob->cstep;
                }
                pvVar23 = bottom_blob->data;
                pvVar47 = top_blob->data;
                sVar40 = top_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                puVar32 = (uint *)((long)(int)uVar50 * 4);
                for (; uVar49 != uVar39; uVar49 = uVar49 + 1) {
                  pvVar31 = pvVar23;
                  for (uVar29 = 0; uVar29 != uVar36; uVar29 = uVar29 + 1) {
                    auVar99 = ZEXT816(0x7f7fffff);
                    for (uVar44 = 0; uVar26 != uVar44; uVar44 = uVar44 + 1) {
                      fVar68 = *(float *)((long)pvVar31 + uVar44 * 4);
                      if (fVar68 <= auVar99._0_4_) {
                        auVar99._0_4_ = fVar68;
                      }
                    }
                    *(float *)((long)pvVar47 + uVar29 * 4 + sVar15 * sVar40 * uVar49) =
                         auVar99._0_4_;
                    pvVar31 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar31);
                  }
                  pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar5);
                }
                goto LAB_002f4234;
              }
              if (((bVar43 & 1) == 0 && reduce_d == false) && bVar41 == 0) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar22,uVar30,sVar27,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,uVar22,uVar30,1,sVar27,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar32 = (uint *)(ulong)uVar22;
                Mat::create(&local_c8,uVar22,uVar30,uVar4,sVar27,opt->workspace_allocator);
                iVar38 = -100;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                   (Mat *)puVar32 != (Mat *)0x0)) {
                  uVar8 = (int)local_c8.cstep * local_c8.c;
                  uVar26 = 0;
                  uVar49 = (ulong)uVar8;
                  if ((int)uVar8 < 1) {
                    uVar49 = uVar26;
                  }
                  for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x7f7fffff;
                  }
                  sVar27 = bottom_blob->elemsize;
                  sVar15 = bottom_blob->cstep;
                  pMVar10 = (Mat *)0x0;
                  uVar49 = 0;
                  if (0 < (int)uVar9) {
                    uVar49 = (ulong)uVar9;
                  }
                  pvVar23 = bottom_blob->data;
                  pMVar12 = (Mat *)(ulong)uVar22;
                  if ((int)uVar22 < 1) {
                    pMVar12 = pMVar10;
                  }
                  pMVar34 = (Mat *)(ulong)uVar30;
                  if ((int)uVar30 < 1) {
                    pMVar34 = pMVar10;
                  }
                  if ((int)uVar4 < 1) {
                    pMVar33 = pMVar10;
                  }
                  for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                    pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                    for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar34;
                        pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                      lVar16 = (long)local_c8.w * local_c8.elemsize * (long)pMVar52 +
                               local_c8.cstep * local_c8.elemsize * (long)pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                          fVar68 = *(float *)((long)(void **)local_c8.data +
                                             (long)pMVar13 * 4 + lVar16);
                          if (fVar68 <= fVar1) {
                            fVar1 = fVar68;
                          }
                          *(float *)((long)(void **)local_c8.data + (long)pMVar13 * 4 + lVar16) =
                               fVar1;
                        }
                        pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                      }
                    }
                  }
                  uVar8 = top_blob->c * (int)top_blob->cstep;
                  pvVar23 = top_blob->data;
                  uVar26 = 0;
                  uVar49 = (ulong)uVar8;
                  if ((int)uVar8 < 1) {
                    uVar49 = uVar26;
                  }
                  for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                    *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x7f7fffff;
                  }
                  puVar32 = (uint *)0x1;
                  pMVar10 = (Mat *)local_c8.data;
                  for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar33;
                      pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                    iVar38 = 1;
                    if (iVar20 != 0) {
                      iVar38 = top_blob->h;
                    }
                    iVar67 = top_blob->w;
                    sVar27 = top_blob->elemsize;
                    pvVar23 = top_blob->data;
                    pMVar13 = pMVar10;
                    for (pMVar11 = (Mat *)0x0; pMVar11 != pMVar34;
                        pMVar11 = (Mat *)((long)&pMVar11->data + 1)) {
                      for (pMVar14 = (Mat *)0x0; pMVar12 != pMVar14;
                          pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
                        fVar1 = *(float *)((long)&pMVar13->data + (long)pMVar14 * 4);
                        fVar68 = *(float *)((long)pvVar23 + (long)pMVar14 * 4);
                        if (fVar68 <= fVar1) {
                          fVar1 = fVar68;
                        }
                        *(float *)((long)pvVar23 + (long)pMVar14 * 4) = fVar1;
                      }
                      pMVar13 = (Mat *)((long)&pMVar13->data + (long)local_c8.w * local_c8.elemsize)
                      ;
                      pvVar23 = (void *)((long)pvVar23 + (long)iVar38 * sVar27 * (long)iVar67);
                    }
                    pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.cstep * local_c8.elemsize);
                  }
                  iVar38 = 0;
                }
                piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                    puVar32 = (uint *)local_c8.data;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                bVar19 = bVar19 | bVar46;
                if ((bVar35 == 0 && (bVar19 & 1) == 0) && bVar41 == 0) {
                  if (iVar20 == 0) {
                    Mat::create(top_blob,uVar9,uVar22,sVar27,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar9,uVar22,1,1,sVar27,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar32 = (uint *)(ulong)uVar9;
                  Mat::create(&local_c8,uVar9,uVar22,uVar4,sVar27,opt->workspace_allocator);
                  iVar38 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                     (Mat *)puVar32 != (Mat *)0x0)) {
                    uVar8 = (int)local_c8.cstep * local_c8.c;
                    uVar26 = 0;
                    uVar49 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar49 = uVar26;
                    }
                    for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x7f7fffff;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar27 = bottom_blob->elemsize;
                    sVar15 = bottom_blob->cstep;
                    pMVar10 = (Mat *)0x0;
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    pMVar12 = (Mat *)(ulong)uVar22;
                    if ((int)uVar22 < 1) {
                      pMVar12 = pMVar10;
                    }
                    if ((int)uVar30 < 1) {
                      uVar30 = 0;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar10;
                    }
                    pMVar34 = (Mat *)local_c8.data;
                    for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                      pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                      for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                        pMVar52 = pMVar34;
                        for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                            pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                            fVar68 = *(float *)((long)&pMVar52->data + uVar26 * 4);
                            if (fVar68 <= fVar1) {
                              fVar1 = fVar68;
                            }
                            *(float *)((long)&pMVar52->data + uVar26 * 4) = fVar1;
                          }
                          pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                          pMVar52 = (Mat *)((long)&pMVar52->data +
                                           (long)local_c8.w * local_c8.elemsize);
                        }
                      }
                      pMVar34 = (Mat *)((long)&pMVar34->data + local_c8.cstep * local_c8.elemsize);
                    }
                    uVar8 = top_blob->c * (int)top_blob->cstep;
                    pvVar23 = top_blob->data;
                    uVar36 = 0;
                    uVar26 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar26 = uVar36;
                    }
                    for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                      *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0x7f7fffff;
                    }
                    puVar32 = (uint *)(local_c8.cstep * local_c8.elemsize);
                    iVar38 = 0;
                    pMVar10 = (Mat *)local_c8.data;
                    for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                        pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                      pvVar23 = top_blob->data;
                      iVar20 = top_blob->w;
                      sVar27 = top_blob->elemsize;
                      pMVar52 = pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar1 = *(float *)((long)&pMVar52->data + uVar26 * 4);
                          fVar68 = *(float *)((long)pvVar23 + uVar26 * 4);
                          if (fVar68 <= fVar1) {
                            fVar1 = fVar68;
                          }
                          *(float *)((long)pvVar23 + uVar26 * 4) = fVar1;
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                        pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
                      }
                      pMVar10 = (Mat *)((long)&((Mat *)puVar32)->data + (long)&pMVar10->data);
                    }
                  }
                  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                      puVar32 = (uint *)local_c8.data;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  if (((bVar43 & 1) == 0 && bVar35 == 0) && reduce_c == false) {
                    if (iVar20 == 0) {
                      Mat::create(top_blob,uVar22,uVar4,sVar27,opt->blob_allocator);
                    }
                    else {
                      Mat::create(top_blob,1,uVar22,1,uVar4,sVar27,opt->blob_allocator);
                    }
                    pMVar12 = (Mat *)0x0;
                    pMVar10 = (Mat *)(ulong)uVar22;
                    if ((int)uVar22 < 1) {
                      pMVar10 = pMVar12;
                    }
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    sVar27 = bottom_blob->elemsize;
                    if ((int)uVar30 < 1) {
                      uVar30 = 0;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar12;
                    }
                    if (iVar20 == 0) {
                      sVar15 = (size_t)top_blob->w;
                    }
                    else {
                      sVar15 = top_blob->cstep;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar40 = bottom_blob->cstep;
                    pvVar47 = top_blob->data;
                    puVar32 = (uint *)(sVar15 * top_blob->elemsize);
                    pvVar31 = pvVar47;
                    for (; pMVar12 != pMVar33; pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
                      for (pMVar34 = (Mat *)0x0; pMVar10 != pMVar34;
                          pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar34 * 4) = 0x7f7fffff;
                      }
                      pvVar48 = (void *)(sVar27 * sVar40 * (long)pMVar12 + (long)pvVar23);
                      for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar10;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar1 = *(float *)((long)pvVar48 + uVar26 * 4);
                            fVar68 = *(float *)((long)pvVar47 +
                                               (long)pMVar34 * 4 + (long)puVar32 * (long)pMVar12);
                            if (fVar68 <= fVar1) {
                              fVar1 = fVar68;
                            }
                            *(float *)((long)pvVar47 +
                                      (long)pMVar34 * 4 + (long)puVar32 * (long)pMVar12) = fVar1;
                          }
                          pvVar48 = (void *)((long)pvVar48 + lVar28 * 4);
                        }
                      }
                      pvVar31 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar31);
                    }
                    goto LAB_002f4234;
                  }
                  puVar32 = (uint *)(ulong)CONCAT31((int3)((uint)iVar38 >> 8),
                                                    bVar37 | reduce_d | bVar41);
                  if (((bVar37 & 1) != 0 || reduce_d != false) || bVar41 != 0) {
                    if (((bVar37 & 1) == 0 && bVar35 == 0) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,1,1,uVar4,sVar27,opt->blob_allocator);
                      }
                      pMVar10 = (Mat *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      sVar27 = bottom_blob->elemsize;
                      if ((int)uVar30 < 1) {
                        uVar30 = 0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      if (iVar20 == 0) {
                        sVar15 = (size_t)top_blob->w;
                      }
                      else {
                        sVar15 = top_blob->cstep;
                      }
                      pvVar23 = bottom_blob->data;
                      sVar40 = bottom_blob->cstep;
                      pvVar47 = top_blob->data;
                      puVar32 = (uint *)(sVar15 * top_blob->elemsize);
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          *(undefined4 *)((long)pvVar47 + uVar26 * 4) = 0x7f7fffff;
                        }
                        pvVar31 = (void *)(sVar27 * sVar40 * (long)pMVar10 + (long)pvVar23);
                        for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                          for (uVar9 = 0; uVar9 != uVar22; uVar9 = uVar9 + 1) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              fVar1 = *(float *)((long)pvVar31 + uVar26 * 4);
                              fVar68 = *(float *)((long)pvVar47 + uVar26 * 4);
                              if (fVar68 <= fVar1) {
                                fVar1 = fVar68;
                              }
                              *(float *)((long)pvVar47 + uVar26 * 4) = fVar1;
                            }
                            pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                          }
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    else if (((bVar43 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar22,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,1,uVar22,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = top_blob->elemsize;
                      sVar15 = top_blob->cstep;
                      pMVar10 = (Mat *)0x0;
                      puVar32 = (uint *)0x0;
                      if (0 < (int)uVar9) {
                        puVar32 = (uint *)(ulong)uVar9;
                      }
                      sVar40 = bottom_blob->elemsize;
                      pMVar12 = (Mat *)(ulong)(uVar30 * uVar22);
                      if ((int)(uVar30 * uVar22) < 1) {
                        pMVar12 = pMVar10;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      sVar5 = bottom_blob->cstep;
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        pvVar31 = pvVar23;
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          auVar102 = ZEXT816(0x7f7fffff);
                          for (pMVar52 = (Mat *)0x0; (Mat *)puVar32 != pMVar52;
                              pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                            fVar68 = *(float *)((long)pvVar31 + (long)pMVar52 * 4);
                            if (fVar68 <= auVar102._0_4_) {
                              auVar102._0_4_ = fVar68;
                            }
                          }
                          *(float *)((long)pvVar47 +
                                    (long)pMVar34 * 4 + sVar27 * sVar15 * (long)pMVar10) =
                               auVar102._0_4_;
                          pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                        }
                        pvVar23 = (void *)((long)pvVar23 + sVar40 * sVar5);
                      }
                    }
                    else if ((reduce_d == false && (bVar19 & 1) == 0) && bVar41 == 0) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar22,uVar30,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,uVar22,uVar30,1,sVar27,opt->blob_allocator);
                      }
                      uVar8 = top_blob->c * (int)top_blob->cstep;
                      pvVar23 = top_blob->data;
                      uVar26 = 0;
                      uVar49 = (ulong)uVar8;
                      if ((int)uVar8 < 1) {
                        uVar49 = uVar26;
                      }
                      for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                        *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x7f7fffff;
                      }
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      pMVar10 = (Mat *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      pMVar12 = (Mat *)(ulong)uVar22;
                      if ((int)uVar22 < 1) {
                        pMVar12 = pMVar10;
                      }
                      puVar32 = (uint *)bottom_blob->data;
                      pMVar34 = (Mat *)(ulong)uVar30;
                      if ((int)uVar30 < 1) {
                        pMVar34 = pMVar10;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        iVar38 = top_blob->w;
                        if (iVar20 == 0) {
                          sVar40 = top_blob->cstep;
                        }
                        else {
                          sVar40 = (long)top_blob->h * (long)iVar38;
                        }
                        ppvVar42 = (void **)((long)&((Mat *)puVar32)->data +
                                            sVar27 * sVar15 * (long)pMVar10);
                        pvVar23 = top_blob->data;
                        sVar5 = top_blob->elemsize;
                        for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar34;
                            pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                          pvVar47 = pvVar23;
                          for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                              pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              fVar1 = *(float *)((long)ppvVar42 + uVar26 * 4);
                              fVar68 = *(float *)((long)pvVar47 + uVar26 * 4);
                              if (fVar68 <= fVar1) {
                                fVar1 = fVar68;
                              }
                              *(float *)((long)pvVar47 + uVar26 * 4) = fVar1;
                            }
                            ppvVar42 = (void **)((long)ppvVar42 + lVar28 * 4);
                            pvVar47 = (void *)((long)pvVar47 + (long)iVar38 * sVar5);
                          }
                          pvVar23 = (void *)((long)pvVar23 + sVar40 * sVar5);
                        }
                      }
                    }
                    else if (((bVar37 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,1,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      iVar20 = top_blob->w;
                      iVar38 = top_blob->d;
                      uVar49 = top_blob->elemsize;
                      lVar16 = (long)top_blob->h * (long)iVar20;
                      uVar26 = 0;
                      if (0 < (int)uVar9) {
                        uVar26 = (ulong)uVar9;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      iVar67 = top_blob->dims;
                      pMVar10 = (Mat *)(ulong)uVar30;
                      if ((int)uVar30 < 1) {
                        pMVar10 = (Mat *)0x0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = (Mat *)0x0;
                      }
                      puVar32 = (uint *)(top_blob->cstep * uVar49);
                      for (pMVar12 = (Mat *)0x0; pMVar12 != pMVar33;
                          pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
                        iVar25 = (int)lVar16;
                        if (iVar67 != 4) {
                          iVar25 = (int)((uVar49 * lVar16 + 0xf & 0xfffffffffffffff0) / uVar49);
                        }
                        iVar25 = iVar25 * iVar38;
                        if (iVar25 < 1) {
                          iVar25 = 0;
                        }
                        for (lVar45 = 0; iVar25 != (int)lVar45; lVar45 = lVar45 + 1) {
                          *(undefined4 *)((long)pvVar47 + lVar45 * 4) = 0x7f7fffff;
                        }
                        pvVar48 = (void *)(sVar27 * sVar15 * (long)pMVar12 + (long)pvVar23);
                        pvVar31 = pvVar47;
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar10;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          for (uVar8 = 0; uVar8 != uVar22; uVar8 = uVar8 + 1) {
                            for (uVar36 = 0; uVar26 != uVar36; uVar36 = uVar36 + 1) {
                              fVar1 = *(float *)((long)pvVar48 + uVar36 * 4);
                              fVar68 = *(float *)((long)pvVar31 + uVar36 * 4);
                              if (fVar68 <= fVar1) {
                                fVar1 = fVar68;
                              }
                              *(float *)((long)pvVar31 + uVar36 * 4) = fVar1;
                            }
                            pvVar48 = (void *)((long)pvVar48 + lVar28 * 4);
                          }
                          pvVar31 = (void *)((long)pvVar31 + (long)iVar20 * uVar49);
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    else if (reduce_c == false && (bVar35 == 0 && (bVar19 & 1) == 0)) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar22,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,uVar22,1,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      iVar20 = top_blob->w;
                      iVar38 = top_blob->d;
                      uVar49 = top_blob->elemsize;
                      lVar16 = (long)top_blob->h * (long)iVar20;
                      uVar26 = 0;
                      if (0 < (int)uVar9) {
                        uVar26 = (ulong)uVar9;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      iVar67 = top_blob->dims;
                      if ((int)uVar30 < 1) {
                        uVar30 = 0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = (Mat *)0x0;
                      }
                      puVar32 = (uint *)(top_blob->cstep * uVar49);
                      for (pMVar10 = (Mat *)0x0; pMVar10 != pMVar33;
                          pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        iVar25 = (int)lVar16;
                        if (iVar67 != 4) {
                          iVar25 = (int)((uVar49 * lVar16 + 0xf & 0xfffffffffffffff0) / uVar49);
                        }
                        iVar25 = iVar25 * iVar38;
                        if (iVar25 < 1) {
                          iVar25 = 0;
                        }
                        for (lVar45 = 0; iVar25 != (int)lVar45; lVar45 = lVar45 + 1) {
                          *(undefined4 *)((long)pvVar47 + lVar45 * 4) = 0x7f7fffff;
                        }
                        pvVar31 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                        for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                          pvVar48 = pvVar47;
                          for (uVar36 = 0; uVar36 != uVar22; uVar36 = uVar36 + 1) {
                            for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                              fVar1 = *(float *)((long)pvVar31 + uVar39 * 4);
                              fVar68 = *(float *)((long)pvVar48 + uVar39 * 4);
                              if (fVar68 <= fVar1) {
                                fVar1 = fVar68;
                              }
                              *(float *)((long)pvVar48 + uVar39 * 4) = fVar1;
                            }
                            pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                            pvVar48 = (void *)((long)pvVar48 + (long)iVar20 * uVar49);
                          }
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    goto LAB_002f4234;
                  }
                  if (iVar20 == 0) {
                    Mat::create(top_blob,uVar9,uVar30,sVar27,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar9,1,uVar30,1,sVar27,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar32 = (uint *)(ulong)uVar9;
                  Mat::create(&local_c8,uVar9,uVar30,uVar4,sVar27,opt->workspace_allocator);
                  iVar38 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                     (Mat *)puVar32 != (Mat *)0x0)) {
                    uVar8 = (int)local_c8.cstep * local_c8.c;
                    uVar26 = 0;
                    uVar49 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar49 = uVar26;
                    }
                    for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x7f7fffff;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar27 = bottom_blob->elemsize;
                    sVar15 = bottom_blob->cstep;
                    pMVar10 = (Mat *)0x0;
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    if ((int)uVar22 < 1) {
                      uVar22 = 0;
                    }
                    pMVar12 = (Mat *)(ulong)uVar30;
                    if ((int)uVar30 < 1) {
                      pMVar12 = pMVar10;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar10;
                    }
                    pMVar34 = (Mat *)local_c8.data;
                    for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                      pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                      pMVar52 = pMVar34;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar8 = 0; uVar8 != uVar22; uVar8 = uVar8 + 1) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar1 = *(float *)((long)pvVar47 + uVar26 * 4);
                            fVar68 = *(float *)((long)&pMVar52->data + uVar26 * 4);
                            if (fVar68 <= fVar1) {
                              fVar1 = fVar68;
                            }
                            *(float *)((long)&pMVar52->data + uVar26 * 4) = fVar1;
                          }
                          pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                      }
                      pMVar34 = (Mat *)((long)&pMVar34->data + local_c8.cstep * local_c8.elemsize);
                    }
                    uVar8 = top_blob->c * (int)top_blob->cstep;
                    pvVar23 = top_blob->data;
                    uVar36 = 0;
                    uVar26 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar26 = uVar36;
                    }
                    for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                      *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0x7f7fffff;
                    }
                    puVar32 = (uint *)(local_c8.cstep * local_c8.elemsize);
                    iVar38 = 0;
                    pMVar10 = (Mat *)local_c8.data;
                    for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                        pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                      pvVar23 = top_blob->data;
                      iVar20 = top_blob->w;
                      sVar27 = top_blob->elemsize;
                      pMVar52 = pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar1 = *(float *)((long)&pMVar52->data + uVar26 * 4);
                          fVar68 = *(float *)((long)pvVar23 + uVar26 * 4);
                          if (fVar68 <= fVar1) {
                            fVar1 = fVar68;
                          }
                          *(float *)((long)pvVar23 + uVar26 * 4) = fVar1;
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                        pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
                      }
                      pMVar10 = (Mat *)((long)&((Mat *)puVar32)->data + (long)&pMVar10->data);
                    }
                  }
                  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                      puVar32 = (uint *)local_c8.data;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
            }
          }
        }
        else {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar30,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar30,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar30,uVar4,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar8 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x7f7fffff;
            }
            pvVar23 = bottom_blob->data;
            puVar32 = (uint *)0x0;
            pMVar10 = (Mat *)(ulong)uVar50;
            if ((int)uVar50 < 1) {
              pMVar10 = (Mat *)puVar32;
            }
            sVar27 = bottom_blob->elemsize;
            pMVar12 = (Mat *)(ulong)uVar30;
            if ((int)uVar30 < 1) {
              pMVar12 = (Mat *)puVar32;
            }
            if ((int)uVar4 < 1) {
              pMVar33 = (Mat *)puVar32;
            }
            sVar15 = bottom_blob->cstep;
            for (; (Mat *)puVar32 != pMVar33; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1))
            {
              pvVar47 = pvVar23;
              for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                auVar93 = ZEXT816(0x7f7fffff);
                for (pMVar52 = (Mat *)0x0; pMVar10 != pMVar52;
                    pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  fVar68 = *(float *)((long)pvVar47 + (long)pMVar52 * 4);
                  if (fVar68 <= auVar93._0_4_) {
                    auVar93._0_4_ = fVar68;
                  }
                }
                *(float *)((long)(void **)local_c8.data +
                          (long)pMVar34 * 4 + local_c8.elemsize * local_c8.cstep * (long)puVar32) =
                     auVar93._0_4_;
                pvVar47 = (void *)((long)pvVar47 + (long)(int)uVar50 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar26 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x7f7fffff;
            }
            iVar38 = 0;
            pMVar10 = (Mat *)local_c8.data;
            for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              puVar32 = (uint *)top_blob->data;
              for (pMVar52 = (Mat *)0x0; pMVar12 != pMVar52;
                  pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                fVar1 = *(float *)((long)&pMVar10->data + (long)pMVar52 * 4);
                fVar68 = *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4);
                if (fVar68 <= fVar1) {
                  fVar1 = fVar68;
                }
                *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4) = fVar1;
              }
              pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (iVar20 == 0) {
          Mat::create(top_blob,1,sVar27,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,1,sVar27,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar32 = (uint *)pMVar33;
        Mat::create(&local_c8,uVar4,sVar27,opt->workspace_allocator);
        iVar38 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          pvVar23 = bottom_blob->data;
          sVar27 = bottom_blob->elemsize;
          sVar15 = bottom_blob->cstep;
          puVar32 = (uint *)0x0;
          pMVar10 = (Mat *)(ulong)uVar51;
          if ((int)uVar51 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          if ((int)uVar4 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar33; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = 3.4028235e+38;
            for (pMVar12 = (Mat *)0x0; pMVar10 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar1 = *(float *)((long)pvVar23 + (long)pMVar12 * 4);
              if (fVar1 <= fVar68) {
                fVar68 = fVar1;
              }
            }
            *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
          }
          fVar68 = 3.4028235e+38;
          for (pMVar10 = (Mat *)0x0; pMVar33 != pMVar10; pMVar10 = (Mat *)((long)&pMVar10->data + 1)
              ) {
            fVar1 = *(float *)((long)(void **)local_c8.data + (long)pMVar10 * 4);
            if (fVar1 <= fVar68) {
              fVar68 = fVar1;
            }
          }
          *(float *)top_blob->data = fVar68;
          iVar38 = 0;
        }
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
            puVar32 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    break;
  case 6:
    fVar54 = this->coeff;
    if (3 < uVar8 - 1) goto LAB_002f4234;
    iVar20 = this->keepdims;
    sVar27 = bottom_blob->elemsize;
    switch(uVar8) {
    case 1:
      uVar8 = bottom_blob->w;
      puVar32 = (uint *)0x1;
      Mat::create(top_blob,1,sVar27,opt->blob_allocator);
      uVar26 = 0;
      uVar49 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar49 = uVar26;
      }
      fVar68 = 1.0;
      for (; uVar49 != uVar26; uVar26 = uVar26 + 1) {
        fVar68 = fVar68 * *(float *)((long)bottom_blob->data + uVar26 * 4);
      }
      goto LAB_002ea14e;
    case 2:
      uVar8 = bottom_blob->w;
      pMVar33 = (Mat *)(ulong)uVar8;
      uVar9 = bottom_blob->h;
      auVar66._8_4_ = 0xffffffff;
      auVar66._0_8_ = 0xffffffffffffffff;
      auVar66._12_4_ = 0xffffffff;
      auVar86._0_8_ = SUB168(auVar69 ^ auVar66,0) << 0x3f;
      auVar86._8_8_ = SUB168(auVar69 ^ auVar66,8) << 0x3f;
      iVar38 = movmskpd(uVar21,auVar86);
      if (iVar38 != 0) {
        if (((bVar19 | (byte)iVar38 >> 1) & 1) == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar9,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          iVar20 = bottom_blob->w;
          sVar27 = bottom_blob->elemsize;
          pvVar47 = top_blob->data;
          puVar32 = (uint *)0x0;
          if ((int)uVar8 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          pMVar10 = (Mat *)(ulong)uVar9;
          if ((int)uVar9 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = 1.0;
            for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar68 = fVar68 * *(float *)((long)pvVar23 + (long)pMVar12 * 4);
            }
            *(float *)((long)pvVar47 + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
          }
        }
        else if (((bVar46 | (byte)iVar38) & 1) == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar8,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar8,1,sVar27,opt->blob_allocator);
          }
          uVar22 = top_blob->c * (int)top_blob->cstep;
          pvVar23 = top_blob->data;
          uVar26 = 0;
          uVar49 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar49 = uVar26;
          }
          for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
            *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x3f800000;
          }
          iVar20 = bottom_blob->w;
          sVar27 = bottom_blob->elemsize;
          pMVar10 = (Mat *)0x0;
          if ((int)uVar8 < 1) {
            pMVar33 = pMVar10;
          }
          puVar32 = (uint *)bottom_blob->data;
          pMVar12 = (Mat *)(ulong)uVar9;
          if ((int)uVar9 < 1) {
            pMVar12 = pMVar10;
          }
          for (; pMVar10 != pMVar12; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
            for (pMVar34 = (Mat *)0x0; pMVar33 != pMVar34;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              *(float *)((long)pvVar23 + (long)pMVar34 * 4) =
                   *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar34 * 4) *
                   *(float *)((long)pvVar23 + (long)pMVar34 * 4);
            }
            puVar32 = (uint *)((long)&((Mat *)puVar32)->data + (long)iVar20 * sVar27);
          }
        }
        goto LAB_002f4234;
      }
      if (iVar20 == 0) {
        Mat::create(top_blob,1,sVar27,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,sVar27,opt->blob_allocator);
      }
      local_c8.cstep = 0;
      local_c8.data = (Mat *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize = 0;
      local_c8.elempack = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      puVar32 = (uint *)(ulong)uVar9;
      Mat::create(&local_c8,uVar9,sVar27,opt->workspace_allocator);
      iVar38 = -100;
      if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
        pvVar23 = bottom_blob->data;
        iVar20 = bottom_blob->w;
        sVar27 = bottom_blob->elemsize;
        puVar32 = (uint *)0x0;
        if ((int)uVar8 < 1) {
          pMVar33 = (Mat *)puVar32;
        }
        pMVar10 = (Mat *)(ulong)uVar9;
        if ((int)uVar9 < 1) {
          pMVar10 = (Mat *)puVar32;
        }
        for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
          fVar68 = 1.0;
          for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12; pMVar12 = (Mat *)((long)&pMVar12->data + 1)
              ) {
            fVar68 = fVar68 * *(float *)((long)pvVar23 + (long)pMVar12 * 4);
          }
          *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
          pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
        }
        fVar68 = 1.0;
        for (pMVar33 = (Mat *)0x0; pMVar10 != pMVar33; pMVar33 = (Mat *)((long)&pMVar33->data + 1))
        {
          fVar68 = fVar68 * *(float *)((long)(void **)local_c8.data + (long)pMVar33 * 4);
        }
        *(float *)top_blob->data = fVar68;
        iVar38 = 0;
      }
      piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
          puVar32 = (uint *)local_c8.data;
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
      break;
    case 3:
      uVar8 = bottom_blob->w;
      lVar28 = (long)(int)uVar8;
      uVar9 = bottom_blob->h;
      uVar22 = bottom_blob->c;
      uVar30 = uVar9 * uVar8;
      auVar62._8_4_ = 0xffffffff;
      auVar62._0_8_ = 0xffffffffffffffff;
      auVar62._12_4_ = 0xffffffff;
      auVar80._0_8_ = SUB168(auVar69 ^ auVar62,0) << 0x3f;
      auVar80._8_8_ = SUB168(auVar69 ^ auVar62,8) << 0x3f;
      iVar38 = movmskpd(uVar24,auVar80);
      bVar35 = reduce_c ^ 1;
      if ((iVar38 != 0) || (bVar35 != 0)) {
        if (iVar38 == 0 && reduce_c == false) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar22,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar22,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          sVar27 = top_blob->elemsize;
          sVar15 = top_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar49 = uVar26;
          }
          uVar36 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar36 = uVar26;
          }
          pvVar47 = top_blob->data;
          puVar32 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
          for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
            fVar68 = 1.0;
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar68 = fVar68 * *(float *)((long)pvVar23 + uVar39 * 4);
            }
            lVar28 = sVar27 * sVar15 * uVar26;
            if (iVar20 == 0) {
              lVar28 = uVar26 * 4;
            }
            *(float *)((long)pvVar47 + lVar28) = fVar68;
            pvVar23 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar23);
          }
          goto LAB_002f4234;
        }
        bVar41 = (byte)iVar38 >> 1 | bVar19;
        if ((bVar41 & 1) == 0 && bVar35 == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar9,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar9,uVar22,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar30 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar30;
            if ((int)uVar30 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x3f800000;
            }
            pvVar23 = bottom_blob->data;
            uVar49 = 0;
            puVar32 = (uint *)0x0;
            if (0 < (int)uVar8) {
              puVar32 = (uint *)(ulong)uVar8;
            }
            sVar27 = bottom_blob->elemsize;
            uVar26 = (ulong)uVar9;
            if ((int)uVar9 < 1) {
              uVar26 = uVar49;
            }
            uVar36 = (ulong)uVar22;
            if ((int)uVar22 < 1) {
              uVar36 = uVar49;
            }
            sVar15 = bottom_blob->cstep;
            for (; uVar49 != uVar36; uVar49 = uVar49 + 1) {
              pvVar47 = pvVar23;
              for (uVar39 = 0; uVar39 != uVar26; uVar39 = uVar39 + 1) {
                auVar92 = ZEXT816(0x3f800000);
                for (pMVar33 = (Mat *)0x0; (Mat *)puVar32 != pMVar33;
                    pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
                  auVar92._0_4_ = auVar92._0_4_ * *(float *)((long)pvVar47 + (long)pMVar33 * 4);
                }
                *(float *)((long)(void **)local_c8.data +
                          uVar39 * 4 + local_c8.elemsize * local_c8.cstep * uVar49) = auVar92._0_4_;
                pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar39 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar39;
            }
            for (; (int)uVar49 != (int)uVar39; uVar39 = uVar39 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar39 * 4) = 0x3f800000;
            }
            iVar38 = 0;
            pMVar33 = (Mat *)local_c8.data;
            for (uVar49 = 0; uVar49 != uVar36; uVar49 = uVar49 + 1) {
              puVar32 = (uint *)top_blob->data;
              for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4) =
                     *(float *)((long)&pMVar33->data + uVar39 * 4) *
                     *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4);
              }
              pMVar33 = (Mat *)((long)&pMVar33->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        else {
          bVar43 = (byte)iVar38 | bVar46;
          if ((bVar43 & 1) != 0 || bVar35 != 0) {
            if ((bVar41 & 1) == 0 && reduce_c == false) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar9,uVar22,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,1,uVar9,uVar22,sVar27,opt->blob_allocator);
              }
              uVar49 = 0;
              uVar26 = 0;
              if (0 < (int)uVar8) {
                uVar26 = (ulong)uVar8;
              }
              uVar36 = (ulong)uVar9;
              if ((int)uVar9 < 1) {
                uVar36 = uVar49;
              }
              uVar39 = (ulong)uVar22;
              if ((int)uVar22 < 1) {
                uVar39 = uVar49;
              }
              sVar27 = bottom_blob->elemsize;
              if (iVar20 == 0) {
                sVar15 = (size_t)top_blob->w;
              }
              else {
                sVar15 = top_blob->cstep;
              }
              pvVar23 = bottom_blob->data;
              pvVar47 = top_blob->data;
              puVar32 = (uint *)(sVar15 * top_blob->elemsize);
              sVar15 = bottom_blob->cstep;
              for (; uVar49 != uVar39; uVar49 = uVar49 + 1) {
                pvVar31 = pvVar23;
                for (uVar29 = 0; uVar29 != uVar36; uVar29 = uVar29 + 1) {
                  auVar97 = ZEXT816(0x3f800000);
                  for (uVar44 = 0; uVar26 != uVar44; uVar44 = uVar44 + 1) {
                    auVar97._0_4_ = auVar97._0_4_ * *(float *)((long)pvVar31 + uVar44 * 4);
                  }
                  *(float *)((long)pvVar47 + uVar29 * 4 + (long)puVar32 * uVar49) = auVar97._0_4_;
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              }
            }
            else if (((bVar19 | bVar46) & 1) == 0 && bVar35 == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar8,uVar9,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar8,uVar9,1,sVar27,opt->blob_allocator);
              }
              iVar20 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              lVar28 = 0;
              if (iVar20 < 1) {
                iVar20 = 0;
              }
              for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
                *(undefined4 *)((long)pvVar23 + lVar28 * 4) = 0x3f800000;
              }
              sVar27 = bottom_blob->elemsize;
              sVar15 = bottom_blob->cstep;
              uVar26 = 0;
              uVar49 = (ulong)uVar30;
              if ((int)uVar30 < 1) {
                uVar49 = uVar26;
              }
              pvVar23 = bottom_blob->data;
              uVar36 = (ulong)uVar22;
              puVar32 = (uint *)bottom_blob;
              if ((int)uVar22 < 1) {
                uVar36 = uVar26;
              }
              for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
                puVar32 = (uint *)top_blob->data;
                for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
                  *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4) =
                       *(float *)((long)pvVar23 + uVar39 * 4) *
                       *(float *)((long)&((Mat *)puVar32)->data + uVar39 * 4);
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              }
            }
            else if (reduce_c == false && (bVar43 & 1) == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar8,uVar22,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar8,1,uVar22,sVar27,opt->blob_allocator);
              }
              uVar30 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              uVar26 = 0;
              uVar49 = (ulong)uVar30;
              if ((int)uVar30 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x3f800000;
              }
              uVar49 = 0;
              uVar26 = 0;
              if (0 < (int)uVar8) {
                uVar26 = (ulong)uVar8;
              }
              if ((int)uVar9 < 1) {
                uVar9 = 0;
              }
              uVar36 = (ulong)uVar22;
              if ((int)uVar22 < 1) {
                uVar36 = uVar49;
              }
              sVar27 = bottom_blob->elemsize;
              if (iVar20 == 0) {
                sVar15 = (size_t)top_blob->w;
              }
              else {
                sVar15 = top_blob->cstep;
              }
              pvVar23 = bottom_blob->data;
              puVar32 = (uint *)(sVar15 * top_blob->elemsize);
              pvVar47 = top_blob->data;
              sVar15 = bottom_blob->cstep;
              for (; uVar49 != uVar36; uVar49 = uVar49 + 1) {
                pvVar31 = pvVar23;
                for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
                  for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                    *(float *)((long)pvVar47 + uVar39 * 4) =
                         *(float *)((long)pvVar31 + uVar39 * 4) *
                         *(float *)((long)pvVar47 + uVar39 * 4);
                  }
                  pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
                pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
              }
            }
            goto LAB_002f4234;
          }
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar8,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar8,1,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)(ulong)uVar8;
          Mat::create(&local_c8,uVar8,1,uVar22,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar30 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar30;
            if ((int)uVar30 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x3f800000;
            }
            pvVar23 = bottom_blob->data;
            sVar27 = bottom_blob->elemsize;
            pMVar33 = (Mat *)0x0;
            uVar49 = 0;
            if (0 < (int)uVar8) {
              uVar49 = (ulong)uVar8;
            }
            if ((int)uVar9 < 1) {
              uVar9 = 0;
            }
            pMVar10 = (Mat *)(ulong)uVar22;
            if ((int)uVar22 < 1) {
              pMVar10 = pMVar33;
            }
            sVar15 = bottom_blob->cstep;
            pMVar12 = (Mat *)local_c8.data;
            for (; pMVar33 != pMVar10; pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
              pvVar47 = pvVar23;
              for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
                for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                  *(float *)((long)&pMVar12->data + uVar26 * 4) =
                       *(float *)((long)pvVar47 + uVar26 * 4) *
                       *(float *)((long)&pMVar12->data + uVar26 * 4);
                }
                pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              pMVar12 = (Mat *)((long)&pMVar12->data + local_c8.elemsize * local_c8.cstep);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar36 = 0;
            uVar26 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar26 = uVar36;
            }
            for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0x3f800000;
            }
            iVar38 = 0;
            pMVar33 = (Mat *)local_c8.data;
            for (puVar32 = (uint *)0x0; (Mat *)puVar32 != pMVar10;
                puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
              pvVar23 = top_blob->data;
              for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                *(float *)((long)pvVar23 + uVar26 * 4) =
                     *(float *)((long)&pMVar33->data + uVar26 * 4) *
                     *(float *)((long)pvVar23 + uVar26 * 4);
              }
              pMVar33 = (Mat *)((long)&pMVar33->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (iVar20 == 0) {
          Mat::create(top_blob,1,sVar27,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar27,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar32 = (uint *)(ulong)uVar22;
        Mat::create(&local_c8,uVar22,sVar27,opt->workspace_allocator);
        iVar38 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          pvVar23 = bottom_blob->data;
          sVar27 = bottom_blob->elemsize;
          sVar15 = bottom_blob->cstep;
          puVar32 = (uint *)0x0;
          pMVar33 = (Mat *)(ulong)uVar30;
          if ((int)uVar30 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          pMVar10 = (Mat *)(ulong)uVar22;
          if ((int)uVar22 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar10; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = 1.0;
            for (pMVar12 = (Mat *)0x0; pMVar33 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar68 = fVar68 * *(float *)((long)pvVar23 + (long)pMVar12 * 4);
            }
            *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
          }
          fVar68 = 1.0;
          for (pMVar33 = (Mat *)0x0; pMVar10 != pMVar33; pMVar33 = (Mat *)((long)&pMVar33->data + 1)
              ) {
            fVar68 = fVar68 * *(float *)((long)(void **)local_c8.data + (long)pMVar33 * 4);
          }
          *(float *)top_blob->data = fVar68;
          iVar38 = 0;
        }
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
            puVar32 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      break;
    case 4:
      uVar9 = bottom_blob->w;
      lVar28 = (long)(int)uVar9;
      uVar22 = bottom_blob->h;
      uVar30 = bottom_blob->d;
      uVar4 = bottom_blob->c;
      pMVar33 = (Mat *)(ulong)uVar4;
      uVar50 = uVar22 * uVar9;
      uVar51 = uVar50 * uVar30;
      auVar64._8_4_ = 0xffffffff;
      auVar64._0_8_ = 0xffffffffffffffff;
      auVar64._12_4_ = 0xffffffff;
      auVar83._0_8_ = SUB168(auVar69 ^ auVar64,0) << 0x3f;
      auVar83._8_8_ = SUB168(auVar69 ^ auVar64,8) << 0x3f;
      iVar38 = movmskpd((&switchD_002e9ff9::switchdataD_004f4c8c)[uVar8 - 1] + 0x4f4c8c,auVar83);
      bVar53 = iVar38 != 0;
      bVar35 = reduce_d ^ 1;
      bVar41 = reduce_c ^ 1;
      if ((bVar53 || bVar35 != 0) || (bVar41 != 0)) {
        if ((!bVar53 && bVar35 == 0) && reduce_c == false) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar4,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,1,uVar4,sVar27,opt->blob_allocator);
          }
          pvVar23 = bottom_blob->data;
          sVar27 = top_blob->elemsize;
          sVar15 = top_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar49 = uVar26;
          }
          uVar36 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar36 = uVar26;
          }
          pvVar47 = top_blob->data;
          puVar32 = (uint *)(bottom_blob->elemsize * bottom_blob->cstep);
          for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
            fVar68 = 1.0;
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar68 = fVar68 * *(float *)((long)pvVar23 + uVar39 * 4);
            }
            lVar28 = sVar27 * sVar15 * uVar26;
            if (iVar20 == 0) {
              lVar28 = uVar26 * 4;
            }
            *(float *)((long)pvVar47 + lVar28) = fVar68;
            pvVar23 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar23);
          }
          goto LAB_002f4234;
        }
        if ((bVar53 || reduce_d != false) || bVar41 != 0) {
          bVar43 = (byte)iVar38 >> 1 | bVar19;
          if (((bVar43 & 1) == 0 && bVar35 == 0) && bVar41 == 0) {
            if (iVar20 == 0) {
              Mat::create(top_blob,uVar22,sVar27,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar22,1,1,sVar27,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar32 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar22,uVar4,sVar27,opt->workspace_allocator);
            iVar38 = -100;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0)
               ) {
              uVar8 = (int)local_c8.cstep * local_c8.c;
              uVar26 = 0;
              uVar49 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x3f800000;
              }
              sVar27 = bottom_blob->elemsize;
              sVar15 = bottom_blob->cstep;
              pMVar10 = (Mat *)0x0;
              puVar32 = (uint *)0x0;
              if (0 < (int)uVar9) {
                puVar32 = (uint *)(ulong)uVar9;
              }
              pvVar23 = bottom_blob->data;
              pMVar12 = (Mat *)(ulong)uVar22;
              if ((int)uVar22 < 1) {
                pMVar12 = pMVar10;
              }
              if ((int)uVar30 < 1) {
                uVar30 = 0;
              }
              if ((int)uVar4 < 1) {
                pMVar33 = pMVar10;
              }
              for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                lVar16 = local_c8.elemsize * local_c8.cstep * (long)pMVar10;
                for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                  for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                      pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                    for (pMVar52 = (Mat *)0x0; (Mat *)puVar32 != pMVar52;
                        pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                      *(float *)((long)(void **)local_c8.data + (long)pMVar34 * 4 + lVar16) =
                           *(float *)((long)pvVar47 + (long)pMVar52 * 4) *
                           *(float *)((long)(void **)local_c8.data + (long)pMVar34 * 4 + lVar16);
                    }
                    pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                  }
                }
              }
              uVar8 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              uVar26 = 0;
              uVar49 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x3f800000;
              }
              pMVar10 = (Mat *)local_c8.data;
              for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                puVar32 = (uint *)top_blob->data;
                for (pMVar52 = (Mat *)0x0; pMVar12 != pMVar52;
                    pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4) =
                       *(float *)((long)&pMVar10->data + (long)pMVar52 * 4) *
                       *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4);
                }
                pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
              }
              iVar38 = 0;
            }
            piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                puVar32 = (uint *)local_c8.data;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          else {
            bVar37 = (byte)iVar38 | bVar46;
            if (((bVar37 & 1) == 0 && bVar35 == 0) && bVar41 == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar9,1,1,1,sVar27,opt->blob_allocator);
              }
              local_c8.cstep = 0;
              local_c8.data = (Mat *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.elemsize = 0;
              local_c8.elempack = 0;
              local_c8.allocator = (Allocator *)0x0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.d = 0;
              local_c8.c = 0;
              puVar32 = (uint *)(ulong)uVar9;
              Mat::create(&local_c8,uVar9,1,uVar4,sVar27,opt->workspace_allocator);
              iVar38 = -100;
              if (((Mat *)local_c8.data != (Mat *)0x0) &&
                 (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                 (Mat *)puVar32 != (Mat *)0x0)) {
                uVar8 = (int)local_c8.cstep * local_c8.c;
                uVar26 = 0;
                uVar49 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar49 = uVar26;
                }
                for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                  *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x3f800000;
                }
                sVar27 = bottom_blob->elemsize;
                sVar15 = bottom_blob->cstep;
                pMVar10 = (Mat *)0x0;
                uVar49 = 0;
                if (0 < (int)uVar9) {
                  uVar49 = (ulong)uVar9;
                }
                if ((int)uVar22 < 1) {
                  uVar22 = 0;
                }
                pvVar23 = bottom_blob->data;
                if ((int)uVar30 < 1) {
                  uVar30 = 0;
                }
                if ((int)uVar4 < 1) {
                  pMVar33 = pMVar10;
                }
                pMVar12 = (Mat *)local_c8.data;
                for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                  pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                  for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                    for (uVar9 = 0; uVar9 != uVar22; uVar9 = uVar9 + 1) {
                      for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                        *(float *)((long)&pMVar12->data + uVar26 * 4) =
                             *(float *)((long)pvVar47 + uVar26 * 4) *
                             *(float *)((long)&pMVar12->data + uVar26 * 4);
                      }
                      pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                    }
                  }
                  pMVar12 = (Mat *)((long)&pMVar12->data + local_c8.elemsize * local_c8.cstep);
                }
                uVar8 = top_blob->c * (int)top_blob->cstep;
                pvVar23 = top_blob->data;
                uVar36 = 0;
                uVar26 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar26 = uVar36;
                }
                for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                  *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0x3f800000;
                }
                iVar38 = 0;
                pMVar10 = (Mat *)local_c8.data;
                for (puVar32 = (uint *)0x0; (Mat *)puVar32 != pMVar33;
                    puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
                  pvVar23 = top_blob->data;
                  for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                    *(float *)((long)pvVar23 + uVar26 * 4) =
                         *(float *)((long)&pMVar10->data + uVar26 * 4) *
                         *(float *)((long)pvVar23 + uVar26 * 4);
                  }
                  pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
                }
              }
              piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                  puVar32 = (uint *)local_c8.data;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            else {
              if ((!bVar53 && reduce_d == false) && reduce_c == false) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar30,uVar4,sVar27,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,1,uVar30,uVar4,sVar27,opt->blob_allocator);
                }
                uVar49 = 0;
                uVar26 = 0;
                if (0 < (int)uVar50) {
                  uVar26 = (ulong)uVar50;
                }
                uVar36 = (ulong)uVar30;
                if ((int)uVar30 < 1) {
                  uVar36 = uVar49;
                }
                uVar39 = (ulong)uVar4;
                if ((int)uVar4 < 1) {
                  uVar39 = uVar49;
                }
                sVar27 = bottom_blob->elemsize;
                if (iVar20 == 0) {
                  sVar15 = (size_t)top_blob->w;
                }
                else {
                  sVar15 = top_blob->cstep;
                }
                pvVar23 = bottom_blob->data;
                pvVar47 = top_blob->data;
                sVar40 = top_blob->elemsize;
                sVar5 = bottom_blob->cstep;
                puVar32 = (uint *)((long)(int)uVar50 * 4);
                for (; uVar49 != uVar39; uVar49 = uVar49 + 1) {
                  pvVar31 = pvVar23;
                  for (uVar29 = 0; uVar29 != uVar36; uVar29 = uVar29 + 1) {
                    auVar100 = ZEXT816(0x3f800000);
                    for (uVar44 = 0; uVar26 != uVar44; uVar44 = uVar44 + 1) {
                      auVar100._0_4_ = auVar100._0_4_ * *(float *)((long)pvVar31 + uVar44 * 4);
                    }
                    *(float *)((long)pvVar47 + uVar29 * 4 + sVar15 * sVar40 * uVar49) =
                         auVar100._0_4_;
                    pvVar31 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar31);
                  }
                  pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar5);
                }
                goto LAB_002f4234;
              }
              if (((bVar43 & 1) == 0 && reduce_d == false) && bVar41 == 0) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar22,uVar30,sVar27,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,uVar22,uVar30,1,sVar27,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar32 = (uint *)(ulong)uVar22;
                Mat::create(&local_c8,uVar22,uVar30,uVar4,sVar27,opt->workspace_allocator);
                iVar38 = -100;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                   (Mat *)puVar32 != (Mat *)0x0)) {
                  uVar8 = (int)local_c8.cstep * local_c8.c;
                  uVar26 = 0;
                  uVar49 = (ulong)uVar8;
                  if ((int)uVar8 < 1) {
                    uVar49 = uVar26;
                  }
                  for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x3f800000;
                  }
                  sVar27 = bottom_blob->elemsize;
                  sVar15 = bottom_blob->cstep;
                  pMVar10 = (Mat *)0x0;
                  uVar49 = 0;
                  if (0 < (int)uVar9) {
                    uVar49 = (ulong)uVar9;
                  }
                  pvVar23 = bottom_blob->data;
                  pMVar12 = (Mat *)(ulong)uVar22;
                  if ((int)uVar22 < 1) {
                    pMVar12 = pMVar10;
                  }
                  pMVar34 = (Mat *)(ulong)uVar30;
                  if ((int)uVar30 < 1) {
                    pMVar34 = pMVar10;
                  }
                  if ((int)uVar4 < 1) {
                    pMVar33 = pMVar10;
                  }
                  for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                    pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                    for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar34;
                        pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                      lVar16 = (long)local_c8.w * local_c8.elemsize * (long)pMVar52 +
                               local_c8.cstep * local_c8.elemsize * (long)pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          *(float *)((long)(void **)local_c8.data + (long)pMVar13 * 4 + lVar16) =
                               *(float *)((long)pvVar47 + uVar26 * 4) *
                               *(float *)((long)(void **)local_c8.data + (long)pMVar13 * 4 + lVar16)
                          ;
                        }
                        pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                      }
                    }
                  }
                  uVar8 = top_blob->c * (int)top_blob->cstep;
                  pvVar23 = top_blob->data;
                  uVar26 = 0;
                  uVar49 = (ulong)uVar8;
                  if ((int)uVar8 < 1) {
                    uVar49 = uVar26;
                  }
                  for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                    *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x3f800000;
                  }
                  puVar32 = (uint *)0x1;
                  pMVar10 = (Mat *)local_c8.data;
                  for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar33;
                      pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                    iVar38 = 1;
                    if (iVar20 != 0) {
                      iVar38 = top_blob->h;
                    }
                    iVar67 = top_blob->w;
                    sVar27 = top_blob->elemsize;
                    pvVar23 = top_blob->data;
                    pMVar13 = pMVar10;
                    for (pMVar11 = (Mat *)0x0; pMVar11 != pMVar34;
                        pMVar11 = (Mat *)((long)&pMVar11->data + 1)) {
                      for (pMVar14 = (Mat *)0x0; pMVar12 != pMVar14;
                          pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
                        *(float *)((long)pvVar23 + (long)pMVar14 * 4) =
                             *(float *)((long)&pMVar13->data + (long)pMVar14 * 4) *
                             *(float *)((long)pvVar23 + (long)pMVar14 * 4);
                      }
                      pMVar13 = (Mat *)((long)&pMVar13->data + (long)local_c8.w * local_c8.elemsize)
                      ;
                      pvVar23 = (void *)((long)pvVar23 + (long)iVar38 * sVar27 * (long)iVar67);
                    }
                    pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.cstep * local_c8.elemsize);
                  }
                  iVar38 = 0;
                }
                piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                    puVar32 = (uint *)local_c8.data;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                  }
                }
              }
              else {
                bVar19 = bVar19 | bVar46;
                if ((bVar35 == 0 && (bVar19 & 1) == 0) && bVar41 == 0) {
                  if (iVar20 == 0) {
                    Mat::create(top_blob,uVar9,uVar22,sVar27,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar9,uVar22,1,1,sVar27,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar32 = (uint *)(ulong)uVar9;
                  Mat::create(&local_c8,uVar9,uVar22,uVar4,sVar27,opt->workspace_allocator);
                  iVar38 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                     (Mat *)puVar32 != (Mat *)0x0)) {
                    uVar8 = (int)local_c8.cstep * local_c8.c;
                    uVar26 = 0;
                    uVar49 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar49 = uVar26;
                    }
                    for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x3f800000;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar27 = bottom_blob->elemsize;
                    sVar15 = bottom_blob->cstep;
                    pMVar10 = (Mat *)0x0;
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    pMVar12 = (Mat *)(ulong)uVar22;
                    if ((int)uVar22 < 1) {
                      pMVar12 = pMVar10;
                    }
                    if ((int)uVar30 < 1) {
                      uVar30 = 0;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar10;
                    }
                    pMVar34 = (Mat *)local_c8.data;
                    for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                      pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                      for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                        pMVar52 = pMVar34;
                        for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                            pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            *(float *)((long)&pMVar52->data + uVar26 * 4) =
                                 *(float *)((long)pvVar47 + uVar26 * 4) *
                                 *(float *)((long)&pMVar52->data + uVar26 * 4);
                          }
                          pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                          pMVar52 = (Mat *)((long)&pMVar52->data +
                                           (long)local_c8.w * local_c8.elemsize);
                        }
                      }
                      pMVar34 = (Mat *)((long)&pMVar34->data + local_c8.cstep * local_c8.elemsize);
                    }
                    uVar8 = top_blob->c * (int)top_blob->cstep;
                    pvVar23 = top_blob->data;
                    uVar36 = 0;
                    uVar26 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar26 = uVar36;
                    }
                    for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                      *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0x3f800000;
                    }
                    puVar32 = (uint *)(local_c8.cstep * local_c8.elemsize);
                    iVar38 = 0;
                    pMVar10 = (Mat *)local_c8.data;
                    for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                        pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                      pvVar23 = top_blob->data;
                      iVar20 = top_blob->w;
                      sVar27 = top_blob->elemsize;
                      pMVar52 = pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          *(float *)((long)pvVar23 + uVar26 * 4) =
                               *(float *)((long)&pMVar52->data + uVar26 * 4) *
                               *(float *)((long)pvVar23 + uVar26 * 4);
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                        pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
                      }
                      pMVar10 = (Mat *)((long)&((Mat *)puVar32)->data + (long)&pMVar10->data);
                    }
                  }
                  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                      puVar32 = (uint *)local_c8.data;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
                else {
                  if (((bVar43 & 1) == 0 && bVar35 == 0) && reduce_c == false) {
                    if (iVar20 == 0) {
                      Mat::create(top_blob,uVar22,uVar4,sVar27,opt->blob_allocator);
                    }
                    else {
                      Mat::create(top_blob,1,uVar22,1,uVar4,sVar27,opt->blob_allocator);
                    }
                    pMVar12 = (Mat *)0x0;
                    pMVar10 = (Mat *)(ulong)uVar22;
                    if ((int)uVar22 < 1) {
                      pMVar10 = pMVar12;
                    }
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    sVar27 = bottom_blob->elemsize;
                    if ((int)uVar30 < 1) {
                      uVar30 = 0;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar12;
                    }
                    if (iVar20 == 0) {
                      sVar15 = (size_t)top_blob->w;
                    }
                    else {
                      sVar15 = top_blob->cstep;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar40 = bottom_blob->cstep;
                    pvVar47 = top_blob->data;
                    puVar32 = (uint *)(sVar15 * top_blob->elemsize);
                    pvVar31 = pvVar47;
                    for (; pMVar12 != pMVar33; pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
                      for (pMVar34 = (Mat *)0x0; pMVar10 != pMVar34;
                          pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                        *(undefined4 *)((long)pvVar31 + (long)pMVar34 * 4) = 0x3f800000;
                      }
                      pvVar48 = (void *)(sVar27 * sVar40 * (long)pMVar12 + (long)pvVar23);
                      for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar10;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            *(float *)((long)pvVar47 +
                                      (long)pMVar34 * 4 + (long)puVar32 * (long)pMVar12) =
                                 *(float *)((long)pvVar48 + uVar26 * 4) *
                                 *(float *)((long)pvVar47 +
                                           (long)pMVar34 * 4 + (long)puVar32 * (long)pMVar12);
                          }
                          pvVar48 = (void *)((long)pvVar48 + lVar28 * 4);
                        }
                      }
                      pvVar31 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar31);
                    }
                    goto LAB_002f4234;
                  }
                  puVar32 = (uint *)(ulong)CONCAT31((int3)((uint)iVar38 >> 8),
                                                    bVar37 | reduce_d | bVar41);
                  if (((bVar37 & 1) != 0 || reduce_d != false) || bVar41 != 0) {
                    if (((bVar37 & 1) == 0 && bVar35 == 0) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,1,1,uVar4,sVar27,opt->blob_allocator);
                      }
                      pMVar10 = (Mat *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      sVar27 = bottom_blob->elemsize;
                      if ((int)uVar30 < 1) {
                        uVar30 = 0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      if (iVar20 == 0) {
                        sVar15 = (size_t)top_blob->w;
                      }
                      else {
                        sVar15 = top_blob->cstep;
                      }
                      pvVar23 = bottom_blob->data;
                      sVar40 = bottom_blob->cstep;
                      pvVar47 = top_blob->data;
                      puVar32 = (uint *)(sVar15 * top_blob->elemsize);
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          *(undefined4 *)((long)pvVar47 + uVar26 * 4) = 0x3f800000;
                        }
                        pvVar31 = (void *)(sVar27 * sVar40 * (long)pMVar10 + (long)pvVar23);
                        for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                          for (uVar9 = 0; uVar9 != uVar22; uVar9 = uVar9 + 1) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              *(float *)((long)pvVar47 + uVar26 * 4) =
                                   *(float *)((long)pvVar31 + uVar26 * 4) *
                                   *(float *)((long)pvVar47 + uVar26 * 4);
                            }
                            pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                          }
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    else if (((bVar43 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar22,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,1,uVar22,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = top_blob->elemsize;
                      sVar15 = top_blob->cstep;
                      pMVar10 = (Mat *)0x0;
                      puVar32 = (uint *)0x0;
                      if (0 < (int)uVar9) {
                        puVar32 = (uint *)(ulong)uVar9;
                      }
                      sVar40 = bottom_blob->elemsize;
                      pMVar12 = (Mat *)(ulong)(uVar30 * uVar22);
                      if ((int)(uVar30 * uVar22) < 1) {
                        pMVar12 = pMVar10;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      sVar5 = bottom_blob->cstep;
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        pvVar31 = pvVar23;
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          auVar103 = ZEXT816(0x3f800000);
                          for (pMVar52 = (Mat *)0x0; (Mat *)puVar32 != pMVar52;
                              pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                            auVar103._0_4_ =
                                 auVar103._0_4_ * *(float *)((long)pvVar31 + (long)pMVar52 * 4);
                          }
                          *(float *)((long)pvVar47 +
                                    (long)pMVar34 * 4 + sVar27 * sVar15 * (long)pMVar10) =
                               auVar103._0_4_;
                          pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                        }
                        pvVar23 = (void *)((long)pvVar23 + sVar40 * sVar5);
                      }
                    }
                    else if ((reduce_d == false && (bVar19 & 1) == 0) && bVar41 == 0) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar22,uVar30,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,uVar22,uVar30,1,sVar27,opt->blob_allocator);
                      }
                      uVar8 = top_blob->c * (int)top_blob->cstep;
                      pvVar23 = top_blob->data;
                      uVar26 = 0;
                      uVar49 = (ulong)uVar8;
                      if ((int)uVar8 < 1) {
                        uVar49 = uVar26;
                      }
                      for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                        *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x3f800000;
                      }
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      pMVar10 = (Mat *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      pMVar12 = (Mat *)(ulong)uVar22;
                      if ((int)uVar22 < 1) {
                        pMVar12 = pMVar10;
                      }
                      puVar32 = (uint *)bottom_blob->data;
                      pMVar34 = (Mat *)(ulong)uVar30;
                      if ((int)uVar30 < 1) {
                        pMVar34 = pMVar10;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar10;
                      }
                      for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        iVar38 = top_blob->w;
                        if (iVar20 == 0) {
                          sVar40 = top_blob->cstep;
                        }
                        else {
                          sVar40 = (long)top_blob->h * (long)iVar38;
                        }
                        ppvVar42 = (void **)((long)&((Mat *)puVar32)->data +
                                            sVar27 * sVar15 * (long)pMVar10);
                        pvVar23 = top_blob->data;
                        sVar5 = top_blob->elemsize;
                        for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar34;
                            pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                          pvVar47 = pvVar23;
                          for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                              pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              *(float *)((long)pvVar47 + uVar26 * 4) =
                                   *(float *)((long)ppvVar42 + uVar26 * 4) *
                                   *(float *)((long)pvVar47 + uVar26 * 4);
                            }
                            ppvVar42 = (void **)((long)ppvVar42 + lVar28 * 4);
                            pvVar47 = (void *)((long)pvVar47 + (long)iVar38 * sVar5);
                          }
                          pvVar23 = (void *)((long)pvVar23 + sVar40 * sVar5);
                        }
                      }
                    }
                    else if (((bVar37 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,1,uVar30,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      iVar20 = top_blob->w;
                      iVar38 = top_blob->d;
                      uVar49 = top_blob->elemsize;
                      lVar16 = (long)top_blob->h * (long)iVar20;
                      uVar26 = 0;
                      if (0 < (int)uVar9) {
                        uVar26 = (ulong)uVar9;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      iVar67 = top_blob->dims;
                      pMVar10 = (Mat *)(ulong)uVar30;
                      if ((int)uVar30 < 1) {
                        pMVar10 = (Mat *)0x0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = (Mat *)0x0;
                      }
                      puVar32 = (uint *)(top_blob->cstep * uVar49);
                      for (pMVar12 = (Mat *)0x0; pMVar12 != pMVar33;
                          pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
                        iVar25 = (int)lVar16;
                        if (iVar67 != 4) {
                          iVar25 = (int)((uVar49 * lVar16 + 0xf & 0xfffffffffffffff0) / uVar49);
                        }
                        iVar25 = iVar25 * iVar38;
                        if (iVar25 < 1) {
                          iVar25 = 0;
                        }
                        for (lVar45 = 0; iVar25 != (int)lVar45; lVar45 = lVar45 + 1) {
                          *(undefined4 *)((long)pvVar47 + lVar45 * 4) = 0x3f800000;
                        }
                        pvVar48 = (void *)(sVar27 * sVar15 * (long)pMVar12 + (long)pvVar23);
                        pvVar31 = pvVar47;
                        for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar10;
                            pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                          for (uVar8 = 0; uVar8 != uVar22; uVar8 = uVar8 + 1) {
                            for (uVar36 = 0; uVar26 != uVar36; uVar36 = uVar36 + 1) {
                              *(float *)((long)pvVar31 + uVar36 * 4) =
                                   *(float *)((long)pvVar48 + uVar36 * 4) *
                                   *(float *)((long)pvVar31 + uVar36 * 4);
                            }
                            pvVar48 = (void *)((long)pvVar48 + lVar28 * 4);
                          }
                          pvVar31 = (void *)((long)pvVar31 + (long)iVar20 * uVar49);
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    else if (reduce_c == false && (bVar35 == 0 && (bVar19 & 1) == 0)) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar22,uVar4,sVar27,opt->blob_allocator);
                      }
                      else {
                        Mat::create(top_blob,uVar9,uVar22,1,uVar4,sVar27,opt->blob_allocator);
                      }
                      pvVar23 = bottom_blob->data;
                      sVar27 = bottom_blob->elemsize;
                      sVar15 = bottom_blob->cstep;
                      iVar20 = top_blob->w;
                      iVar38 = top_blob->d;
                      uVar49 = top_blob->elemsize;
                      lVar16 = (long)top_blob->h * (long)iVar20;
                      uVar26 = 0;
                      if (0 < (int)uVar9) {
                        uVar26 = (ulong)uVar9;
                      }
                      pvVar47 = top_blob->data;
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      iVar67 = top_blob->dims;
                      if ((int)uVar30 < 1) {
                        uVar30 = 0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = (Mat *)0x0;
                      }
                      puVar32 = (uint *)(top_blob->cstep * uVar49);
                      for (pMVar10 = (Mat *)0x0; pMVar10 != pMVar33;
                          pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        iVar25 = (int)lVar16;
                        if (iVar67 != 4) {
                          iVar25 = (int)((uVar49 * lVar16 + 0xf & 0xfffffffffffffff0) / uVar49);
                        }
                        iVar25 = iVar25 * iVar38;
                        if (iVar25 < 1) {
                          iVar25 = 0;
                        }
                        for (lVar45 = 0; iVar25 != (int)lVar45; lVar45 = lVar45 + 1) {
                          *(undefined4 *)((long)pvVar47 + lVar45 * 4) = 0x3f800000;
                        }
                        pvVar31 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                        for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                          pvVar48 = pvVar47;
                          for (uVar36 = 0; uVar36 != uVar22; uVar36 = uVar36 + 1) {
                            for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                              *(float *)((long)pvVar48 + uVar39 * 4) =
                                   *(float *)((long)pvVar31 + uVar39 * 4) *
                                   *(float *)((long)pvVar48 + uVar39 * 4);
                            }
                            pvVar31 = (void *)((long)pvVar31 + lVar28 * 4);
                            pvVar48 = (void *)((long)pvVar48 + (long)iVar20 * uVar49);
                          }
                        }
                        pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                      }
                    }
                    goto LAB_002f4234;
                  }
                  if (iVar20 == 0) {
                    Mat::create(top_blob,uVar9,uVar30,sVar27,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar9,1,uVar30,1,sVar27,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar32 = (uint *)(ulong)uVar9;
                  Mat::create(&local_c8,uVar9,uVar30,uVar4,sVar27,opt->workspace_allocator);
                  iVar38 = -100;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                     (Mat *)puVar32 != (Mat *)0x0)) {
                    uVar8 = (int)local_c8.cstep * local_c8.c;
                    uVar26 = 0;
                    uVar49 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar49 = uVar26;
                    }
                    for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x3f800000;
                    }
                    pvVar23 = bottom_blob->data;
                    sVar27 = bottom_blob->elemsize;
                    sVar15 = bottom_blob->cstep;
                    pMVar10 = (Mat *)0x0;
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    if ((int)uVar22 < 1) {
                      uVar22 = 0;
                    }
                    pMVar12 = (Mat *)(ulong)uVar30;
                    if ((int)uVar30 < 1) {
                      pMVar12 = pMVar10;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar10;
                    }
                    pMVar34 = (Mat *)local_c8.data;
                    for (; pMVar10 != pMVar33; pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                      pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                      pMVar52 = pMVar34;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar8 = 0; uVar8 != uVar22; uVar8 = uVar8 + 1) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            *(float *)((long)&pMVar52->data + uVar26 * 4) =
                                 *(float *)((long)pvVar47 + uVar26 * 4) *
                                 *(float *)((long)&pMVar52->data + uVar26 * 4);
                          }
                          pvVar47 = (void *)((long)pvVar47 + lVar28 * 4);
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                      }
                      pMVar34 = (Mat *)((long)&pMVar34->data + local_c8.cstep * local_c8.elemsize);
                    }
                    uVar8 = top_blob->c * (int)top_blob->cstep;
                    pvVar23 = top_blob->data;
                    uVar36 = 0;
                    uVar26 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar26 = uVar36;
                    }
                    for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                      *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0x3f800000;
                    }
                    puVar32 = (uint *)(local_c8.cstep * local_c8.elemsize);
                    iVar38 = 0;
                    pMVar10 = (Mat *)local_c8.data;
                    for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                        pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                      pvVar23 = top_blob->data;
                      iVar20 = top_blob->w;
                      sVar27 = top_blob->elemsize;
                      pMVar52 = pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          *(float *)((long)pvVar23 + uVar26 * 4) =
                               *(float *)((long)&pMVar52->data + uVar26 * 4) *
                               *(float *)((long)pvVar23 + uVar26 * 4);
                        }
                        pMVar52 = (Mat *)((long)&pMVar52->data +
                                         (long)local_c8.w * local_c8.elemsize);
                        pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
                      }
                      pMVar10 = (Mat *)((long)&((Mat *)puVar32)->data + (long)&pMVar10->data);
                    }
                  }
                  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
                      puVar32 = (uint *)local_c8.data;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                    }
                  }
                }
              }
            }
          }
        }
        else {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar30,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar30,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar30,uVar4,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            uVar8 = (int)local_c8.cstep * local_c8.c;
            uVar26 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0x3f800000;
            }
            pvVar23 = bottom_blob->data;
            puVar32 = (uint *)0x0;
            pMVar10 = (Mat *)(ulong)uVar50;
            if ((int)uVar50 < 1) {
              pMVar10 = (Mat *)puVar32;
            }
            sVar27 = bottom_blob->elemsize;
            pMVar12 = (Mat *)(ulong)uVar30;
            if ((int)uVar30 < 1) {
              pMVar12 = (Mat *)puVar32;
            }
            if ((int)uVar4 < 1) {
              pMVar33 = (Mat *)puVar32;
            }
            sVar15 = bottom_blob->cstep;
            for (; (Mat *)puVar32 != pMVar33; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1))
            {
              pvVar47 = pvVar23;
              for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                auVar94 = ZEXT816(0x3f800000);
                for (pMVar52 = (Mat *)0x0; pMVar10 != pMVar52;
                    pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  auVar94._0_4_ = auVar94._0_4_ * *(float *)((long)pvVar47 + (long)pMVar52 * 4);
                }
                *(float *)((long)(void **)local_c8.data +
                          (long)pMVar34 * 4 + local_c8.elemsize * local_c8.cstep * (long)puVar32) =
                     auVar94._0_4_;
                pvVar47 = (void *)((long)pvVar47 + (long)(int)uVar50 * 4);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar26 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0x3f800000;
            }
            iVar38 = 0;
            pMVar10 = (Mat *)local_c8.data;
            for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              puVar32 = (uint *)top_blob->data;
              for (pMVar52 = (Mat *)0x0; pMVar12 != pMVar52;
                  pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4) =
                     *(float *)((long)&pMVar10->data + (long)pMVar52 * 4) *
                     *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4);
              }
              pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else {
        if (iVar20 == 0) {
          Mat::create(top_blob,1,sVar27,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,1,sVar27,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar32 = (uint *)pMVar33;
        Mat::create(&local_c8,uVar4,sVar27,opt->workspace_allocator);
        iVar38 = -100;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          pvVar23 = bottom_blob->data;
          sVar27 = bottom_blob->elemsize;
          sVar15 = bottom_blob->cstep;
          puVar32 = (uint *)0x0;
          pMVar10 = (Mat *)(ulong)uVar51;
          if ((int)uVar51 < 1) {
            pMVar10 = (Mat *)puVar32;
          }
          if ((int)uVar4 < 1) {
            pMVar33 = (Mat *)puVar32;
          }
          for (; (Mat *)puVar32 != pMVar33; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
            fVar68 = 1.0;
            for (pMVar12 = (Mat *)0x0; pMVar10 != pMVar12;
                pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
              fVar68 = fVar68 * *(float *)((long)pvVar23 + (long)pMVar12 * 4);
            }
            *(float *)((long)(void **)local_c8.data + (long)puVar32 * 4) = fVar68;
            pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
          }
          fVar68 = 1.0;
          for (pMVar10 = (Mat *)0x0; pMVar33 != pMVar10; pMVar10 = (Mat *)((long)&pMVar10->data + 1)
              ) {
            fVar68 = fVar68 * *(float *)((long)(void **)local_c8.data + (long)pMVar10 * 4);
          }
          *(float *)top_blob->data = fVar68;
          iVar38 = 0;
        }
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f274f;
            puVar32 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    break;
  case 7:
    post_process = (undefined1)this->keepdims;
    auVar73._0_8_ = lVar28 << 0x3f;
    auVar73._8_8_ = lVar16 << 0x3f;
    uVar21 = movmskpd(iVar20,auVar73);
    bVar19 = (byte)uVar21;
    fVar54 = 1.0;
LAB_002e9f25:
    iVar20 = reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
                       (bottom_blob,top_blob,fVar54,(bool)(bVar19 >> 1),(bool)(bVar19 & 1),reduce_d,
                        reduce_c,(bool)post_process,0.0,(int)opt,in_stack_fffffffffffffee8);
    return iVar20;
  case 8:
    auVar75._0_8_ = lVar28 << 0x3f;
    auVar75._8_8_ = lVar16 << 0x3f;
    uVar21 = movmskpd(iVar20,auVar75);
    iVar20 = reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
                       (bottom_blob,top_blob,auVar55._0_4_,(bool)((byte)uVar21 >> 1),
                        (bool)((byte)uVar21 & 1),reduce_d,reduce_c,this->keepdims,opt);
    if (iVar20 != 0) {
      return -100;
    }
    iVar20 = top_blob->dims;
    if (iVar20 == 2) {
      uVar8 = top_blob->h * top_blob->w;
      pvVar23 = top_blob->data;
      uVar49 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar49 = 0;
      }
      for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
        *(float *)((long)pvVar23 + uVar26 * 4) = SQRT(*(float *)((long)pvVar23 + uVar26 * 4));
      }
      return 0;
    }
    if (iVar20 == 1) {
      pvVar23 = top_blob->data;
      uVar49 = (ulong)(uint)top_blob->w;
      if (top_blob->w < 1) {
        uVar49 = 0;
      }
      for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
        *(float *)((long)pvVar23 + uVar26 * 4) = SQRT(*(float *)((long)pvVar23 + uVar26 * 4));
      }
      return 0;
    }
    if (iVar20 - 3U < 2) {
      uVar8 = top_blob->c;
      uVar9 = top_blob->h * top_blob->w * top_blob->d;
      pvVar23 = top_blob->data;
      if (uVar8 != 1) {
        sVar27 = top_blob->elemsize;
        sVar15 = top_blob->cstep;
        uVar49 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar49 = 0;
        }
        uVar26 = (ulong)uVar8;
        if ((int)uVar8 < 1) {
          uVar26 = 0;
        }
        for (uVar36 = 0; uVar36 != uVar26; uVar36 = uVar36 + 1) {
          for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
            *(float *)((long)pvVar23 + uVar39 * 4) = SQRT(*(float *)((long)pvVar23 + uVar39 * 4));
          }
          pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
        }
        return 0;
      }
      uVar49 = (ulong)uVar9;
      if ((int)uVar9 < 1) {
        uVar49 = 0;
      }
      for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
        *(float *)((long)pvVar23 + uVar26 * 4) = SQRT(*(float *)((long)pvVar23 + uVar26 * 4));
      }
      return 0;
    }
    return 0;
  case 9:
    auVar71._0_8_ = lVar28 << 0x3f;
    auVar71._8_8_ = lVar16 << 0x3f;
    uVar21 = movmskpd(iVar20,auVar71);
    pMVar33 = top_blob;
    iVar20 = reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
                       (bottom_blob,top_blob,auVar55._0_4_,(bool)((byte)uVar21 >> 1),
                        (bool)((byte)uVar21 & 1),reduce_d,reduce_c,this->keepdims,opt);
    if (iVar20 != 0) {
      return -100;
    }
    reduction_post_process<ncnn::post_process_log<float>>(top_blob,coeff,(Option *)pMVar33);
    return 0;
  case 10:
    if (3 < uVar8 - 1) goto LAB_002f101e;
    iVar20 = this->keepdims;
    sVar27 = bottom_blob->elemsize;
    switch(uVar8) {
    case 1:
      uVar8 = bottom_blob->w;
      puVar32 = (uint *)0x1;
      Mat::create(top_blob,1,sVar27,opt->blob_allocator);
      pvVar23 = bottom_blob->data;
      uVar26 = 0;
      uVar49 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar49 = uVar26;
      }
      auVar55 = (undefined1  [16])0x0;
      for (; uVar49 != uVar26; uVar26 = uVar26 + 1) {
        fVar54 = expf(*(float *)((long)pvVar23 + uVar26 * 4));
        auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
      }
      *(float *)top_blob->data = auVar55._0_4_;
      goto LAB_002f101e;
    case 2:
      uVar8 = bottom_blob->w;
      pMVar10 = (Mat *)(ulong)uVar8;
      uVar9 = bottom_blob->h;
      pMVar33 = (Mat *)(ulong)uVar9;
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar87._0_8_ = SUB168(auVar69 ^ auVar55,0) << 0x3f;
      auVar87._8_8_ = SUB168(auVar69 ^ auVar55,8) << 0x3f;
      iVar38 = movmskpd(uVar21,auVar87);
      if (iVar38 != 0) {
        if (((bVar19 | (byte)iVar38 >> 1) & 1) == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
            puVar32 = (uint *)pMVar33;
            auVar55 = extraout_XMM0_13;
          }
          else {
            puVar32 = (uint *)0x1;
            Mat::create(top_blob,1,uVar9,sVar27,opt->blob_allocator);
            auVar55 = extraout_XMM0_04;
          }
          pvVar23 = bottom_blob->data;
          iVar20 = bottom_blob->w;
          sVar27 = bottom_blob->elemsize;
          pMVar33 = (Mat *)0x0;
          if ((int)uVar8 < 1) {
            pMVar10 = pMVar33;
          }
          pvVar47 = top_blob->data;
          pMVar12 = (Mat *)(ulong)uVar9;
          if ((int)uVar9 < 1) {
            pMVar12 = pMVar33;
          }
          for (; pMVar33 != pMVar12; pMVar33 = (Mat *)((long)&pMVar33->data + 1)) {
            auVar55 = (undefined1  [16])0x0;
            for (pMVar34 = (Mat *)0x0; pMVar10 != pMVar34;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              fVar54 = expf(*(float *)((long)pvVar23 + (long)pMVar34 * 4));
              auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
            }
            *(float *)((long)pvVar47 + (long)pMVar33 * 4) = auVar55._0_4_;
            pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
          }
        }
        else if (((bVar46 | (byte)iVar38) & 1) == 0) {
          puVar32 = (uint *)pMVar10;
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar8,sVar27,opt->blob_allocator);
            auVar55 = extraout_XMM0_18;
          }
          else {
            Mat::create(top_blob,uVar8,1,sVar27,opt->blob_allocator);
            auVar55 = extraout_XMM0;
          }
          iVar20 = top_blob->c * (int)top_blob->cstep;
          pvVar23 = top_blob->data;
          lVar28 = 0;
          if (iVar20 < 1) {
            iVar20 = 0;
          }
          for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
            *(undefined4 *)((long)pvVar23 + lVar28 * 4) = 0;
          }
          iVar20 = bottom_blob->w;
          sVar27 = bottom_blob->elemsize;
          pMVar12 = (Mat *)0x0;
          if ((int)uVar8 < 1) {
            pMVar10 = pMVar12;
          }
          pvVar47 = bottom_blob->data;
          if ((int)uVar9 < 1) {
            pMVar33 = pMVar12;
          }
          for (; pMVar12 != pMVar33; pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
            for (pMVar34 = (Mat *)0x0; pMVar10 != pMVar34;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              fVar54 = expf(*(float *)((long)pvVar47 + (long)pMVar34 * 4));
              auVar55._0_4_ = fVar54 + *(float *)((long)pvVar23 + (long)pMVar34 * 4);
              auVar55._4_12_ = extraout_var;
              *(float *)((long)pvVar23 + (long)pMVar34 * 4) = auVar55._0_4_;
            }
            pvVar47 = (void *)((long)pvVar47 + (long)iVar20 * sVar27);
          }
        }
        goto LAB_002f101e;
      }
      if (iVar20 == 0) {
        Mat::create(top_blob,1,sVar27,opt->blob_allocator);
      }
      else {
        Mat::create(top_blob,1,1,sVar27,opt->blob_allocator);
      }
      local_c8.cstep = 0;
      local_c8.data = (Mat *)0x0;
      local_c8.refcount._0_4_ = 0;
      local_c8.refcount._4_4_ = 0;
      local_c8.elemsize = 0;
      local_c8.elempack = 0;
      local_c8.allocator = (Allocator *)0x0;
      local_c8.dims = 0;
      local_c8.w = 0;
      local_c8.h = 0;
      local_c8.d = 0;
      local_c8.c = 0;
      puVar32 = (uint *)pMVar33;
      Mat::create(&local_c8,uVar9,sVar27,opt->workspace_allocator);
      pvVar23 = local_c8.data;
      iVar38 = -100;
      auVar55 = extraout_XMM0_09;
      if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
        iVar20 = bottom_blob->w;
        sVar27 = bottom_blob->elemsize;
        pMVar12 = (Mat *)0x0;
        if ((int)uVar8 < 1) {
          pMVar10 = pMVar12;
        }
        pvVar47 = bottom_blob->data;
        if ((int)uVar9 < 1) {
          pMVar33 = pMVar12;
        }
        for (; auVar55 = (undefined1  [16])0x0, pMVar12 != pMVar33;
            pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
          for (pMVar34 = (Mat *)0x0; pMVar10 != pMVar34; pMVar34 = (Mat *)((long)&pMVar34->data + 1)
              ) {
            fVar54 = expf(*(float *)((long)pvVar47 + (long)pMVar34 * 4));
            auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
          }
          *(float *)((long)(void **)pvVar23 + (long)pMVar12 * 4) = auVar55._0_4_;
          pvVar47 = (void *)((long)pvVar47 + (long)iVar20 * sVar27);
        }
        for (pMVar10 = (Mat *)0x0; pMVar33 != pMVar10; pMVar10 = (Mat *)((long)&pMVar10->data + 1))
        {
          auVar55._0_4_ = auVar55._0_4_ + *(float *)((long)(void **)pvVar23 + (long)pMVar10 * 4);
        }
        *(float *)top_blob->data = auVar55._0_4_;
        iVar38 = 0;
      }
      piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f100d;
          puVar32 = (uint *)local_c8.data;
          (*(local_c8.allocator)->_vptr_Allocator[3])();
          auVar55 = extraout_XMM0_10;
        }
      }
      break;
    case 3:
      uVar8 = bottom_blob->w;
      pMVar33 = (Mat *)(long)(int)uVar8;
      uVar9 = bottom_blob->h;
      uVar49 = (ulong)uVar9;
      uVar22 = bottom_blob->c;
      uVar30 = uVar9 * uVar8;
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar81._0_8_ = SUB168(auVar69 ^ auVar55,0) << 0x3f;
      auVar81._8_8_ = SUB168(auVar69 ^ auVar55,8) << 0x3f;
      iVar38 = movmskpd(uVar24,auVar81);
      bVar35 = reduce_c ^ 1;
      if ((iVar38 != 0) || (bVar35 != 0)) {
        if (iVar38 == 0 && reduce_c == false) {
          if (iVar20 == 0) {
            puVar32 = (uint *)(ulong)uVar22;
            Mat::create(top_blob,uVar22,sVar27,opt->blob_allocator);
            auVar55 = extraout_XMM0_11;
          }
          else {
            puVar32 = (uint *)0x1;
            Mat::create(top_blob,1,1,uVar22,sVar27,opt->blob_allocator);
            auVar55 = extraout_XMM0_02;
          }
          pvVar23 = bottom_blob->data;
          sVar27 = bottom_blob->elemsize;
          pvVar47 = top_blob->data;
          sVar15 = top_blob->elemsize;
          sVar40 = top_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar49 = uVar26;
          }
          uVar36 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar36 = uVar26;
          }
          sVar5 = bottom_blob->cstep;
          for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
            auVar55 = (undefined1  [16])0x0;
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar54 = expf(*(float *)((long)pvVar23 + uVar39 * 4));
              auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
            }
            lVar28 = sVar15 * sVar40 * uVar26;
            if (iVar20 == 0) {
              lVar28 = uVar26 * 4;
            }
            *(float *)((long)pvVar47 + lVar28) = auVar55._0_4_;
            pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar5);
          }
          goto LAB_002f101e;
        }
        bVar41 = (byte)iVar38 >> 1 | bVar19;
        if ((bVar41 & 1) == 0 && bVar35 == 0) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,uVar9,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar9,uVar22,sVar27,opt->workspace_allocator);
          pvVar23 = local_c8.data;
          iVar38 = -100;
          auVar55 = extraout_XMM0_14;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            iVar20 = (int)local_c8.cstep * local_c8.c;
            lVar28 = 0;
            if (iVar20 < 1) {
              iVar20 = 0;
            }
            for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + lVar28 * 4) = 0;
            }
            lVar28 = local_c8.elemsize * local_c8.cstep;
            uVar26 = 0;
            uVar36 = 0;
            if (0 < (int)uVar8) {
              uVar36 = (ulong)uVar8;
            }
            pvVar47 = bottom_blob->data;
            if ((int)uVar9 < 1) {
              uVar49 = uVar26;
            }
            sVar27 = bottom_blob->elemsize;
            uVar39 = (ulong)uVar22;
            if ((int)uVar22 < 1) {
              uVar39 = uVar26;
            }
            sVar15 = bottom_blob->cstep;
            for (; uVar26 != uVar39; uVar26 = uVar26 + 1) {
              pvVar31 = pvVar47;
              for (uVar29 = 0; uVar29 != uVar49; uVar29 = uVar29 + 1) {
                auVar55 = (undefined1  [16])0x0;
                for (uVar44 = 0; uVar36 != uVar44; uVar44 = uVar44 + 1) {
                  fVar54 = expf(*(float *)((long)pvVar31 + uVar44 * 4));
                  auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
                }
                *(float *)((long)(void **)pvVar23 + uVar29 * 4 + lVar28 * uVar26) = auVar55._0_4_;
                pvVar31 = (void *)((long)pvVar31 + (long)pMVar33 * 4);
              }
              pvVar47 = (void *)((long)pvVar47 + sVar27 * sVar15);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar36 = 0;
            uVar26 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar26 = uVar36;
            }
            for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0;
            }
            iVar38 = 0;
            pMVar33 = (Mat *)local_c8.data;
            for (uVar26 = 0; uVar26 != uVar39; uVar26 = uVar26 + 1) {
              puVar32 = (uint *)top_blob->data;
              for (uVar36 = 0; uVar49 != uVar36; uVar36 = uVar36 + 1) {
                fVar54 = *(float *)((long)&pMVar33->data + uVar36 * 4) +
                         *(float *)((long)&((Mat *)puVar32)->data + uVar36 * 4);
                auVar55 = ZEXT416((uint)fVar54);
                *(float *)((long)&((Mat *)puVar32)->data + uVar36 * 4) = fVar54;
              }
              pMVar33 = (Mat *)((long)&pMVar33->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) {
LAB_002f100d:
                puVar32 = (uint *)local_c8.data;
                free(local_c8.data);
                auVar55 = extraout_XMM0_34;
              }
              else {
                puVar32 = (uint *)local_c8.data;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
                auVar55 = extraout_XMM0_15;
              }
            }
          }
        }
        else {
          bVar43 = (byte)iVar38 | bVar46;
          if ((bVar43 & 1) != 0 || bVar35 != 0) {
            if ((bVar41 & 1) == 0 && reduce_c == false) {
              if (iVar20 == 0) {
                puVar32 = (uint *)(ulong)uVar9;
                Mat::create(top_blob,uVar9,uVar22,sVar27,opt->blob_allocator);
                auVar55 = extraout_XMM0_26;
              }
              else {
                puVar32 = (uint *)0x1;
                Mat::create(top_blob,1,uVar9,uVar22,sVar27,opt->blob_allocator);
                auVar55 = extraout_XMM0_19;
              }
              uVar26 = 0;
              uVar36 = 0;
              if (0 < (int)uVar8) {
                uVar36 = (ulong)uVar8;
              }
              if ((int)uVar9 < 1) {
                uVar49 = uVar26;
              }
              uVar39 = (ulong)uVar22;
              if ((int)uVar22 < 1) {
                uVar39 = uVar26;
              }
              sVar27 = bottom_blob->elemsize;
              if (iVar20 == 0) {
                sVar15 = (size_t)top_blob->w;
              }
              else {
                sVar15 = top_blob->cstep;
              }
              pvVar23 = bottom_blob->data;
              sVar40 = top_blob->elemsize;
              pvVar47 = top_blob->data;
              sVar5 = bottom_blob->cstep;
              for (; uVar26 != uVar39; uVar26 = uVar26 + 1) {
                pvVar31 = pvVar23;
                for (uVar29 = 0; uVar29 != uVar49; uVar29 = uVar29 + 1) {
                  auVar55 = (undefined1  [16])0x0;
                  for (uVar44 = 0; uVar36 != uVar44; uVar44 = uVar44 + 1) {
                    fVar54 = expf(*(float *)((long)pvVar31 + uVar44 * 4));
                    auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
                  }
                  *(float *)((long)pvVar47 + uVar29 * 4 + sVar15 * sVar40 * uVar26) = auVar55._0_4_;
                  pvVar31 = (void *)((long)pvVar31 + (long)pMVar33 * 4);
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar5);
              }
            }
            else if (((bVar19 | bVar46) & 1) == 0 && bVar35 == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar8,uVar9,sVar27,opt->blob_allocator);
                puVar32 = (uint *)pMVar33;
                auVar55 = extraout_XMM0_29;
              }
              else {
                Mat::create(top_blob,uVar8,uVar9,1,sVar27,opt->blob_allocator);
                puVar32 = (uint *)pMVar33;
                auVar55 = extraout_XMM0_24;
              }
              uVar8 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              uVar26 = 0;
              uVar49 = (ulong)uVar8;
              if ((int)uVar8 < 1) {
                uVar49 = uVar26;
              }
              for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0;
              }
              sVar27 = bottom_blob->elemsize;
              sVar15 = bottom_blob->cstep;
              uVar26 = 0;
              uVar49 = (ulong)uVar30;
              if ((int)uVar30 < 1) {
                uVar49 = uVar26;
              }
              pvVar23 = bottom_blob->data;
              uVar36 = (ulong)uVar22;
              if ((int)uVar22 < 1) {
                uVar36 = uVar26;
              }
              for (; uVar26 != uVar36; uVar26 = uVar26 + 1) {
                pvVar47 = top_blob->data;
                for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
                  fVar54 = expf(*(float *)((long)pvVar23 + uVar39 * 4));
                  auVar55._0_4_ = fVar54 + *(float *)((long)pvVar47 + uVar39 * 4);
                  auVar55._4_12_ = extraout_var_03;
                  *(float *)((long)pvVar47 + uVar39 * 4) = auVar55._0_4_;
                }
                pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              }
            }
            else {
              puVar32 = (uint *)pMVar33;
              if (reduce_c == false && (bVar43 & 1) == 0) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar8,uVar22,sVar27,opt->blob_allocator);
                  auVar55 = extraout_XMM0_31;
                }
                else {
                  Mat::create(top_blob,uVar8,1,uVar22,sVar27,opt->blob_allocator);
                  auVar55 = extraout_XMM0_00;
                }
                uVar30 = top_blob->c * (int)top_blob->cstep;
                pvVar23 = top_blob->data;
                uVar26 = 0;
                uVar49 = (ulong)uVar30;
                if ((int)uVar30 < 1) {
                  uVar49 = uVar26;
                }
                for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                  *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0;
                }
                uVar49 = 0;
                uVar26 = 0;
                if (0 < (int)uVar8) {
                  uVar26 = (ulong)uVar8;
                }
                if ((int)uVar9 < 1) {
                  uVar9 = 0;
                }
                uVar36 = (ulong)uVar22;
                if ((int)uVar22 < 1) {
                  uVar36 = uVar49;
                }
                sVar27 = bottom_blob->elemsize;
                if (iVar20 == 0) {
                  sVar15 = (size_t)top_blob->w;
                }
                else {
                  sVar15 = top_blob->cstep;
                }
                pvVar23 = bottom_blob->data;
                puVar32 = (uint *)(sVar15 * top_blob->elemsize);
                pvVar47 = top_blob->data;
                sVar15 = bottom_blob->cstep;
                for (; uVar49 != uVar36; uVar49 = uVar49 + 1) {
                  pvVar31 = pvVar23;
                  for (uVar8 = 0; uVar8 != uVar9; uVar8 = uVar8 + 1) {
                    for (uVar39 = 0; uVar26 != uVar39; uVar39 = uVar39 + 1) {
                      fVar54 = expf(*(float *)((long)pvVar31 + uVar39 * 4));
                      auVar55._0_4_ = fVar54 + *(float *)((long)pvVar47 + uVar39 * 4);
                      auVar55._4_12_ = extraout_var_04;
                      *(float *)((long)pvVar47 + uVar39 * 4) = auVar55._0_4_;
                    }
                    pvVar31 = (void *)((long)pvVar31 + (long)pMVar33 * 4);
                  }
                  pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
                  pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
                }
              }
            }
            goto LAB_002f101e;
          }
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar8,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,uVar8,1,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)(ulong)uVar8;
          Mat::create(&local_c8,uVar8,1,uVar22,sVar27,opt->workspace_allocator);
          iVar38 = -100;
          auVar55 = extraout_XMM0_20;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            iVar20 = (int)local_c8.cstep * local_c8.c;
            lVar28 = 0;
            if (iVar20 < 1) {
              iVar20 = 0;
            }
            for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + lVar28 * 4) = 0;
            }
            pvVar23 = bottom_blob->data;
            sVar27 = bottom_blob->elemsize;
            uVar26 = 0;
            uVar36 = 0;
            if (0 < (int)uVar8) {
              uVar36 = (ulong)uVar8;
            }
            if ((int)uVar9 < 1) {
              uVar49 = uVar26;
            }
            uVar39 = (ulong)uVar22;
            if ((int)uVar22 < 1) {
              uVar39 = uVar26;
            }
            sVar15 = bottom_blob->cstep;
            puVar32 = (uint *)((long)pMVar33 * 4);
            lVar28 = local_c8.elemsize * local_c8.cstep;
            pMVar33 = (Mat *)local_c8.data;
            for (; uVar26 != uVar39; uVar26 = uVar26 + 1) {
              pvVar47 = pvVar23;
              for (iVar20 = 0; iVar20 != (int)uVar49; iVar20 = iVar20 + 1) {
                for (uVar29 = 0; uVar36 != uVar29; uVar29 = uVar29 + 1) {
                  fVar54 = expf(*(float *)((long)pvVar47 + uVar29 * 4));
                  auVar55._0_4_ = fVar54 + *(float *)((long)&pMVar33->data + uVar29 * 4);
                  auVar55._4_12_ = extraout_var_00;
                  *(float *)((long)&pMVar33->data + uVar29 * 4) = auVar55._0_4_;
                }
                pvVar47 = (void *)((long)&((Mat *)puVar32)->data + (long)pvVar47);
              }
              pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
              pMVar33 = (Mat *)((long)&pMVar33->data + lVar28);
            }
            uVar8 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            uVar26 = 0;
            uVar49 = (ulong)uVar8;
            if ((int)uVar8 < 1) {
              uVar49 = uVar26;
            }
            for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
              *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0;
            }
            iVar38 = 0;
            pMVar33 = (Mat *)local_c8.data;
            for (uVar49 = 0; uVar49 != uVar39; uVar49 = uVar49 + 1) {
              puVar32 = (uint *)top_blob->data;
              for (uVar26 = 0; uVar36 != uVar26; uVar26 = uVar26 + 1) {
                fVar54 = *(float *)((long)&pMVar33->data + uVar26 * 4) +
                         *(float *)((long)&((Mat *)puVar32)->data + uVar26 * 4);
                auVar55 = ZEXT416((uint)fVar54);
                *(float *)((long)&((Mat *)puVar32)->data + uVar26 * 4) = fVar54;
              }
              pMVar33 = (Mat *)((long)&pMVar33->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f100d;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
              auVar55 = extraout_XMM0_21;
            }
          }
        }
      }
      else {
        if (iVar20 == 0) {
          Mat::create(top_blob,1,sVar27,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,sVar27,opt->blob_allocator);
        }
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar32 = (uint *)(ulong)uVar22;
        Mat::create(&local_c8,uVar22,sVar27,opt->workspace_allocator);
        pvVar23 = local_c8.data;
        iVar38 = -100;
        auVar55 = extraout_XMM0_05;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          sVar27 = bottom_blob->elemsize;
          sVar15 = bottom_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar30;
          if ((int)uVar30 < 1) {
            uVar49 = uVar26;
          }
          pvVar47 = bottom_blob->data;
          uVar36 = (ulong)uVar22;
          if ((int)uVar22 < 1) {
            uVar36 = uVar26;
          }
          for (; auVar55 = (undefined1  [16])0x0, uVar26 != uVar36; uVar26 = uVar26 + 1) {
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar54 = expf(*(float *)((long)pvVar47 + uVar39 * 4));
              auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
            }
            *(float *)((long)(void **)pvVar23 + uVar26 * 4) = auVar55._0_4_;
            pvVar47 = (void *)((long)pvVar47 + sVar27 * sVar15);
          }
          for (uVar49 = 0; uVar36 != uVar49; uVar49 = uVar49 + 1) {
            auVar55._0_4_ = auVar55._0_4_ + *(float *)((long)(void **)local_c8.data + uVar49 * 4);
          }
          *(float *)top_blob->data = auVar55._0_4_;
          iVar38 = 0;
        }
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f100d;
            puVar32 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
            auVar55 = extraout_XMM0_06;
          }
        }
      }
      break;
    case 4:
      uVar9 = bottom_blob->w;
      pMVar34 = (Mat *)(long)(int)uVar9;
      uVar22 = bottom_blob->h;
      pMVar12 = (Mat *)(ulong)uVar22;
      uVar30 = bottom_blob->d;
      pMVar10 = (Mat *)(ulong)uVar30;
      uVar4 = bottom_blob->c;
      pMVar33 = (Mat *)(ulong)uVar4;
      uVar50 = uVar22 * uVar9;
      uVar51 = uVar50 * uVar30;
      auVar55._8_4_ = 0xffffffff;
      auVar55._0_8_ = 0xffffffffffffffff;
      auVar55._12_4_ = 0xffffffff;
      auVar85._0_8_ = SUB168(auVar69 ^ auVar55,0) << 0x3f;
      auVar85._8_8_ = SUB168(auVar69 ^ auVar55,8) << 0x3f;
      iVar38 = movmskpd((&switchD_002ea06f::switchdataD_004f4c7c)[uVar8 - 1] + 0x4f4c7c,auVar85);
      bVar53 = iVar38 != 0;
      bVar35 = reduce_d ^ 1;
      bVar41 = reduce_c ^ 1;
      if ((bVar53 || bVar35 != 0) || (bVar41 != 0)) {
        if ((!bVar53 && bVar35 == 0) && reduce_c == false) {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar4,sVar27,opt->blob_allocator);
            auVar55 = extraout_XMM0_12;
          }
          else {
            pMVar33 = (Mat *)0x1;
            Mat::create(top_blob,1,1,1,uVar4,sVar27,opt->blob_allocator);
            auVar55 = extraout_XMM0_03;
          }
          pvVar23 = bottom_blob->data;
          sVar27 = bottom_blob->elemsize;
          pvVar47 = top_blob->data;
          sVar15 = top_blob->elemsize;
          sVar40 = top_blob->cstep;
          uVar26 = 0;
          uVar49 = (ulong)uVar51;
          if ((int)uVar51 < 1) {
            uVar49 = uVar26;
          }
          uVar36 = (ulong)uVar4;
          if ((int)uVar4 < 1) {
            uVar36 = uVar26;
          }
          sVar5 = bottom_blob->cstep;
          for (; puVar32 = (uint *)pMVar33, uVar26 != uVar36; uVar26 = uVar26 + 1) {
            auVar55 = (undefined1  [16])0x0;
            for (uVar39 = 0; uVar49 != uVar39; uVar39 = uVar39 + 1) {
              fVar54 = expf(*(float *)((long)pvVar23 + uVar39 * 4));
              auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
            }
            lVar28 = sVar15 * sVar40 * uVar26;
            if (iVar20 == 0) {
              lVar28 = uVar26 * 4;
            }
            *(float *)((long)pvVar47 + lVar28) = auVar55._0_4_;
            pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar5);
          }
          goto LAB_002f101e;
        }
        if ((bVar53 || reduce_d != false) || bVar41 != 0) {
          bVar43 = (byte)iVar38 >> 1 | bVar19;
          if (((bVar43 & 1) == 0 && bVar35 == 0) && bVar41 == 0) {
            if (iVar20 == 0) {
              Mat::create(top_blob,uVar22,sVar27,opt->blob_allocator);
            }
            else {
              Mat::create(top_blob,1,uVar22,1,1,sVar27,opt->blob_allocator);
            }
            local_c8.cstep = 0;
            local_c8.data = (Mat *)0x0;
            local_c8.refcount._0_4_ = 0;
            local_c8.refcount._4_4_ = 0;
            local_c8.elemsize = 0;
            local_c8.elempack = 0;
            local_c8.allocator = (Allocator *)0x0;
            local_c8.dims = 0;
            local_c8.w = 0;
            local_c8.h = 0;
            local_c8.d = 0;
            local_c8.c = 0;
            puVar32 = (uint *)0x1;
            Mat::create(&local_c8,1,uVar22,uVar4,sVar27,opt->workspace_allocator);
            iVar38 = -100;
            auVar55 = extraout_XMM0_22;
            if (((Mat *)local_c8.data != (Mat *)0x0) &&
               (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0)
               ) {
              iVar20 = (int)local_c8.cstep * local_c8.c;
              lVar28 = 0;
              if (iVar20 < 1) {
                iVar20 = 0;
              }
              for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
                *(undefined4 *)((long)(void **)local_c8.data + lVar28 * 4) = 0;
              }
              sVar27 = bottom_blob->elemsize;
              sVar15 = bottom_blob->cstep;
              lVar28 = local_c8.elemsize * local_c8.cstep;
              pMVar10 = (Mat *)0x0;
              uVar49 = 0;
              if (0 < (int)uVar9) {
                uVar49 = (ulong)uVar9;
              }
              pvVar23 = bottom_blob->data;
              if ((int)uVar22 < 1) {
                pMVar12 = pMVar10;
              }
              local_80 = (Mat *)local_c8.data;
              if ((int)uVar30 < 1) {
                uVar30 = 0;
              }
              if ((int)uVar4 < 1) {
                pMVar33 = (Mat *)0x0;
              }
              for (; pMVar52 = local_80, pMVar10 != pMVar33;
                  pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar10 + (long)pvVar23);
                lVar16 = lVar28 * (long)pMVar10;
                for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                  for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                      pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                    for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                      fVar54 = expf(*(float *)((long)pvVar47 + uVar26 * 4));
                      auVar55._0_4_ =
                           fVar54 + *(float *)((long)&pMVar52->data + (long)pMVar13 * 4 + lVar16);
                      auVar55._4_12_ = extraout_var_01;
                      *(float *)((long)&pMVar52->data + (long)pMVar13 * 4 + lVar16) = auVar55._0_4_;
                    }
                    pvVar47 = (void *)((long)pvVar47 + (long)pMVar34 * 4);
                  }
                }
              }
              iVar20 = top_blob->c * (int)top_blob->cstep;
              pvVar23 = top_blob->data;
              lVar28 = 0;
              if (iVar20 < 1) {
                iVar20 = 0;
              }
              for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
                *(undefined4 *)((long)pvVar23 + lVar28 * 4) = 0;
              }
              pMVar10 = (Mat *)local_c8.data;
              for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                puVar32 = (uint *)top_blob->data;
                for (pMVar52 = (Mat *)0x0; pMVar12 != pMVar52;
                    pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  fVar54 = *(float *)((long)&pMVar10->data + (long)pMVar52 * 4) +
                           *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4);
                  auVar55 = ZEXT416((uint)fVar54);
                  *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4) = fVar54;
                }
                pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
              }
              iVar38 = 0;
            }
            piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
            if (piVar6 != (int *)0x0) {
              LOCK();
              *piVar6 = *piVar6 + -1;
              UNLOCK();
              if (*piVar6 == 0) {
                if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f100d;
                puVar32 = (uint *)local_c8.data;
                (*(local_c8.allocator)->_vptr_Allocator[3])();
                auVar55 = extraout_XMM0_23;
              }
            }
          }
          else {
            bVar37 = (byte)iVar38 | bVar46;
            if (((bVar37 & 1) == 0 && bVar35 == 0) && bVar41 == 0) {
              if (iVar20 == 0) {
                Mat::create(top_blob,uVar9,sVar27,opt->blob_allocator);
              }
              else {
                Mat::create(top_blob,uVar9,1,1,1,sVar27,opt->blob_allocator);
              }
              local_c8.cstep = 0;
              local_c8.data = (Mat *)0x0;
              local_c8.refcount._0_4_ = 0;
              local_c8.refcount._4_4_ = 0;
              local_c8.elemsize = 0;
              local_c8.elempack = 0;
              local_c8.allocator = (Allocator *)0x0;
              local_c8.dims = 0;
              local_c8.w = 0;
              local_c8.h = 0;
              local_c8.d = 0;
              local_c8.c = 0;
              puVar32 = (uint *)(ulong)uVar9;
              Mat::create(&local_c8,uVar9,1,uVar4,sVar27,opt->workspace_allocator);
              iVar38 = -100;
              auVar55 = extraout_XMM0_27;
              if (((Mat *)local_c8.data != (Mat *)0x0) &&
                 (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                 (Mat *)puVar32 != (Mat *)0x0)) {
                uVar8 = (int)local_c8.cstep * local_c8.c;
                uVar26 = 0;
                uVar49 = (ulong)uVar8;
                if ((int)uVar8 < 1) {
                  uVar49 = uVar26;
                }
                for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                  *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0;
                }
                sVar27 = bottom_blob->elemsize;
                sVar15 = bottom_blob->cstep;
                pMVar52 = (Mat *)0x0;
                uVar49 = 0;
                if (0 < (int)uVar9) {
                  uVar49 = (ulong)uVar9;
                }
                if ((int)uVar22 < 1) {
                  pMVar12 = pMVar52;
                }
                pvVar23 = bottom_blob->data;
                if ((int)uVar30 < 1) {
                  pMVar10 = pMVar52;
                }
                if ((int)uVar4 < 1) {
                  pMVar33 = pMVar52;
                }
                lVar28 = local_c8.elemsize * local_c8.cstep;
                pMVar13 = (Mat *)local_c8.data;
                for (; pMVar52 != pMVar33; pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  pvVar47 = (void *)(sVar27 * sVar15 * (long)pMVar52 + (long)pvVar23);
                  for (iVar20 = 0; iVar20 != (int)pMVar10; iVar20 = iVar20 + 1) {
                    for (iVar38 = 0; local_e0 = (int)pMVar12, iVar38 != local_e0;
                        iVar38 = iVar38 + 1) {
                      for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                        fVar54 = expf(*(float *)((long)pvVar47 + uVar26 * 4));
                        auVar55._0_4_ = fVar54 + *(float *)((long)&pMVar13->data + uVar26 * 4);
                        auVar55._4_12_ = extraout_var_02;
                        *(float *)((long)&pMVar13->data + uVar26 * 4) = auVar55._0_4_;
                      }
                      pvVar47 = (void *)((long)pvVar47 + (long)pMVar34 * 4);
                    }
                  }
                  pMVar13 = (Mat *)((long)&pMVar13->data + lVar28);
                }
                iVar20 = top_blob->c * (int)top_blob->cstep;
                pvVar23 = top_blob->data;
                lVar28 = 0;
                if (iVar20 < 1) {
                  iVar20 = 0;
                }
                for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
                  *(undefined4 *)((long)pvVar23 + lVar28 * 4) = 0;
                }
                pMVar10 = (Mat *)local_c8.data;
                for (pMVar12 = (Mat *)0x0; pMVar12 != pMVar33;
                    pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
                  puVar32 = (uint *)top_blob->data;
                  for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                    fVar54 = *(float *)((long)&pMVar10->data + uVar26 * 4) +
                             *(float *)((long)&((Mat *)puVar32)->data + uVar26 * 4);
                    auVar55 = ZEXT416((uint)fVar54);
                    *(float *)((long)&((Mat *)puVar32)->data + uVar26 * 4) = fVar54;
                  }
                  pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
                }
                iVar38 = 0;
              }
              piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
              if (piVar6 != (int *)0x0) {
                LOCK();
                *piVar6 = *piVar6 + -1;
                UNLOCK();
                if (*piVar6 == 0) {
                  if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f100d;
                  puVar32 = (uint *)local_c8.data;
                  (*(local_c8.allocator)->_vptr_Allocator[3])();
                  auVar55 = extraout_XMM0_28;
                }
              }
            }
            else {
              if ((!bVar53 && reduce_d == false) && reduce_c == false) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar30,uVar4,sVar27,opt->blob_allocator);
                  auVar55 = extraout_XMM0_30;
                }
                else {
                  pMVar10 = (Mat *)0x1;
                  Mat::create(top_blob,1,1,uVar30,uVar4,sVar27,opt->blob_allocator);
                  auVar55 = extraout_XMM0_25;
                }
                uVar49 = 0;
                if (0 < (int)uVar50) {
                  uVar49 = (ulong)uVar50;
                }
                if ((int)uVar30 < 1) {
                  uVar30 = 0;
                }
                uVar26 = (ulong)uVar4;
                if ((int)uVar4 < 1) {
                  uVar26 = 0;
                }
                sVar27 = bottom_blob->elemsize;
                if (iVar20 == 0) {
                  sVar15 = (size_t)top_blob->w;
                }
                else {
                  sVar15 = top_blob->cstep;
                }
                pvVar23 = bottom_blob->data;
                sVar40 = top_blob->elemsize;
                local_80 = (Mat *)top_blob->data;
                sVar5 = bottom_blob->cstep;
                for (uVar36 = 0; pMVar33 = local_80, puVar32 = (uint *)pMVar10, uVar36 != uVar26;
                    uVar36 = uVar36 + 1) {
                  pvVar47 = pvVar23;
                  for (uVar39 = 0; uVar39 != uVar30; uVar39 = uVar39 + 1) {
                    auVar55 = (undefined1  [16])0x0;
                    for (uVar29 = 0; uVar49 != uVar29; uVar29 = uVar29 + 1) {
                      fVar54 = expf(*(float *)((long)pvVar47 + uVar29 * 4));
                      auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
                    }
                    *(float *)((long)&pMVar33->data + uVar39 * 4 + sVar15 * sVar40 * uVar36) =
                         auVar55._0_4_;
                    pvVar47 = (void *)((long)pvVar47 + (long)(int)uVar50 * 4);
                  }
                  pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar5);
                }
                goto LAB_002f101e;
              }
              if (((bVar43 & 1) == 0 && reduce_d == false) && bVar41 == 0) {
                if (iVar20 == 0) {
                  Mat::create(top_blob,uVar22,uVar30,sVar27,opt->blob_allocator);
                }
                else {
                  Mat::create(top_blob,1,uVar22,uVar30,1,sVar27,opt->blob_allocator);
                }
                local_c8.cstep = 0;
                local_c8.data = (Mat *)0x0;
                local_c8.refcount._0_4_ = 0;
                local_c8.refcount._4_4_ = 0;
                local_c8.elemsize = 0;
                local_c8.elempack = 0;
                local_c8.allocator = (Allocator *)0x0;
                local_c8.dims = 0;
                local_c8.w = 0;
                local_c8.h = 0;
                local_c8.d = 0;
                local_c8.c = 0;
                puVar32 = (uint *)pMVar12;
                Mat::create(&local_c8,uVar22,uVar30,uVar4,sVar27,opt->workspace_allocator);
                iVar38 = -100;
                auVar55 = extraout_XMM0_32;
                if (((Mat *)local_c8.data != (Mat *)0x0) &&
                   (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                   (Mat *)puVar32 != (Mat *)0x0)) {
                  uVar8 = (int)local_c8.cstep * local_c8.c;
                  uVar26 = 0;
                  uVar49 = (ulong)uVar8;
                  if ((int)uVar8 < 1) {
                    uVar49 = uVar26;
                  }
                  for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                    *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0;
                  }
                  local_80 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                  local_78 = (Mat *)(local_c8.cstep * local_c8.elemsize);
                  lVar28 = (long)local_c8.w * local_c8.elemsize;
                  pMVar52 = (Mat *)0x0;
                  uVar49 = 0;
                  if (0 < (int)uVar9) {
                    uVar49 = (ulong)uVar9;
                  }
                  local_70 = bottom_blob->data;
                  if ((int)uVar22 < 1) {
                    pMVar12 = pMVar52;
                  }
                  local_60 = (Mat *)local_c8.data;
                  if ((int)uVar30 < 1) {
                    pMVar10 = pMVar52;
                  }
                  if ((int)uVar4 < 1) {
                    pMVar33 = pMVar52;
                  }
                  for (; pMVar13 = local_60, pMVar52 != pMVar33;
                      pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                    pvVar23 = (void *)((long)local_80 * (long)pMVar52 + (long)local_70);
                    lVar16 = (long)local_78 * (long)pMVar52;
                    for (pMVar11 = (Mat *)0x0; pMVar11 != pMVar10;
                        pMVar11 = (Mat *)((long)&pMVar11->data + 1)) {
                      lVar45 = lVar28 * (long)pMVar11 + lVar16;
                      for (pMVar14 = (Mat *)0x0; pMVar14 != pMVar12;
                          pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar54 = expf(*(float *)((long)pvVar23 + uVar26 * 4));
                          auVar55._0_4_ =
                               fVar54 + *(float *)((long)&pMVar13->data + (long)pMVar14 * 4 + lVar45
                                                  );
                          auVar55._4_12_ = extraout_var_05;
                          *(float *)((long)&pMVar13->data + (long)pMVar14 * 4 + lVar45) =
                               auVar55._0_4_;
                        }
                        pvVar23 = (void *)((long)pvVar23 + (long)pMVar34 * 4);
                      }
                    }
                  }
                  uVar8 = top_blob->c * (int)top_blob->cstep;
                  pvVar23 = top_blob->data;
                  uVar26 = 0;
                  uVar49 = (ulong)uVar8;
                  if ((int)uVar8 < 1) {
                    uVar49 = uVar26;
                  }
                  for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                    *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0;
                  }
                  puVar32 = (uint *)0x1;
                  pMVar34 = (Mat *)local_c8.data;
                  for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar33;
                      pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                    iVar38 = 1;
                    if (iVar20 != 0) {
                      iVar38 = top_blob->h;
                    }
                    iVar67 = top_blob->w;
                    sVar27 = top_blob->elemsize;
                    pvVar23 = top_blob->data;
                    pMVar13 = pMVar34;
                    for (pMVar11 = (Mat *)0x0; pMVar11 != pMVar10;
                        pMVar11 = (Mat *)((long)&pMVar11->data + 1)) {
                      for (pMVar14 = (Mat *)0x0; pMVar12 != pMVar14;
                          pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
                        fVar54 = *(float *)((long)&pMVar13->data + (long)pMVar14 * 4) +
                                 *(float *)((long)pvVar23 + (long)pMVar14 * 4);
                        auVar55 = ZEXT416((uint)fVar54);
                        *(float *)((long)pvVar23 + (long)pMVar14 * 4) = fVar54;
                      }
                      pMVar13 = (Mat *)((long)&pMVar13->data + (long)local_c8.w * local_c8.elemsize)
                      ;
                      pvVar23 = (void *)((long)pvVar23 + (long)iVar38 * sVar27 * (long)iVar67);
                    }
                    pMVar34 = (Mat *)((long)&pMVar34->data + local_c8.cstep * local_c8.elemsize);
                  }
                  iVar38 = 0;
                }
                piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                if (piVar6 != (int *)0x0) {
                  LOCK();
                  *piVar6 = *piVar6 + -1;
                  UNLOCK();
                  if (*piVar6 == 0) {
                    if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f100d;
                    puVar32 = (uint *)local_c8.data;
                    (*(local_c8.allocator)->_vptr_Allocator[3])();
                    auVar55 = extraout_XMM0_33;
                  }
                }
              }
              else {
                bVar19 = bVar19 | bVar46;
                if ((bVar35 == 0 && (bVar19 & 1) == 0) && bVar41 == 0) {
                  if (iVar20 == 0) {
                    Mat::create(top_blob,uVar9,uVar22,sVar27,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar9,uVar22,1,1,sVar27,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  puVar32 = (uint *)(ulong)uVar9;
                  Mat::create(&local_c8,uVar9,uVar22,uVar4,sVar27,opt->workspace_allocator);
                  iVar38 = -100;
                  auVar55 = extraout_XMM0_36;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                     (Mat *)puVar32 != (Mat *)0x0)) {
                    uVar8 = (int)local_c8.cstep * local_c8.c;
                    uVar26 = 0;
                    uVar49 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar49 = uVar26;
                    }
                    for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0;
                    }
                    pvVar23 = bottom_blob->data;
                    local_80 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar52 = (Mat *)0x0;
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    if ((int)uVar22 < 1) {
                      pMVar12 = pMVar52;
                    }
                    local_f8 = (Mat *)local_c8.data;
                    if ((int)uVar30 < 1) {
                      pMVar10 = pMVar52;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar52;
                    }
                    local_78 = (Mat *)(local_c8.cstep * local_c8.elemsize);
                    lVar28 = (long)local_c8.w * local_c8.elemsize;
                    for (; pMVar52 != pMVar33; pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                      pvVar47 = (void *)((long)local_80 * (long)pMVar52 + (long)pvVar23);
                      for (iVar20 = 0; iVar20 != (int)pMVar10; iVar20 = iVar20 + 1) {
                        pMVar13 = local_f8;
                        for (pMVar11 = (Mat *)0x0; pMVar11 != pMVar12;
                            pMVar11 = (Mat *)((long)&pMVar11->data + 1)) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar54 = expf(*(float *)((long)pvVar47 + uVar26 * 4));
                            auVar55._0_4_ = fVar54 + *(float *)((long)&pMVar13->data + uVar26 * 4);
                            auVar55._4_12_ = extraout_var_06;
                            *(float *)((long)&pMVar13->data + uVar26 * 4) = auVar55._0_4_;
                          }
                          pvVar47 = (void *)((long)pvVar47 + (long)pMVar34 * 4);
                          pMVar13 = (Mat *)((long)&pMVar13->data + lVar28);
                        }
                      }
                      local_f8 = (Mat *)((long)&local_78->data + (long)&local_f8->data);
                    }
                    uVar8 = top_blob->c * (int)top_blob->cstep;
                    pvVar23 = top_blob->data;
                    uVar36 = 0;
                    uVar26 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar26 = uVar36;
                    }
                    for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                      *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0;
                    }
                    iVar38 = 0;
                    pMVar10 = (Mat *)local_c8.data;
                    for (puVar32 = (uint *)0x0; (Mat *)puVar32 != pMVar33;
                        puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
                      pvVar23 = top_blob->data;
                      iVar20 = top_blob->w;
                      sVar27 = top_blob->elemsize;
                      pMVar34 = pMVar10;
                      for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar12;
                          pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar54 = *(float *)((long)&pMVar34->data + uVar26 * 4) +
                                   *(float *)((long)pvVar23 + uVar26 * 4);
                          auVar55 = ZEXT416((uint)fVar54);
                          *(float *)((long)pvVar23 + uVar26 * 4) = fVar54;
                        }
                        pMVar34 = (Mat *)((long)&pMVar34->data +
                                         (long)local_c8.w * local_c8.elemsize);
                        pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
                      }
                      pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.cstep * local_c8.elemsize);
                    }
                  }
                  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) {
LAB_002f2a0b:
                        puVar32 = (uint *)local_c8.data;
                        free(local_c8.data);
                        auVar55 = extraout_XMM0_42;
                      }
                      else {
                        puVar32 = (uint *)local_c8.data;
                        (*(local_c8.allocator)->_vptr_Allocator[3])();
                        auVar55 = extraout_XMM0_37;
                      }
                    }
                  }
                }
                else {
                  if (((bVar43 & 1) == 0 && bVar35 == 0) && reduce_c == false) {
                    if (iVar20 == 0) {
                      Mat::create(top_blob,uVar22,uVar4,sVar27,opt->blob_allocator);
                      auVar55 = extraout_XMM0_38;
                    }
                    else {
                      Mat::create(top_blob,1,uVar22,1,uVar4,sVar27,opt->blob_allocator);
                      auVar55 = extraout_XMM0_35;
                    }
                    if ((int)uVar22 < 1) {
                      pMVar12 = (Mat *)0x0;
                    }
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    sVar27 = bottom_blob->elemsize;
                    if ((int)uVar30 < 1) {
                      uVar30 = 0;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = (Mat *)0x0;
                    }
                    if (iVar20 == 0) {
                      sVar15 = (size_t)top_blob->w;
                    }
                    else {
                      sVar15 = top_blob->cstep;
                    }
                    local_80 = (Mat *)bottom_blob->data;
                    sVar40 = bottom_blob->cstep;
                    puVar32 = (uint *)top_blob->data;
                    lVar28 = sVar15 * top_blob->elemsize;
                    local_78 = (Mat *)puVar32;
                    for (pMVar10 = (Mat *)0x0; pMVar52 = local_78, pMVar10 != pMVar33;
                        pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                      lVar16 = lVar28 * (long)pMVar10;
                      for (pMVar13 = (Mat *)0x0; pMVar12 != pMVar13;
                          pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                        *(undefined4 *)((long)&((Mat *)puVar32)->data + (long)pMVar13 * 4) = 0;
                      }
                      ppvVar42 = (void **)((long)&local_80->data + sVar27 * sVar40 * (long)pMVar10);
                      for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                        for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                            pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar54 = expf(*(float *)((long)ppvVar42 + uVar26 * 4));
                            auVar55._0_4_ =
                                 fVar54 + *(float *)((long)&pMVar52->data +
                                                    (long)pMVar13 * 4 + lVar16);
                            auVar55._4_12_ = extraout_var_07;
                            *(float *)((long)&pMVar52->data + (long)pMVar13 * 4 + lVar16) =
                                 auVar55._0_4_;
                          }
                          ppvVar42 = (void **)((long)ppvVar42 + (long)pMVar34 * 4);
                        }
                      }
                      puVar32 = (uint *)((long)&((Mat *)puVar32)->data + lVar28);
                    }
                    goto LAB_002f101e;
                  }
                  puVar32 = (uint *)pMVar34;
                  if (((bVar37 & 1) != 0 || reduce_d != false) || bVar41 != 0) {
                    if (((bVar37 & 1) == 0 && bVar35 == 0) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar4,sVar27,opt->blob_allocator);
                        auVar55 = extraout_XMM0_44;
                      }
                      else {
                        Mat::create(top_blob,uVar9,1,1,uVar4,sVar27,opt->blob_allocator);
                        auVar55 = extraout_XMM0_39;
                      }
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      if ((int)uVar22 < 1) {
                        uVar22 = 0;
                      }
                      sVar27 = bottom_blob->elemsize;
                      if ((int)uVar30 < 1) {
                        uVar30 = 0;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = (Mat *)0x0;
                      }
                      if (iVar20 == 0) {
                        sVar15 = (size_t)top_blob->w;
                      }
                      else {
                        sVar15 = top_blob->cstep;
                      }
                      local_80 = (Mat *)bottom_blob->data;
                      sVar40 = bottom_blob->cstep;
                      pvVar23 = top_blob->data;
                      sVar5 = top_blob->elemsize;
                      for (pMVar10 = (Mat *)0x0; pMVar10 != pMVar33;
                          pMVar10 = (Mat *)((long)&pMVar10->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0;
                        }
                        ppvVar42 = (void **)((long)&local_80->data + sVar27 * sVar40 * (long)pMVar10
                                            );
                        for (uVar8 = 0; uVar8 != uVar30; uVar8 = uVar8 + 1) {
                          for (uVar9 = 0; uVar9 != uVar22; uVar9 = uVar9 + 1) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              fVar54 = expf(*(float *)((long)ppvVar42 + uVar26 * 4));
                              auVar55._0_4_ = fVar54 + *(float *)((long)pvVar23 + uVar26 * 4);
                              auVar55._4_12_ = extraout_var_09;
                              *(float *)((long)pvVar23 + uVar26 * 4) = auVar55._0_4_;
                            }
                            ppvVar42 = (void **)((long)ppvVar42 + (long)pMVar34 * 4);
                          }
                        }
                        pvVar23 = (void *)((long)pvVar23 + sVar15 * sVar5);
                      }
                    }
                    else if (((bVar43 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar22,uVar30,uVar4,sVar27,opt->blob_allocator);
                        auVar55 = extraout_XMM0_46;
                      }
                      else {
                        Mat::create(top_blob,1,uVar22,uVar30,uVar4,sVar27,opt->blob_allocator);
                        auVar55 = extraout_XMM0_43;
                      }
                      sVar27 = top_blob->elemsize;
                      sVar15 = top_blob->cstep;
                      puVar32 = (uint *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      pvVar23 = bottom_blob->data;
                      pMVar10 = (Mat *)(ulong)(uVar30 * uVar22);
                      if ((int)(uVar30 * uVar22) < 1) {
                        pMVar10 = (Mat *)puVar32;
                      }
                      sVar40 = bottom_blob->elemsize;
                      if ((int)uVar4 < 1) {
                        pMVar33 = (Mat *)puVar32;
                      }
                      pvVar47 = top_blob->data;
                      sVar5 = bottom_blob->cstep;
                      for (; (Mat *)puVar32 != pMVar33;
                          puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
                        pvVar31 = pvVar23;
                        for (pMVar12 = (Mat *)0x0; pMVar12 != pMVar10;
                            pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
                          auVar55 = (undefined1  [16])0x0;
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar54 = expf(*(float *)((long)pvVar31 + uVar26 * 4));
                            auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
                          }
                          *(float *)((long)pvVar47 +
                                    (long)pMVar12 * 4 + sVar27 * sVar15 * (long)puVar32) =
                               auVar55._0_4_;
                          pvVar31 = (void *)((long)pvVar31 + (long)pMVar34 * 4);
                        }
                        pvVar23 = (void *)((long)pvVar23 + sVar40 * sVar5);
                      }
                    }
                    else if ((reduce_d == false && (bVar19 & 1) == 0) && bVar41 == 0) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar22,uVar30,sVar27,opt->blob_allocator);
                        auVar55 = extraout_XMM0_48;
                      }
                      else {
                        Mat::create(top_blob,uVar9,uVar22,uVar30,1,sVar27,opt->blob_allocator);
                        auVar55 = extraout_XMM0_45;
                      }
                      uVar8 = top_blob->c * (int)top_blob->cstep;
                      pvVar23 = top_blob->data;
                      uVar26 = 0;
                      uVar49 = (ulong)uVar8;
                      if ((int)uVar8 < 1) {
                        uVar49 = uVar26;
                      }
                      for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                        *(undefined4 *)((long)pvVar23 + uVar26 * 4) = 0;
                      }
                      local_78 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      local_80 = (Mat *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      if ((int)uVar22 < 1) {
                        pMVar12 = local_80;
                      }
                      local_70 = bottom_blob->data;
                      if ((int)uVar30 < 1) {
                        pMVar10 = local_80;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = local_80;
                      }
                      for (; local_80 != pMVar33; local_80 = (Mat *)((long)&local_80->data + 1)) {
                        iVar38 = top_blob->w;
                        if (iVar20 == 0) {
                          sVar27 = top_blob->cstep;
                        }
                        else {
                          sVar27 = (long)top_blob->h * (long)iVar38;
                        }
                        pvVar47 = (void *)((long)local_78 * (long)local_80 + (long)local_70);
                        pvVar23 = top_blob->data;
                        sVar15 = top_blob->elemsize;
                        for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar10;
                            pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                          pvVar31 = pvVar23;
                          for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar12;
                              pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              fVar54 = expf(*(float *)((long)pvVar47 + uVar26 * 4));
                              auVar55._0_4_ = fVar54 + *(float *)((long)pvVar31 + uVar26 * 4);
                              auVar55._4_12_ = extraout_var_10;
                              *(float *)((long)pvVar31 + uVar26 * 4) = auVar55._0_4_;
                            }
                            pvVar47 = (void *)((long)pvVar47 + (long)pMVar34 * 4);
                            pvVar31 = (void *)((long)pvVar31 + (long)iVar38 * sVar15);
                          }
                          pvVar23 = (void *)((long)pvVar23 + sVar27 * sVar15);
                        }
                      }
                    }
                    else if (((bVar37 & 1) == 0 && reduce_d == false) && reduce_c == false) {
                      if (iVar20 == 0) {
                        Mat::create(top_blob,uVar9,uVar30,uVar4,sVar27,opt->blob_allocator);
                        auVar55 = extraout_XMM0_49;
                      }
                      else {
                        Mat::create(top_blob,uVar9,1,uVar30,uVar4,sVar27,opt->blob_allocator);
                        auVar55 = extraout_XMM0_47;
                      }
                      pvVar23 = bottom_blob->data;
                      local_80 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                      local_70 = (void *)CONCAT44(local_70._4_4_,top_blob->d);
                      puVar32 = (uint *)top_blob->elemsize;
                      local_78 = (Mat *)((long)top_blob->h * (long)top_blob->w);
                      lVar28 = (long)puVar32 * (long)local_78;
                      pMVar52 = (Mat *)0x0;
                      uVar49 = 0;
                      if (0 < (int)uVar9) {
                        uVar49 = (ulong)uVar9;
                      }
                      local_e8 = (Mat *)top_blob->data;
                      if ((int)uVar22 < 1) {
                        pMVar12 = pMVar52;
                      }
                      local_64 = top_blob->dims;
                      if ((int)uVar30 < 1) {
                        pMVar10 = pMVar52;
                      }
                      if ((int)uVar4 < 1) {
                        pMVar33 = pMVar52;
                      }
                      lVar16 = top_blob->cstep * (long)puVar32;
                      lVar45 = (long)top_blob->w * (long)puVar32;
                      local_60 = (Mat *)puVar32;
                      for (local_f8 = (Mat *)0x0; local_f8 != pMVar33;
                          local_f8 = (Mat *)((long)&local_f8->data + 1)) {
                        iVar20 = (int)local_78;
                        if (local_64 != 4) {
                          iVar20 = (int)((lVar28 + 0xfU & 0xfffffffffffffff0) / (ulong)local_60);
                        }
                        iVar38 = iVar20 * (int)local_70;
                        if (iVar20 * (int)local_70 < 1) {
                          iVar38 = 0;
                        }
                        for (lVar17 = 0; iVar38 != (int)lVar17; lVar17 = lVar17 + 1) {
                          *(undefined4 *)((long)local_e8 + lVar17 * 4) = 0;
                        }
                        pvVar47 = (void *)((long)local_80 * (long)local_f8 + (long)pvVar23);
                        pMVar52 = local_e8;
                        for (pMVar13 = (Mat *)0x0; pMVar13 != pMVar10;
                            pMVar13 = (Mat *)((long)&pMVar13->data + 1)) {
                          for (iVar20 = 0; local_e0 = (int)pMVar12, iVar20 != local_e0;
                              iVar20 = iVar20 + 1) {
                            for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                              fVar54 = expf(*(float *)((long)pvVar47 + uVar26 * 4));
                              auVar55._0_4_ = fVar54 + *(float *)((long)pMVar52 + uVar26 * 4);
                              auVar55._4_12_ = extraout_var_11;
                              *(float *)((long)pMVar52 + uVar26 * 4) = auVar55._0_4_;
                            }
                            pvVar47 = (void *)((long)pvVar47 + (long)pMVar34 * 4);
                          }
                          pMVar52 = (Mat *)((long)pMVar52 + lVar45);
                        }
                        local_e8 = (Mat *)((long)local_e8 + lVar16);
                      }
                    }
                    else {
                      puVar32 = (uint *)(ulong)CONCAT31((int3)((uint)iVar38 >> 8),
                                                        bVar37 | reduce_d | bVar41);
                      if (reduce_c == false && (bVar35 == 0 && (bVar19 & 1) == 0)) {
                        if (iVar20 == 0) {
                          Mat::create(top_blob,uVar9,uVar22,uVar4,sVar27,opt->blob_allocator);
                          auVar55 = extraout_XMM0_50;
                        }
                        else {
                          Mat::create(top_blob,uVar9,uVar22,1,uVar4,sVar27,opt->blob_allocator);
                          auVar55 = extraout_XMM0_01;
                        }
                        pvVar23 = bottom_blob->data;
                        local_80 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                        local_70 = (void *)CONCAT44(local_70._4_4_,top_blob->d);
                        puVar32 = (uint *)top_blob->elemsize;
                        local_78 = (Mat *)((long)top_blob->h * (long)top_blob->w);
                        lVar28 = (long)puVar32 * (long)local_78;
                        pMVar52 = (Mat *)0x0;
                        uVar49 = 0;
                        if (0 < (int)uVar9) {
                          uVar49 = (ulong)uVar9;
                        }
                        local_108 = top_blob->data;
                        if ((int)uVar22 < 1) {
                          pMVar12 = pMVar52;
                        }
                        local_64 = top_blob->dims;
                        if ((int)uVar30 < 1) {
                          pMVar10 = pMVar52;
                        }
                        if ((int)uVar4 < 1) {
                          pMVar33 = pMVar52;
                        }
                        lVar16 = top_blob->cstep * (long)puVar32;
                        lVar45 = (long)top_blob->w * (long)puVar32;
                        local_60 = (Mat *)puVar32;
                        for (local_e8 = (Mat *)0x0; local_e8 != pMVar33;
                            local_e8 = (Mat *)((long)&local_e8->data + 1)) {
                          iVar20 = (int)local_78;
                          if (local_64 != 4) {
                            iVar20 = (int)((lVar28 + 0xfU & 0xfffffffffffffff0) / (ulong)local_60);
                          }
                          iVar38 = iVar20 * (int)local_70;
                          if (iVar20 * (int)local_70 < 1) {
                            iVar38 = 0;
                          }
                          for (lVar17 = 0; iVar38 != (int)lVar17; lVar17 = lVar17 + 1) {
                            *(undefined4 *)((long)local_108 + lVar17 * 4) = 0;
                          }
                          pvVar47 = (void *)((long)local_80 * (long)local_e8 + (long)pvVar23);
                          for (iVar20 = 0; local_100 = (int)pMVar10, iVar20 != local_100;
                              iVar20 = iVar20 + 1) {
                            pvVar31 = local_108;
                            for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar12;
                                pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                              for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                                fVar54 = expf(*(float *)((long)pvVar47 + uVar26 * 4));
                                auVar55._0_4_ = fVar54 + *(float *)((long)pvVar31 + uVar26 * 4);
                                auVar55._4_12_ = extraout_var_12;
                                *(float *)((long)pvVar31 + uVar26 * 4) = auVar55._0_4_;
                              }
                              pvVar47 = (void *)((long)pvVar47 + (long)pMVar34 * 4);
                              pvVar31 = (void *)((long)pvVar31 + lVar45);
                            }
                          }
                          local_108 = (void *)((long)local_108 + lVar16);
                        }
                      }
                    }
                    goto LAB_002f101e;
                  }
                  if (iVar20 == 0) {
                    Mat::create(top_blob,uVar9,uVar30,sVar27,opt->blob_allocator);
                  }
                  else {
                    Mat::create(top_blob,uVar9,1,uVar30,1,sVar27,opt->blob_allocator);
                  }
                  local_c8.cstep = 0;
                  local_c8.data = (Mat *)0x0;
                  local_c8.refcount._0_4_ = 0;
                  local_c8.refcount._4_4_ = 0;
                  local_c8.elemsize = 0;
                  local_c8.elempack = 0;
                  local_c8.allocator = (Allocator *)0x0;
                  local_c8.dims = 0;
                  local_c8.w = 0;
                  local_c8.h = 0;
                  local_c8.d = 0;
                  local_c8.c = 0;
                  Mat::create(&local_c8,uVar9,uVar30,uVar4,sVar27,opt->workspace_allocator);
                  iVar38 = -100;
                  auVar55 = extraout_XMM0_40;
                  if (((Mat *)local_c8.data != (Mat *)0x0) &&
                     (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c),
                     (Mat *)puVar32 != (Mat *)0x0)) {
                    uVar8 = (int)local_c8.cstep * local_c8.c;
                    uVar26 = 0;
                    uVar49 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar49 = uVar26;
                    }
                    for (; (int)uVar49 != (int)uVar26; uVar26 = uVar26 + 1) {
                      *(undefined4 *)((long)(void **)local_c8.data + uVar26 * 4) = 0;
                    }
                    pvVar23 = bottom_blob->data;
                    local_80 = (Mat *)(bottom_blob->elemsize * bottom_blob->cstep);
                    pMVar52 = (Mat *)0x0;
                    uVar49 = 0;
                    if (0 < (int)uVar9) {
                      uVar49 = (ulong)uVar9;
                    }
                    if ((int)uVar22 < 1) {
                      pMVar12 = pMVar52;
                    }
                    if ((int)uVar30 < 1) {
                      pMVar10 = pMVar52;
                    }
                    if ((int)uVar4 < 1) {
                      pMVar33 = pMVar52;
                    }
                    local_78 = (Mat *)(local_c8.cstep * local_c8.elemsize);
                    lVar28 = (long)local_c8.w * local_c8.elemsize;
                    pMVar13 = (Mat *)local_c8.data;
                    for (; pMVar52 != pMVar33; pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                      pvVar47 = (void *)((long)local_80 * (long)pMVar52 + (long)pvVar23);
                      pMVar11 = pMVar13;
                      for (pMVar14 = (Mat *)0x0; pMVar14 != pMVar10;
                          pMVar14 = (Mat *)((long)&pMVar14->data + 1)) {
                        for (iVar20 = 0; local_e0 = (int)pMVar12, iVar20 != local_e0;
                            iVar20 = iVar20 + 1) {
                          for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                            fVar54 = expf(*(float *)((long)pvVar47 + uVar26 * 4));
                            auVar55._0_4_ = fVar54 + *(float *)((long)&pMVar11->data + uVar26 * 4);
                            auVar55._4_12_ = extraout_var_08;
                            *(float *)((long)&pMVar11->data + uVar26 * 4) = auVar55._0_4_;
                          }
                          pvVar47 = (void *)((long)pvVar47 + (long)pMVar34 * 4);
                        }
                        pMVar11 = (Mat *)((long)&pMVar11->data + lVar28);
                      }
                      pMVar13 = (Mat *)((long)&local_78->data + (long)&pMVar13->data);
                    }
                    uVar8 = top_blob->c * (int)top_blob->cstep;
                    pvVar23 = top_blob->data;
                    uVar36 = 0;
                    uVar26 = (ulong)uVar8;
                    if ((int)uVar8 < 1) {
                      uVar26 = uVar36;
                    }
                    for (; (int)uVar26 != (int)uVar36; uVar36 = uVar36 + 1) {
                      *(undefined4 *)((long)pvVar23 + uVar36 * 4) = 0;
                    }
                    iVar38 = 0;
                    pMVar12 = (Mat *)local_c8.data;
                    for (puVar32 = (uint *)0x0; (Mat *)puVar32 != pMVar33;
                        puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1)) {
                      pvVar23 = top_blob->data;
                      iVar20 = top_blob->w;
                      sVar27 = top_blob->elemsize;
                      pMVar34 = pMVar12;
                      for (pMVar52 = (Mat *)0x0; pMVar52 != pMVar10;
                          pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                        for (uVar26 = 0; uVar49 != uVar26; uVar26 = uVar26 + 1) {
                          fVar54 = *(float *)((long)&pMVar34->data + uVar26 * 4) +
                                   *(float *)((long)pvVar23 + uVar26 * 4);
                          auVar55 = ZEXT416((uint)fVar54);
                          *(float *)((long)pvVar23 + uVar26 * 4) = fVar54;
                        }
                        pMVar34 = (Mat *)((long)&pMVar34->data +
                                         (long)local_c8.w * local_c8.elemsize);
                        pvVar23 = (void *)((long)pvVar23 + (long)iVar20 * sVar27);
                      }
                      pMVar12 = (Mat *)((long)&pMVar12->data + local_c8.cstep * local_c8.elemsize);
                    }
                  }
                  piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
                  if (piVar6 != (int *)0x0) {
                    LOCK();
                    *piVar6 = *piVar6 + -1;
                    UNLOCK();
                    if (*piVar6 == 0) {
                      if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f2a0b;
                      puVar32 = (uint *)local_c8.data;
                      (*(local_c8.allocator)->_vptr_Allocator[3])();
                      auVar55 = extraout_XMM0_41;
                    }
                  }
                }
              }
            }
          }
        }
        else {
          if (iVar20 == 0) {
            Mat::create(top_blob,uVar30,sVar27,opt->blob_allocator);
          }
          else {
            Mat::create(top_blob,1,1,uVar30,1,sVar27,opt->blob_allocator);
          }
          local_c8.cstep = 0;
          local_c8.data = (Mat *)0x0;
          local_c8.refcount._0_4_ = 0;
          local_c8.refcount._4_4_ = 0;
          local_c8.elemsize = 0;
          local_c8.elempack = 0;
          local_c8.allocator = (Allocator *)0x0;
          local_c8.dims = 0;
          local_c8.w = 0;
          local_c8.h = 0;
          local_c8.d = 0;
          local_c8.c = 0;
          puVar32 = (uint *)0x1;
          Mat::create(&local_c8,1,uVar30,uVar4,sVar27,opt->workspace_allocator);
          pvVar23 = local_c8.data;
          iVar38 = -100;
          auVar55 = extraout_XMM0_16;
          if (((Mat *)local_c8.data != (Mat *)0x0) &&
             (puVar32 = (uint *)(local_c8.cstep * (long)local_c8.c), (Mat *)puVar32 != (Mat *)0x0))
          {
            iVar20 = (int)local_c8.cstep * local_c8.c;
            lVar28 = 0;
            if (iVar20 < 1) {
              iVar20 = 0;
            }
            for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
              *(undefined4 *)((long)(void **)local_c8.data + lVar28 * 4) = 0;
            }
            lVar28 = local_c8.elemsize * local_c8.cstep;
            puVar32 = (uint *)0x0;
            pMVar10 = (Mat *)(ulong)uVar50;
            if ((int)uVar50 < 1) {
              pMVar10 = (Mat *)puVar32;
            }
            pvVar47 = bottom_blob->data;
            pMVar12 = (Mat *)(ulong)uVar30;
            if ((int)uVar30 < 1) {
              pMVar12 = (Mat *)puVar32;
            }
            sVar27 = bottom_blob->elemsize;
            if ((int)uVar4 < 1) {
              pMVar33 = (Mat *)puVar32;
            }
            sVar15 = bottom_blob->cstep;
            for (; (Mat *)puVar32 != pMVar33; puVar32 = (uint *)((long)&((Mat *)puVar32)->data + 1))
            {
              pvVar31 = pvVar47;
              for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar12;
                  pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
                auVar55 = (undefined1  [16])0x0;
                for (pMVar52 = (Mat *)0x0; pMVar10 != pMVar52;
                    pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                  fVar54 = expf(*(float *)((long)pvVar31 + (long)pMVar52 * 4));
                  auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
                }
                *(float *)((long)(void **)pvVar23 + (long)pMVar34 * 4 + lVar28 * (long)puVar32) =
                     auVar55._0_4_;
                pvVar31 = (void *)((long)pvVar31 + (long)(int)uVar50 * 4);
              }
              pvVar47 = (void *)((long)pvVar47 + sVar27 * sVar15);
            }
            iVar20 = top_blob->c * (int)top_blob->cstep;
            pvVar23 = top_blob->data;
            lVar28 = 0;
            if (iVar20 < 1) {
              iVar20 = 0;
            }
            for (; iVar20 != (int)lVar28; lVar28 = lVar28 + 1) {
              *(undefined4 *)((long)pvVar23 + lVar28 * 4) = 0;
            }
            iVar38 = 0;
            pMVar10 = (Mat *)local_c8.data;
            for (pMVar34 = (Mat *)0x0; pMVar34 != pMVar33;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              puVar32 = (uint *)top_blob->data;
              for (pMVar52 = (Mat *)0x0; pMVar12 != pMVar52;
                  pMVar52 = (Mat *)((long)&pMVar52->data + 1)) {
                fVar54 = *(float *)((long)&pMVar10->data + (long)pMVar52 * 4) +
                         *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4);
                auVar55 = ZEXT416((uint)fVar54);
                *(float *)((long)&((Mat *)puVar32)->data + (long)pMVar52 * 4) = fVar54;
              }
              pMVar10 = (Mat *)((long)&pMVar10->data + local_c8.elemsize * local_c8.cstep);
            }
          }
          piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f100d;
              puVar32 = (uint *)local_c8.data;
              (*(local_c8.allocator)->_vptr_Allocator[3])();
              auVar55 = extraout_XMM0_17;
            }
          }
        }
      }
      else {
        if (iVar20 == 0) {
          Mat::create(top_blob,1,sVar27,opt->blob_allocator);
        }
        else {
          Mat::create(top_blob,1,1,1,1,sVar27,opt->blob_allocator);
        }
        iVar38 = -100;
        local_c8.cstep = 0;
        local_c8.data = (Mat *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize = 0;
        local_c8.elempack = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        puVar32 = (uint *)pMVar33;
        Mat::create(&local_c8,uVar4,sVar27,opt->workspace_allocator);
        pvVar23 = local_c8.data;
        auVar55 = extraout_XMM0_07;
        if (((Mat *)local_c8.data != (Mat *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
          sVar27 = bottom_blob->elemsize;
          sVar15 = bottom_blob->cstep;
          pMVar12 = (Mat *)0x0;
          pMVar10 = (Mat *)(ulong)uVar51;
          if ((int)uVar51 < 1) {
            pMVar10 = pMVar12;
          }
          pvVar47 = bottom_blob->data;
          if ((int)uVar4 < 1) {
            pMVar33 = pMVar12;
          }
          for (; auVar55 = (undefined1  [16])0x0, pMVar12 != pMVar33;
              pMVar12 = (Mat *)((long)&pMVar12->data + 1)) {
            for (pMVar34 = (Mat *)0x0; pMVar10 != pMVar34;
                pMVar34 = (Mat *)((long)&pMVar34->data + 1)) {
              fVar54 = expf(*(float *)((long)pvVar47 + (long)pMVar34 * 4));
              auVar55 = ZEXT416((uint)(auVar55._0_4_ + fVar54));
            }
            *(float *)((long)(void **)pvVar23 + (long)pMVar12 * 4) = auVar55._0_4_;
            pvVar47 = (void *)((long)pvVar47 + sVar27 * sVar15);
          }
          for (pMVar10 = (Mat *)0x0; pMVar33 != pMVar10; pMVar10 = (Mat *)((long)&pMVar10->data + 1)
              ) {
            auVar55._0_4_ =
                 auVar55._0_4_ + *(float *)((long)(void **)local_c8.data + (long)pMVar10 * 4);
          }
          *(float *)top_blob->data = auVar55._0_4_;
          iVar38 = 0;
        }
        piVar6 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) goto LAB_002f100d;
            puVar32 = (uint *)local_c8.data;
            (*(local_c8.allocator)->_vptr_Allocator[3])();
            auVar55 = extraout_XMM0_08;
          }
        }
      }
    }
    if (iVar38 != 0) {
      return -100;
    }
LAB_002f101e:
    reduction_post_process<ncnn::post_process_log<float>>(top_blob,auVar55._0_4_,(Option *)puVar32);
    return 0;
  }
  if (iVar38 != 0) {
    return -100;
  }
LAB_002f4234:
  if (1.1920929e-07 < ABS(fVar54 + -1.0)) {
    reduction_post_process<ncnn::post_process_identity<float>>(top_blob,fVar54,(Option *)puVar32);
  }
  return 0;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;
    int axes_flag[4] = {0};
    bool reduce_w = false;
    bool reduce_h = false;
    bool reduce_d = false;
    bool reduce_c = false;

    if (reduce_all)
    {
        reduce_w = true;
        reduce_h = true;
        reduce_d = true;
        reduce_c = true;
    }
    else
    {
        const int* axes_ptr = axes;
        int reduced_axes_num = axes.w;

        for (int i = 0; i < reduced_axes_num; i++)
        {
            int axis = axes_ptr[i];
            // handle negative axis
            if (axis < 0)
                axis += dims;
            axes_flag[axis] = 1;
        }

        if (dims == 1)
        {
            reduce_w = true;
        }
        else if (dims == 2)
        {
            if (axes_flag[0] == 1) reduce_h = true;
            if (axes_flag[1] == 1) reduce_w = true;
        }
        else if (dims == 3)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_h = true;
            if (axes_flag[2] == 1) reduce_w = true;
        }
        else if (dims == 4)
        {
            if (axes_flag[0] == 1) reduce_c = true;
            if (axes_flag[1] == 1) reduce_d = true;
            if (axes_flag[2] == 1) reduce_h = true;
            if (axes_flag[3] == 1) reduce_w = true;
        }
    }

    if (operation == ReductionOp_SUM)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_ASUM)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_SUMSQ)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MEAN)
    {
        int scale = 1;
        int dims = bottom_blob.dims;
        if (dims == 1)
        {
            scale = bottom_blob.w;
        }
        else if (dims == 2)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
        }
        else if (dims == 3)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_c) scale *= bottom_blob.c;
        }
        else if (dims == 4)
        {
            if (reduce_w) scale *= bottom_blob.w;
            if (reduce_h) scale *= bottom_blob.h;
            if (reduce_d) scale *= bottom_blob.d;
            if (reduce_c) scale *= bottom_blob.c;
        }

        float coeff_mean = coeff / scale;
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, coeff_mean, keepdims, opt);
    }

    if (operation == ReductionOp_MAX)
        return reduction<reduction_op_max<float>, reduction_op_max<float>, post_process_identity<float> >(bottom_blob, top_blob, -FLT_MAX, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_MIN)
        return reduction<reduction_op_min<float>, reduction_op_min<float>, post_process_identity<float> >(bottom_blob, top_blob, FLT_MAX, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_PROD)
        return reduction<reduction_op_mul<float>, reduction_op_mul<float>, post_process_identity<float> >(bottom_blob, top_blob, 1.f, reduce_w, reduce_h, reduce_d, reduce_c, false, coeff, keepdims, opt);

    if (operation == ReductionOp_L1)
        return reduction<reduction_op_asum<float>, reduction_op_add<float>, post_process_identity<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, false, 1.f, keepdims, opt);

    if (operation == ReductionOp_L2)
        return reduction<reduction_op_sumsq<float>, reduction_op_add<float>, post_process_sqrt<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSum)
        return reduction<reduction_op_add<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    if (operation == ReductionOp_LogSumExp)
        return reduction<reduction_op_sumsexp<float>, reduction_op_add<float>, post_process_log<float> >(bottom_blob, top_blob, 0.f, reduce_w, reduce_h, reduce_d, reduce_c, true, 1.f, keepdims, opt);

    return 0;
}